

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx::CurveNiMBIntersectorK<8,4>::
     intersect_t<embree::avx::SweepCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  Primitive PVar28;
  Geometry *pGVar29;
  __int_type_conflict _Var30;
  long lVar31;
  RTCFilterFunctionN p_Var32;
  uint uVar33;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  float fVar41;
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  bool bVar96;
  undefined1 auVar97 [12];
  bool bVar98;
  bool bVar99;
  bool bVar100;
  bool bVar101;
  bool bVar102;
  bool bVar103;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  uint uVar118;
  ulong uVar119;
  long lVar120;
  uint uVar121;
  long lVar122;
  long lVar123;
  ulong uVar124;
  ulong uVar125;
  bool bVar126;
  __m128 a;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  float fVar152;
  undefined8 extraout_XMM1_Qa;
  float fVar188;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar165 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar170 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar214;
  float fVar217;
  float fVar224;
  float fVar227;
  float fVar230;
  undefined1 auVar203 [32];
  float fVar233;
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  float fVar215;
  float fVar216;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar225;
  float fVar226;
  float fVar228;
  float fVar229;
  float fVar231;
  float fVar232;
  float fVar234;
  float fVar235;
  float fVar236;
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  float fVar237;
  float fVar254;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [28];
  float fVar253;
  float fVar255;
  float fVar256;
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  float fVar257;
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  float fVar258;
  float fVar274;
  float fVar275;
  float fVar276;
  undefined1 auVar259 [16];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar268 [28];
  float fVar277;
  float fVar278;
  float fVar279;
  undefined1 auVar273 [64];
  float fVar280;
  float fVar294;
  float fVar295;
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  float fVar297;
  float fVar298;
  float fVar299;
  undefined1 auVar286 [32];
  float fVar296;
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  float fVar300;
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  float fVar311;
  float fVar312;
  float fVar314;
  float fVar315;
  float fVar316;
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  float fVar313;
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  float fVar317;
  float fVar318;
  float fVar331;
  float fVar333;
  float fVar336;
  float fVar339;
  float fVar342;
  float fVar345;
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  float fVar332;
  float fVar334;
  float fVar337;
  float fVar340;
  float fVar343;
  float fVar346;
  float fVar348;
  float fVar349;
  undefined1 auVar324 [32];
  float fVar335;
  float fVar338;
  float fVar341;
  float fVar344;
  float fVar347;
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [64];
  float fVar350;
  float fVar351;
  float fVar352;
  float fVar362;
  float fVar365;
  float fVar368;
  float fVar371;
  float fVar374;
  float fVar377;
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  float fVar363;
  float fVar364;
  float fVar366;
  float fVar367;
  float fVar369;
  float fVar370;
  float fVar372;
  float fVar373;
  float fVar375;
  float fVar376;
  float fVar378;
  float fVar379;
  float fVar380;
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [64];
  float fVar381;
  float fVar382;
  float fVar383;
  undefined1 auVar384 [28];
  float fVar390;
  float fVar393;
  float fVar396;
  float fVar399;
  float fVar402;
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  float fVar391;
  float fVar392;
  float fVar394;
  float fVar395;
  float fVar397;
  float fVar398;
  float fVar400;
  float fVar401;
  float fVar403;
  float fVar404;
  float fVar405;
  float fVar406;
  float fVar407;
  float fVar408;
  undefined1 auVar389 [32];
  float s;
  undefined1 auVar409 [16];
  float fVar417;
  float fVar418;
  float fVar419;
  undefined1 auVar410 [32];
  undefined1 auVar411 [32];
  undefined1 auVar412 [32];
  undefined1 auVar413 [32];
  float fVar420;
  undefined1 auVar414 [32];
  undefined1 auVar415 [32];
  float t;
  undefined1 auVar422 [32];
  undefined1 auVar423 [32];
  undefined1 auVar424 [32];
  undefined1 auVar425 [32];
  undefined1 auVar426 [32];
  float fVar428;
  undefined1 auVar427 [64];
  undefined1 auVar430 [16];
  float fVar429;
  float fVar439;
  float fVar440;
  float fVar442;
  float fVar443;
  float fVar444;
  float in_register_0000151c;
  undefined1 auVar431 [32];
  undefined1 auVar432 [32];
  undefined1 auVar433 [32];
  undefined1 auVar434 [32];
  float fVar441;
  undefined1 auVar435 [32];
  undefined1 auVar436 [32];
  undefined1 auVar437 [32];
  float fVar445;
  float fVar446;
  float fVar455;
  float fVar457;
  float fVar459;
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  float fVar454;
  float fVar456;
  float fVar460;
  float fVar461;
  float fVar462;
  float fVar463;
  float fVar464;
  float fVar465;
  undefined1 auVar449 [32];
  undefined1 auVar450 [32];
  float fVar458;
  undefined1 auVar451 [32];
  undefined1 auVar452 [32];
  undefined1 auVar453 [64];
  float in_register_0000159c;
  undefined1 auVar466 [32];
  undefined1 auVar467 [32];
  undefined1 auVar468 [32];
  float in_register_000015dc;
  undefined1 auVar469 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vboolx_conflict valid;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  float local_c00;
  undefined1 local_b80 [8];
  float fStack_b78;
  float fStack_b74;
  float fStack_b70;
  float fStack_b6c;
  float fStack_b68;
  float fStack_b64;
  undefined1 local_b40 [32];
  undefined8 local_b20;
  undefined8 uStack_b18;
  float local_b08;
  float local_b04;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a70 [8];
  float fStack_a68;
  float fStack_a64;
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  undefined1 local_a50 [8];
  float fStack_a48;
  float fStack_a44;
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  RTCFilterFunctionNArguments local_a30;
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  undefined1 auStack_9f0 [16];
  undefined8 *local_9d0;
  ulong local_9c8;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [16];
  undefined1 local_950 [8];
  float fStack_948;
  float fStack_944;
  undefined1 local_940 [32];
  undefined8 local_910;
  undefined8 uStack_908;
  undefined1 local_900 [16];
  Primitive *local_8f0;
  ulong local_8e8;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [32];
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [16];
  undefined1 local_770 [16];
  RTCHitN local_760 [16];
  undefined1 auStack_750 [16];
  undefined1 local_740 [16];
  undefined1 local_730 [16];
  undefined1 local_720 [16];
  undefined8 local_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  uint local_6f0;
  uint uStack_6ec;
  uint uStack_6e8;
  uint uStack_6e4;
  uint uStack_6e0;
  uint uStack_6dc;
  uint uStack_6d8;
  uint uStack_6d4;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined4 uStack_5a4;
  undefined1 local_5a0 [32];
  float local_580 [4];
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  float local_560 [4];
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined4 uStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar416 [64];
  undefined1 auVar421 [16];
  undefined1 auVar438 [64];
  
  PVar28 = prim[1];
  uVar124 = (ulong)(byte)PVar28;
  lVar123 = uVar124 * 0x25;
  auVar157 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar157 = vinsertps_avx(auVar157,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar240 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar240 = vinsertps_avx(auVar240,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar157 = vsubps_avx(auVar157,*(undefined1 (*) [16])(prim + lVar123 + 6));
  fVar237 = *(float *)(prim + lVar123 + 0x12);
  auVar153._0_4_ = fVar237 * auVar157._0_4_;
  auVar153._4_4_ = fVar237 * auVar157._4_4_;
  auVar153._8_4_ = fVar237 * auVar157._8_4_;
  auVar153._12_4_ = fVar237 * auVar157._12_4_;
  auVar157 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 4 + 6)));
  auVar281._0_4_ = fVar237 * auVar240._0_4_;
  auVar281._4_4_ = fVar237 * auVar240._4_4_;
  auVar281._8_4_ = fVar237 * auVar240._8_4_;
  auVar281._12_4_ = fVar237 * auVar240._12_4_;
  auVar240 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 4 + 10)));
  auVar138._16_16_ = auVar240;
  auVar138._0_16_ = auVar157;
  auVar138 = vcvtdq2ps_avx(auVar138);
  lVar31 = uVar124 * 5;
  auVar157 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar31 + 6)));
  auVar240 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar31 + 10)));
  auVar203._16_16_ = auVar240;
  auVar203._0_16_ = auVar157;
  auVar157 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 6 + 6)));
  auVar240 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 6 + 10)));
  auVar146 = vcvtdq2ps_avx(auVar203);
  auVar246._16_16_ = auVar240;
  auVar246._0_16_ = auVar157;
  auVar34 = vcvtdq2ps_avx(auVar246);
  auVar157 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 0xf + 6)));
  auVar240 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 0xf + 10)));
  auVar247._16_16_ = auVar240;
  auVar247._0_16_ = auVar157;
  auVar35 = vcvtdq2ps_avx(auVar247);
  lVar122 = (ulong)(byte)PVar28 * 0x10;
  auVar157 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar122 + 6)));
  auVar240 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar122 + 10)));
  auVar305._16_16_ = auVar240;
  auVar305._0_16_ = auVar157;
  auVar157 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar122 + uVar124 + 6)));
  auVar36 = vcvtdq2ps_avx(auVar305);
  auVar240 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar122 + uVar124 + 10)));
  auVar319._16_16_ = auVar240;
  auVar319._0_16_ = auVar157;
  auVar157 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 0x1a + 6)));
  auVar37 = vcvtdq2ps_avx(auVar319);
  auVar240 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 0x1a + 10)));
  auVar320._16_16_ = auVar240;
  auVar320._0_16_ = auVar157;
  auVar38 = vcvtdq2ps_avx(auVar320);
  auVar157 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 0x1b + 6)));
  auVar240 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 0x1b + 10)));
  auVar385._16_16_ = auVar240;
  auVar385._0_16_ = auVar157;
  auVar157 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 0x1c + 6)));
  auVar240 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar124 * 0x1c + 10)));
  auVar39 = vcvtdq2ps_avx(auVar385);
  auVar410._16_16_ = auVar240;
  auVar410._0_16_ = auVar157;
  auVar40 = vcvtdq2ps_avx(auVar410);
  auVar157 = vshufps_avx(auVar281,auVar281,0);
  auVar240 = vshufps_avx(auVar281,auVar281,0x55);
  auVar130 = vshufps_avx(auVar281,auVar281,0xaa);
  fVar237 = auVar130._0_4_;
  fVar152 = auVar130._4_4_;
  fVar253 = auVar130._8_4_;
  fVar188 = auVar130._12_4_;
  fVar233 = auVar240._0_4_;
  fVar192 = auVar240._4_4_;
  fVar254 = auVar240._8_4_;
  fVar220 = auVar240._12_4_;
  fVar255 = auVar157._0_4_;
  fVar256 = auVar157._4_4_;
  fVar257 = auVar157._8_4_;
  fVar258 = auVar157._12_4_;
  auVar431._0_4_ = fVar255 * auVar138._0_4_ + fVar233 * auVar146._0_4_ + fVar237 * auVar34._0_4_;
  auVar431._4_4_ = fVar256 * auVar138._4_4_ + fVar192 * auVar146._4_4_ + fVar152 * auVar34._4_4_;
  auVar431._8_4_ = fVar257 * auVar138._8_4_ + fVar254 * auVar146._8_4_ + fVar253 * auVar34._8_4_;
  auVar431._12_4_ = fVar258 * auVar138._12_4_ + fVar220 * auVar146._12_4_ + fVar188 * auVar34._12_4_
  ;
  auVar431._16_4_ = fVar255 * auVar138._16_4_ + fVar233 * auVar146._16_4_ + fVar237 * auVar34._16_4_
  ;
  auVar431._20_4_ = fVar256 * auVar138._20_4_ + fVar192 * auVar146._20_4_ + fVar152 * auVar34._20_4_
  ;
  auVar431._24_4_ = fVar257 * auVar138._24_4_ + fVar254 * auVar146._24_4_ + fVar253 * auVar34._24_4_
  ;
  auVar431._28_4_ = fVar220 + in_register_000015dc + in_register_0000151c;
  auVar422._0_4_ = fVar255 * auVar35._0_4_ + fVar233 * auVar36._0_4_ + auVar37._0_4_ * fVar237;
  auVar422._4_4_ = fVar256 * auVar35._4_4_ + fVar192 * auVar36._4_4_ + auVar37._4_4_ * fVar152;
  auVar422._8_4_ = fVar257 * auVar35._8_4_ + fVar254 * auVar36._8_4_ + auVar37._8_4_ * fVar253;
  auVar422._12_4_ = fVar258 * auVar35._12_4_ + fVar220 * auVar36._12_4_ + auVar37._12_4_ * fVar188;
  auVar422._16_4_ = fVar255 * auVar35._16_4_ + fVar233 * auVar36._16_4_ + auVar37._16_4_ * fVar237;
  auVar422._20_4_ = fVar256 * auVar35._20_4_ + fVar192 * auVar36._20_4_ + auVar37._20_4_ * fVar152;
  auVar422._24_4_ = fVar257 * auVar35._24_4_ + fVar254 * auVar36._24_4_ + auVar37._24_4_ * fVar253;
  auVar422._28_4_ = fVar220 + in_register_000015dc + in_register_0000159c;
  auVar286._0_4_ = fVar255 * auVar38._0_4_ + fVar233 * auVar39._0_4_ + auVar40._0_4_ * fVar237;
  auVar286._4_4_ = fVar256 * auVar38._4_4_ + fVar192 * auVar39._4_4_ + auVar40._4_4_ * fVar152;
  auVar286._8_4_ = fVar257 * auVar38._8_4_ + fVar254 * auVar39._8_4_ + auVar40._8_4_ * fVar253;
  auVar286._12_4_ = fVar258 * auVar38._12_4_ + fVar220 * auVar39._12_4_ + auVar40._12_4_ * fVar188;
  auVar286._16_4_ = fVar255 * auVar38._16_4_ + fVar233 * auVar39._16_4_ + auVar40._16_4_ * fVar237;
  auVar286._20_4_ = fVar256 * auVar38._20_4_ + fVar192 * auVar39._20_4_ + auVar40._20_4_ * fVar152;
  auVar286._24_4_ = fVar257 * auVar38._24_4_ + fVar254 * auVar39._24_4_ + auVar40._24_4_ * fVar253;
  auVar286._28_4_ = fVar258 + fVar220 + fVar188;
  auVar157 = vshufps_avx(auVar153,auVar153,0);
  auVar240 = vshufps_avx(auVar153,auVar153,0x55);
  auVar130 = vshufps_avx(auVar153,auVar153,0xaa);
  fVar237 = auVar130._0_4_;
  fVar152 = auVar130._4_4_;
  fVar253 = auVar130._8_4_;
  fVar188 = auVar130._12_4_;
  fVar256 = auVar240._0_4_;
  fVar257 = auVar240._4_4_;
  fVar258 = auVar240._8_4_;
  fVar274 = auVar240._12_4_;
  fVar233 = auVar146._28_4_ + auVar34._28_4_;
  fVar192 = auVar157._0_4_;
  fVar254 = auVar157._4_4_;
  fVar220 = auVar157._8_4_;
  fVar255 = auVar157._12_4_;
  auVar171._0_4_ = fVar192 * auVar138._0_4_ + fVar256 * auVar146._0_4_ + fVar237 * auVar34._0_4_;
  auVar171._4_4_ = fVar254 * auVar138._4_4_ + fVar257 * auVar146._4_4_ + fVar152 * auVar34._4_4_;
  auVar171._8_4_ = fVar220 * auVar138._8_4_ + fVar258 * auVar146._8_4_ + fVar253 * auVar34._8_4_;
  auVar171._12_4_ = fVar255 * auVar138._12_4_ + fVar274 * auVar146._12_4_ + fVar188 * auVar34._12_4_
  ;
  auVar171._16_4_ = fVar192 * auVar138._16_4_ + fVar256 * auVar146._16_4_ + fVar237 * auVar34._16_4_
  ;
  auVar171._20_4_ = fVar254 * auVar138._20_4_ + fVar257 * auVar146._20_4_ + fVar152 * auVar34._20_4_
  ;
  auVar171._24_4_ = fVar220 * auVar138._24_4_ + fVar258 * auVar146._24_4_ + fVar253 * auVar34._24_4_
  ;
  auVar171._28_4_ = auVar138._28_4_ + fVar233;
  auVar139._0_4_ = fVar192 * auVar35._0_4_ + auVar37._0_4_ * fVar237 + fVar256 * auVar36._0_4_;
  auVar139._4_4_ = fVar254 * auVar35._4_4_ + auVar37._4_4_ * fVar152 + fVar257 * auVar36._4_4_;
  auVar139._8_4_ = fVar220 * auVar35._8_4_ + auVar37._8_4_ * fVar253 + fVar258 * auVar36._8_4_;
  auVar139._12_4_ = fVar255 * auVar35._12_4_ + auVar37._12_4_ * fVar188 + fVar274 * auVar36._12_4_;
  auVar139._16_4_ = fVar192 * auVar35._16_4_ + auVar37._16_4_ * fVar237 + fVar256 * auVar36._16_4_;
  auVar139._20_4_ = fVar254 * auVar35._20_4_ + auVar37._20_4_ * fVar152 + fVar257 * auVar36._20_4_;
  auVar139._24_4_ = fVar220 * auVar35._24_4_ + auVar37._24_4_ * fVar253 + fVar258 * auVar36._24_4_;
  auVar139._28_4_ = auVar138._28_4_ + auVar37._28_4_ + auVar34._28_4_;
  auVar321._8_4_ = 0x7fffffff;
  auVar321._0_8_ = 0x7fffffff7fffffff;
  auVar321._12_4_ = 0x7fffffff;
  auVar321._16_4_ = 0x7fffffff;
  auVar321._20_4_ = 0x7fffffff;
  auVar321._24_4_ = 0x7fffffff;
  auVar321._28_4_ = 0x7fffffff;
  auVar353._8_4_ = 0x219392ef;
  auVar353._0_8_ = 0x219392ef219392ef;
  auVar353._12_4_ = 0x219392ef;
  auVar353._16_4_ = 0x219392ef;
  auVar353._20_4_ = 0x219392ef;
  auVar353._24_4_ = 0x219392ef;
  auVar353._28_4_ = 0x219392ef;
  auVar138 = vandps_avx(auVar431,auVar321);
  auVar138 = vcmpps_avx(auVar138,auVar353,1);
  auVar146 = vblendvps_avx(auVar431,auVar353,auVar138);
  auVar138 = vandps_avx(auVar422,auVar321);
  auVar138 = vcmpps_avx(auVar138,auVar353,1);
  auVar34 = vblendvps_avx(auVar422,auVar353,auVar138);
  auVar138 = vandps_avx(auVar286,auVar321);
  auVar138 = vcmpps_avx(auVar138,auVar353,1);
  auVar138 = vblendvps_avx(auVar286,auVar353,auVar138);
  auVar204._0_4_ = fVar192 * auVar38._0_4_ + fVar256 * auVar39._0_4_ + auVar40._0_4_ * fVar237;
  auVar204._4_4_ = fVar254 * auVar38._4_4_ + fVar257 * auVar39._4_4_ + auVar40._4_4_ * fVar152;
  auVar204._8_4_ = fVar220 * auVar38._8_4_ + fVar258 * auVar39._8_4_ + auVar40._8_4_ * fVar253;
  auVar204._12_4_ = fVar255 * auVar38._12_4_ + fVar274 * auVar39._12_4_ + auVar40._12_4_ * fVar188;
  auVar204._16_4_ = fVar192 * auVar38._16_4_ + fVar256 * auVar39._16_4_ + auVar40._16_4_ * fVar237;
  auVar204._20_4_ = fVar254 * auVar38._20_4_ + fVar257 * auVar39._20_4_ + auVar40._20_4_ * fVar152;
  auVar204._24_4_ = fVar220 * auVar38._24_4_ + fVar258 * auVar39._24_4_ + auVar40._24_4_ * fVar253;
  auVar204._28_4_ = fVar233 + auVar36._28_4_ + fVar188;
  auVar35 = vrcpps_avx(auVar146);
  fVar237 = auVar35._0_4_;
  fVar253 = auVar35._4_4_;
  auVar36._4_4_ = auVar146._4_4_ * fVar253;
  auVar36._0_4_ = auVar146._0_4_ * fVar237;
  fVar233 = auVar35._8_4_;
  auVar36._8_4_ = auVar146._8_4_ * fVar233;
  fVar254 = auVar35._12_4_;
  auVar36._12_4_ = auVar146._12_4_ * fVar254;
  fVar255 = auVar35._16_4_;
  auVar36._16_4_ = auVar146._16_4_ * fVar255;
  fVar256 = auVar35._20_4_;
  auVar36._20_4_ = auVar146._20_4_ * fVar256;
  fVar257 = auVar35._24_4_;
  auVar36._24_4_ = auVar146._24_4_ * fVar257;
  auVar36._28_4_ = auVar146._28_4_;
  auVar354._8_4_ = 0x3f800000;
  auVar354._0_8_ = &DAT_3f8000003f800000;
  auVar354._12_4_ = 0x3f800000;
  auVar354._16_4_ = 0x3f800000;
  auVar354._20_4_ = 0x3f800000;
  auVar354._24_4_ = 0x3f800000;
  auVar354._28_4_ = 0x3f800000;
  auVar37 = vsubps_avx(auVar354,auVar36);
  auVar36 = vrcpps_avx(auVar34);
  fVar237 = fVar237 + fVar237 * auVar37._0_4_;
  fVar253 = fVar253 + fVar253 * auVar37._4_4_;
  fVar233 = fVar233 + fVar233 * auVar37._8_4_;
  fVar254 = fVar254 + fVar254 * auVar37._12_4_;
  fVar255 = fVar255 + fVar255 * auVar37._16_4_;
  fVar256 = fVar256 + fVar256 * auVar37._20_4_;
  fVar257 = fVar257 + fVar257 * auVar37._24_4_;
  fVar258 = auVar36._0_4_;
  fVar274 = auVar36._4_4_;
  auVar146._4_4_ = fVar274 * auVar34._4_4_;
  auVar146._0_4_ = fVar258 * auVar34._0_4_;
  fVar275 = auVar36._8_4_;
  auVar146._8_4_ = fVar275 * auVar34._8_4_;
  fVar276 = auVar36._12_4_;
  auVar146._12_4_ = fVar276 * auVar34._12_4_;
  fVar277 = auVar36._16_4_;
  auVar146._16_4_ = fVar277 * auVar34._16_4_;
  fVar278 = auVar36._20_4_;
  auVar146._20_4_ = fVar278 * auVar34._20_4_;
  fVar279 = auVar36._24_4_;
  auVar146._24_4_ = fVar279 * auVar34._24_4_;
  auVar146._28_4_ = auVar34._28_4_;
  auVar34 = vsubps_avx(auVar354,auVar146);
  fVar258 = fVar258 + fVar258 * auVar34._0_4_;
  fVar274 = fVar274 + fVar274 * auVar34._4_4_;
  fVar275 = fVar275 + fVar275 * auVar34._8_4_;
  fVar276 = fVar276 + fVar276 * auVar34._12_4_;
  fVar277 = fVar277 + fVar277 * auVar34._16_4_;
  fVar278 = fVar278 + fVar278 * auVar34._20_4_;
  fVar279 = fVar279 + fVar279 * auVar34._24_4_;
  auVar146 = vrcpps_avx(auVar138);
  fVar280 = auVar146._0_4_;
  fVar294 = auVar146._4_4_;
  auVar38._4_4_ = fVar294 * auVar138._4_4_;
  auVar38._0_4_ = fVar280 * auVar138._0_4_;
  fVar295 = auVar146._8_4_;
  auVar38._8_4_ = fVar295 * auVar138._8_4_;
  fVar296 = auVar146._12_4_;
  auVar38._12_4_ = fVar296 * auVar138._12_4_;
  fVar297 = auVar146._16_4_;
  auVar38._16_4_ = fVar297 * auVar138._16_4_;
  fVar298 = auVar146._20_4_;
  auVar38._20_4_ = fVar298 * auVar138._20_4_;
  fVar299 = auVar146._24_4_;
  auVar38._24_4_ = fVar299 * auVar138._24_4_;
  auVar38._28_4_ = auVar138._28_4_;
  auVar138 = vsubps_avx(auVar354,auVar38);
  fVar280 = fVar280 + fVar280 * auVar138._0_4_;
  fVar294 = fVar294 + fVar294 * auVar138._4_4_;
  fVar295 = fVar295 + fVar295 * auVar138._8_4_;
  fVar296 = fVar296 + fVar296 * auVar138._12_4_;
  fVar297 = fVar297 + fVar297 * auVar138._16_4_;
  fVar298 = fVar298 + fVar298 * auVar138._20_4_;
  fVar299 = fVar299 + fVar299 * auVar138._24_4_;
  auVar157 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar123 + 0x16)) *
                           *(float *)(prim + lVar123 + 0x1a)));
  auVar159 = vshufps_avx(auVar157,auVar157,0);
  auVar157._8_8_ = 0;
  auVar157._0_8_ = *(ulong *)(prim + uVar124 * 7 + 6);
  auVar157 = vpmovsxwd_avx(auVar157);
  auVar240._8_8_ = 0;
  auVar240._0_8_ = *(ulong *)(prim + uVar124 * 7 + 0xe);
  auVar240 = vpmovsxwd_avx(auVar240);
  auVar322._16_16_ = auVar240;
  auVar322._0_16_ = auVar157;
  auVar138 = vcvtdq2ps_avx(auVar322);
  auVar130._8_8_ = 0;
  auVar130._0_8_ = *(ulong *)(prim + uVar124 * 0xb + 6);
  auVar157 = vpmovsxwd_avx(auVar130);
  auVar158._8_8_ = 0;
  auVar158._0_8_ = *(ulong *)(prim + uVar124 * 0xb + 0xe);
  auVar240 = vpmovsxwd_avx(auVar158);
  auVar355._16_16_ = auVar240;
  auVar355._0_16_ = auVar157;
  auVar146 = vcvtdq2ps_avx(auVar355);
  auVar146 = vsubps_avx(auVar146,auVar138);
  fVar152 = auVar159._0_4_;
  fVar188 = auVar159._4_4_;
  fVar192 = auVar159._8_4_;
  fVar220 = auVar159._12_4_;
  auVar159._8_8_ = 0;
  auVar159._0_8_ = *(ulong *)(prim + uVar124 * 9 + 6);
  auVar157 = vpmovsxwd_avx(auVar159);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar124 * 9 + 0xe);
  auVar240 = vpmovsxwd_avx(auVar10);
  auVar323._0_4_ = auVar146._0_4_ * fVar152 + auVar138._0_4_;
  auVar323._4_4_ = auVar146._4_4_ * fVar188 + auVar138._4_4_;
  auVar323._8_4_ = auVar146._8_4_ * fVar192 + auVar138._8_4_;
  auVar323._12_4_ = auVar146._12_4_ * fVar220 + auVar138._12_4_;
  auVar323._16_4_ = auVar146._16_4_ * fVar152 + auVar138._16_4_;
  auVar323._20_4_ = auVar146._20_4_ * fVar188 + auVar138._20_4_;
  auVar323._24_4_ = auVar146._24_4_ * fVar192 + auVar138._24_4_;
  auVar323._28_4_ = auVar146._28_4_ + auVar138._28_4_;
  auVar356._16_16_ = auVar240;
  auVar356._0_16_ = auVar157;
  auVar138 = vcvtdq2ps_avx(auVar356);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar124 * 0xd + 6);
  auVar157 = vpmovsxwd_avx(auVar11);
  auVar162._8_8_ = 0;
  auVar162._0_8_ = *(ulong *)(prim + uVar124 * 0xd + 0xe);
  auVar240 = vpmovsxwd_avx(auVar162);
  auVar386._16_16_ = auVar240;
  auVar386._0_16_ = auVar157;
  auVar146 = vcvtdq2ps_avx(auVar386);
  auVar146 = vsubps_avx(auVar146,auVar138);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar124 * 0x12 + 6);
  auVar157 = vpmovsxwd_avx(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar124 * 0x12 + 0xe);
  auVar240 = vpmovsxwd_avx(auVar13);
  auVar357._0_4_ = auVar138._0_4_ + auVar146._0_4_ * fVar152;
  auVar357._4_4_ = auVar138._4_4_ + auVar146._4_4_ * fVar188;
  auVar357._8_4_ = auVar138._8_4_ + auVar146._8_4_ * fVar192;
  auVar357._12_4_ = auVar138._12_4_ + auVar146._12_4_ * fVar220;
  auVar357._16_4_ = auVar138._16_4_ + auVar146._16_4_ * fVar152;
  auVar357._20_4_ = auVar138._20_4_ + auVar146._20_4_ * fVar188;
  auVar357._24_4_ = auVar138._24_4_ + auVar146._24_4_ * fVar192;
  auVar357._28_4_ = auVar138._28_4_ + auVar146._28_4_;
  auVar387._16_16_ = auVar240;
  auVar387._0_16_ = auVar157;
  auVar138 = vcvtdq2ps_avx(auVar387);
  uVar119 = (ulong)(uint)((int)lVar31 << 2);
  lVar123 = uVar124 * 2 + uVar119;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + lVar123 + 6);
  auVar157 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + lVar123 + 0xe);
  auVar240 = vpmovsxwd_avx(auVar15);
  auVar411._16_16_ = auVar240;
  auVar411._0_16_ = auVar157;
  auVar146 = vcvtdq2ps_avx(auVar411);
  auVar146 = vsubps_avx(auVar146,auVar138);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar119 + 6);
  auVar157 = vpmovsxwd_avx(auVar16);
  auVar388._0_4_ = auVar138._0_4_ + auVar146._0_4_ * fVar152;
  auVar388._4_4_ = auVar138._4_4_ + auVar146._4_4_ * fVar188;
  auVar388._8_4_ = auVar138._8_4_ + auVar146._8_4_ * fVar192;
  auVar388._12_4_ = auVar138._12_4_ + auVar146._12_4_ * fVar220;
  auVar388._16_4_ = auVar138._16_4_ + auVar146._16_4_ * fVar152;
  auVar388._20_4_ = auVar138._20_4_ + auVar146._20_4_ * fVar188;
  auVar388._24_4_ = auVar138._24_4_ + auVar146._24_4_ * fVar192;
  auVar388._28_4_ = auVar138._28_4_ + auVar146._28_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar119 + 0xe);
  auVar240 = vpmovsxwd_avx(auVar17);
  auVar412._16_16_ = auVar240;
  auVar412._0_16_ = auVar157;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar124 * 0x18 + 6);
  auVar157 = vpmovsxwd_avx(auVar18);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar124 * 0x18 + 0xe);
  auVar240 = vpmovsxwd_avx(auVar19);
  auVar138 = vcvtdq2ps_avx(auVar412);
  auVar423._16_16_ = auVar240;
  auVar423._0_16_ = auVar157;
  auVar146 = vcvtdq2ps_avx(auVar423);
  auVar146 = vsubps_avx(auVar146,auVar138);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar124 * 0x1d + 6);
  auVar157 = vpmovsxwd_avx(auVar20);
  auVar413._0_4_ = auVar138._0_4_ + auVar146._0_4_ * fVar152;
  auVar413._4_4_ = auVar138._4_4_ + auVar146._4_4_ * fVar188;
  auVar413._8_4_ = auVar138._8_4_ + auVar146._8_4_ * fVar192;
  auVar413._12_4_ = auVar138._12_4_ + auVar146._12_4_ * fVar220;
  auVar413._16_4_ = auVar138._16_4_ + auVar146._16_4_ * fVar152;
  auVar413._20_4_ = auVar138._20_4_ + auVar146._20_4_ * fVar188;
  auVar413._24_4_ = auVar138._24_4_ + auVar146._24_4_ * fVar192;
  auVar413._28_4_ = auVar138._28_4_ + auVar146._28_4_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar124 * 0x1d + 0xe);
  auVar240 = vpmovsxwd_avx(auVar21);
  lVar123 = uVar124 + (ulong)(byte)PVar28 * 0x20;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + lVar123 + 6);
  auVar130 = vpmovsxwd_avx(auVar22);
  auVar424._16_16_ = auVar240;
  auVar424._0_16_ = auVar157;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + lVar123 + 0xe);
  auVar157 = vpmovsxwd_avx(auVar23);
  auVar432._16_16_ = auVar157;
  auVar432._0_16_ = auVar130;
  auVar138 = vcvtdq2ps_avx(auVar424);
  auVar146 = vcvtdq2ps_avx(auVar432);
  auVar146 = vsubps_avx(auVar146,auVar138);
  auVar425._0_4_ = auVar138._0_4_ + auVar146._0_4_ * fVar152;
  auVar425._4_4_ = auVar138._4_4_ + auVar146._4_4_ * fVar188;
  auVar425._8_4_ = auVar138._8_4_ + auVar146._8_4_ * fVar192;
  auVar425._12_4_ = auVar138._12_4_ + auVar146._12_4_ * fVar220;
  auVar425._16_4_ = auVar138._16_4_ + auVar146._16_4_ * fVar152;
  auVar425._20_4_ = auVar138._20_4_ + auVar146._20_4_ * fVar188;
  auVar425._24_4_ = auVar138._24_4_ + auVar146._24_4_ * fVar192;
  auVar425._28_4_ = auVar138._28_4_ + auVar146._28_4_;
  lVar123 = (ulong)(byte)PVar28 * 0x20 - uVar124;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + lVar123 + 6);
  auVar157 = vpmovsxwd_avx(auVar24);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + lVar123 + 0xe);
  auVar240 = vpmovsxwd_avx(auVar25);
  auVar433._16_16_ = auVar240;
  auVar433._0_16_ = auVar157;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar124 * 0x23 + 6);
  auVar157 = vpmovsxwd_avx(auVar26);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar124 * 0x23 + 0xe);
  auVar240 = vpmovsxwd_avx(auVar27);
  auVar449._16_16_ = auVar240;
  auVar449._0_16_ = auVar157;
  auVar138 = vcvtdq2ps_avx(auVar433);
  auVar146 = vcvtdq2ps_avx(auVar449);
  auVar146 = vsubps_avx(auVar146,auVar138);
  auVar434._0_4_ = auVar138._0_4_ + auVar146._0_4_ * fVar152;
  auVar434._4_4_ = auVar138._4_4_ + auVar146._4_4_ * fVar188;
  auVar434._8_4_ = auVar138._8_4_ + auVar146._8_4_ * fVar192;
  auVar434._12_4_ = auVar138._12_4_ + auVar146._12_4_ * fVar220;
  auVar434._16_4_ = auVar138._16_4_ + auVar146._16_4_ * fVar152;
  auVar434._20_4_ = auVar138._20_4_ + auVar146._20_4_ * fVar188;
  auVar434._24_4_ = auVar138._24_4_ + auVar146._24_4_ * fVar192;
  auVar434._28_4_ = auVar138._28_4_ + fVar220;
  auVar138 = vsubps_avx(auVar323,auVar171);
  auVar301._0_4_ = fVar237 * auVar138._0_4_;
  auVar301._4_4_ = fVar253 * auVar138._4_4_;
  auVar301._8_4_ = fVar233 * auVar138._8_4_;
  auVar301._12_4_ = fVar254 * auVar138._12_4_;
  auVar39._16_4_ = fVar255 * auVar138._16_4_;
  auVar39._0_16_ = auVar301;
  auVar39._20_4_ = fVar256 * auVar138._20_4_;
  auVar39._24_4_ = fVar257 * auVar138._24_4_;
  auVar39._28_4_ = auVar138._28_4_;
  auVar138 = vsubps_avx(auVar357,auVar171);
  auVar238._0_4_ = fVar237 * auVar138._0_4_;
  auVar238._4_4_ = fVar253 * auVar138._4_4_;
  auVar238._8_4_ = fVar233 * auVar138._8_4_;
  auVar238._12_4_ = fVar254 * auVar138._12_4_;
  auVar40._16_4_ = fVar255 * auVar138._16_4_;
  auVar40._0_16_ = auVar238;
  auVar40._20_4_ = fVar256 * auVar138._20_4_;
  auVar40._24_4_ = fVar257 * auVar138._24_4_;
  auVar40._28_4_ = auVar35._28_4_ + auVar37._28_4_;
  auVar138 = vsubps_avx(auVar388,auVar139);
  auVar154._0_4_ = fVar258 * auVar138._0_4_;
  auVar154._4_4_ = fVar274 * auVar138._4_4_;
  auVar154._8_4_ = fVar275 * auVar138._8_4_;
  auVar154._12_4_ = fVar276 * auVar138._12_4_;
  auVar35._16_4_ = fVar277 * auVar138._16_4_;
  auVar35._0_16_ = auVar154;
  auVar35._20_4_ = fVar278 * auVar138._20_4_;
  auVar35._24_4_ = fVar279 * auVar138._24_4_;
  auVar35._28_4_ = auVar138._28_4_;
  auVar138 = vsubps_avx(auVar413,auVar139);
  auVar259._0_4_ = fVar258 * auVar138._0_4_;
  auVar259._4_4_ = fVar274 * auVar138._4_4_;
  auVar259._8_4_ = fVar275 * auVar138._8_4_;
  auVar259._12_4_ = fVar276 * auVar138._12_4_;
  auVar37._16_4_ = fVar277 * auVar138._16_4_;
  auVar37._0_16_ = auVar259;
  auVar37._20_4_ = fVar278 * auVar138._20_4_;
  auVar37._24_4_ = fVar279 * auVar138._24_4_;
  auVar37._28_4_ = auVar36._28_4_ + auVar34._28_4_;
  auVar138 = vsubps_avx(auVar425,auVar204);
  auVar127._0_4_ = fVar280 * auVar138._0_4_;
  auVar127._4_4_ = fVar294 * auVar138._4_4_;
  auVar127._8_4_ = fVar295 * auVar138._8_4_;
  auVar127._12_4_ = fVar296 * auVar138._12_4_;
  auVar34._16_4_ = fVar297 * auVar138._16_4_;
  auVar34._0_16_ = auVar127;
  auVar34._20_4_ = fVar298 * auVar138._20_4_;
  auVar34._24_4_ = fVar299 * auVar138._24_4_;
  auVar34._28_4_ = auVar138._28_4_;
  auVar138 = vsubps_avx(auVar434,auVar204);
  auVar193._0_4_ = fVar280 * auVar138._0_4_;
  auVar193._4_4_ = fVar294 * auVar138._4_4_;
  auVar193._8_4_ = fVar295 * auVar138._8_4_;
  auVar193._12_4_ = fVar296 * auVar138._12_4_;
  auVar42._16_4_ = fVar297 * auVar138._16_4_;
  auVar42._0_16_ = auVar193;
  auVar42._20_4_ = fVar298 * auVar138._20_4_;
  auVar42._24_4_ = fVar299 * auVar138._24_4_;
  auVar42._28_4_ = auVar138._28_4_;
  auVar157 = vpminsd_avx(auVar39._16_16_,auVar40._16_16_);
  auVar240 = vpminsd_avx(auVar301,auVar238);
  auVar358._16_16_ = auVar157;
  auVar358._0_16_ = auVar240;
  auVar157 = vpminsd_avx(auVar35._16_16_,auVar37._16_16_);
  auVar240 = vpminsd_avx(auVar154,auVar259);
  auVar426._16_16_ = auVar157;
  auVar426._0_16_ = auVar240;
  auVar138 = vmaxps_avx(auVar358,auVar426);
  auVar157 = vpminsd_avx(auVar34._16_16_,auVar42._16_16_);
  auVar240 = vpminsd_avx(auVar127,auVar193);
  auVar450._16_16_ = auVar157;
  auVar450._0_16_ = auVar240;
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar466._4_4_ = uVar8;
  auVar466._0_4_ = uVar8;
  auVar466._8_4_ = uVar8;
  auVar466._12_4_ = uVar8;
  auVar466._16_4_ = uVar8;
  auVar466._20_4_ = uVar8;
  auVar466._24_4_ = uVar8;
  auVar466._28_4_ = uVar8;
  auVar146 = vmaxps_avx(auVar450,auVar466);
  auVar138 = vmaxps_avx(auVar138,auVar146);
  local_2a0._4_4_ = auVar138._4_4_ * 0.99999964;
  local_2a0._0_4_ = auVar138._0_4_ * 0.99999964;
  local_2a0._8_4_ = auVar138._8_4_ * 0.99999964;
  local_2a0._12_4_ = auVar138._12_4_ * 0.99999964;
  local_2a0._16_4_ = auVar138._16_4_ * 0.99999964;
  local_2a0._20_4_ = auVar138._20_4_ * 0.99999964;
  local_2a0._24_4_ = auVar138._24_4_ * 0.99999964;
  local_2a0._28_4_ = auVar138._28_4_;
  auVar157 = vpmaxsd_avx(auVar39._16_16_,auVar40._16_16_);
  auVar240 = vpmaxsd_avx(auVar301,auVar238);
  auVar248._16_16_ = auVar157;
  auVar248._0_16_ = auVar240;
  auVar157 = vpmaxsd_avx(auVar35._16_16_,auVar37._16_16_);
  auVar240 = vpmaxsd_avx(auVar154,auVar259);
  auVar172._16_16_ = auVar157;
  auVar172._0_16_ = auVar240;
  auVar138 = vminps_avx(auVar248,auVar172);
  auVar157 = vpmaxsd_avx(auVar34._16_16_,auVar42._16_16_);
  auVar240 = vpmaxsd_avx(auVar127,auVar193);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar205._4_4_ = uVar8;
  auVar205._0_4_ = uVar8;
  auVar205._8_4_ = uVar8;
  auVar205._12_4_ = uVar8;
  auVar205._16_4_ = uVar8;
  auVar205._20_4_ = uVar8;
  auVar205._24_4_ = uVar8;
  auVar205._28_4_ = uVar8;
  auVar140._16_16_ = auVar157;
  auVar140._0_16_ = auVar240;
  auVar146 = vminps_avx(auVar140,auVar205);
  auVar138 = vminps_avx(auVar138,auVar146);
  auVar309._4_4_ = auVar138._4_4_ * 1.0000004;
  auVar309._0_4_ = auVar138._0_4_ * 1.0000004;
  auVar309._8_4_ = auVar138._8_4_ * 1.0000004;
  auVar309._12_4_ = auVar138._12_4_ * 1.0000004;
  auVar309._16_4_ = auVar138._16_4_ * 1.0000004;
  auVar309._20_4_ = auVar138._20_4_ * 1.0000004;
  auVar309._24_4_ = auVar138._24_4_ * 1.0000004;
  auVar309._28_4_ = auVar138._28_4_;
  auVar138 = vcmpps_avx(local_2a0,auVar309,2);
  auVar157 = vpshufd_avx(ZEXT116((byte)PVar28),0);
  auVar173._16_16_ = auVar157;
  auVar173._0_16_ = auVar157;
  auVar146 = vcvtdq2ps_avx(auVar173);
  auVar146 = vcmpps_avx(_DAT_02020f40,auVar146,1);
  auVar138 = vandps_avx(auVar138,auVar146);
  uVar118 = vmovmskps_avx(auVar138);
  if (uVar118 == 0) {
    return;
  }
  uVar118 = uVar118 & 0xff;
  auVar141._16_16_ = mm_lookupmask_ps._240_16_;
  auVar141._0_16_ = mm_lookupmask_ps._240_16_;
  local_260 = vblendps_avx(auVar141,ZEXT832(0) << 0x20,0x80);
  local_9d0 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  auVar330 = ZEXT1664((undefined1  [16])0x0);
  local_8f0 = prim;
LAB_0127d0d0:
  local_8e8 = (ulong)uVar118;
  lVar123 = 0;
  if (local_8e8 != 0) {
    for (; (uVar118 >> lVar123 & 1) == 0; lVar123 = lVar123 + 1) {
    }
  }
  uVar118 = *(uint *)(local_8f0 + 2);
  local_9c8 = (ulong)*(uint *)(local_8f0 + lVar123 * 4 + 6);
  pGVar29 = (context->scene->geometries).items[uVar118].ptr;
  uVar124 = (ulong)*(uint *)(*(long *)&pGVar29->field_0x58 +
                            local_9c8 *
                            pGVar29[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar237 = (pGVar29->time_range).lower;
  fVar237 = pGVar29->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar237) / ((pGVar29->time_range).upper - fVar237));
  auVar157 = vroundss_avx(ZEXT416((uint)fVar237),ZEXT416((uint)fVar237),9);
  auVar157 = vminss_avx(auVar157,ZEXT416((uint)(pGVar29->fnumTimeSegments + -1.0)));
  auVar157 = vmaxss_avx(auVar330._0_16_,auVar157);
  fVar237 = fVar237 - auVar157._0_4_;
  _Var30 = pGVar29[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar120 = (long)(int)auVar157._0_4_ * 0x38;
  lVar31 = *(long *)(_Var30 + lVar120);
  lVar122 = *(long *)(_Var30 + 0x10 + lVar120);
  auVar157 = vshufps_avx(ZEXT416((uint)(1.0 - fVar237)),ZEXT416((uint)(1.0 - fVar237)),0);
  pfVar1 = (float *)(lVar31 + lVar122 * uVar124);
  fVar233 = auVar157._0_4_;
  fVar192 = auVar157._4_4_;
  fVar254 = auVar157._8_4_;
  fVar220 = auVar157._12_4_;
  pfVar2 = (float *)(lVar31 + lVar122 * (uVar124 + 1));
  pfVar3 = (float *)(lVar31 + lVar122 * (uVar124 + 2));
  pfVar4 = (float *)(lVar31 + lVar122 * (uVar124 + 3));
  lVar31 = *(long *)(_Var30 + 0x38 + lVar120);
  lVar122 = *(long *)(_Var30 + 0x48 + lVar120);
  auVar157 = vshufps_avx(ZEXT416((uint)fVar237),ZEXT416((uint)fVar237),0);
  pfVar5 = (float *)(lVar31 + uVar124 * lVar122);
  fVar255 = auVar157._0_4_;
  fVar256 = auVar157._4_4_;
  fVar257 = auVar157._8_4_;
  fVar258 = auVar157._12_4_;
  pfVar6 = (float *)(lVar31 + (uVar124 + 1) * lVar122);
  pfVar7 = (float *)(lVar31 + (uVar124 + 2) * lVar122);
  auVar239._0_4_ = fVar255 * *pfVar5 + fVar233 * *pfVar1;
  auVar239._4_4_ = fVar256 * pfVar5[1] + fVar192 * pfVar1[1];
  auVar239._8_4_ = fVar257 * pfVar5[2] + fVar254 * pfVar1[2];
  auVar239._12_4_ = fVar258 * pfVar5[3] + fVar220 * pfVar1[3];
  auVar157 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar240 = vinsertps_avx(auVar157,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar237 = *(float *)(ray + k * 4 + 0x40);
  auVar409._4_4_ = fVar237;
  auVar409._0_4_ = fVar237;
  auVar409._8_4_ = fVar237;
  auVar409._12_4_ = fVar237;
  fStack_7d0 = fVar237;
  _local_7e0 = auVar409;
  fStack_7cc = fVar237;
  fStack_7c8 = fVar237;
  fStack_7c4 = fVar237;
  auVar416 = ZEXT3264(_local_7e0);
  fVar152 = *(float *)(ray + k * 4 + 0x50);
  auVar421._4_4_ = fVar152;
  auVar421._0_4_ = fVar152;
  auVar421._8_4_ = fVar152;
  auVar421._12_4_ = fVar152;
  fStack_7f0 = fVar152;
  _local_800 = auVar421;
  fStack_7ec = fVar152;
  fStack_7e8 = fVar152;
  fStack_7e4 = fVar152;
  auVar427 = ZEXT3264(_local_800);
  auVar194._0_4_ = fVar233 * *pfVar2 + fVar255 * *pfVar6;
  auVar194._4_4_ = fVar192 * pfVar2[1] + fVar256 * pfVar6[1];
  auVar194._8_4_ = fVar254 * pfVar2[2] + fVar257 * pfVar6[2];
  auVar194._12_4_ = fVar220 * pfVar2[3] + fVar258 * pfVar6[3];
  auVar157 = vunpcklps_avx(auVar409,auVar421);
  fVar253 = *(float *)(ray + k * 4 + 0x60);
  auVar430._4_4_ = fVar253;
  auVar430._0_4_ = fVar253;
  auVar430._8_4_ = fVar253;
  auVar430._12_4_ = fVar253;
  fStack_870 = fVar253;
  _local_880 = auVar430;
  fStack_86c = fVar253;
  fStack_868 = fVar253;
  fStack_864 = fVar253;
  auVar438 = ZEXT3264(_local_880);
  _local_950 = vinsertps_avx(auVar157,auVar430,0x28);
  auVar453 = ZEXT1664(_local_950);
  auVar128._0_4_ = (auVar239._0_4_ + auVar194._0_4_) * 0.5;
  auVar128._4_4_ = (auVar239._4_4_ + auVar194._4_4_) * 0.5;
  auVar128._8_4_ = (auVar239._8_4_ + auVar194._8_4_) * 0.5;
  auVar128._12_4_ = (auVar239._12_4_ + auVar194._12_4_) * 0.5;
  auVar157 = vsubps_avx(auVar128,auVar240);
  auVar157 = vdpps_avx(auVar157,_local_950,0x7f);
  local_960 = vdpps_avx(_local_950,_local_950,0x7f);
  auVar155._0_4_ = fVar233 * *pfVar3 + fVar255 * *pfVar7;
  auVar155._4_4_ = fVar192 * pfVar3[1] + fVar256 * pfVar7[1];
  auVar155._8_4_ = fVar254 * pfVar3[2] + fVar257 * pfVar7[2];
  auVar155._12_4_ = fVar220 * pfVar3[3] + fVar258 * pfVar7[3];
  auVar130 = vrcpss_avx(local_960,local_960);
  fVar188 = auVar157._0_4_ * auVar130._0_4_ * (2.0 - local_960._0_4_ * auVar130._0_4_);
  auVar130 = vshufps_avx(ZEXT416((uint)fVar188),ZEXT416((uint)fVar188),0);
  auVar302._0_4_ = auVar240._0_4_ + local_950._0_4_ * auVar130._0_4_;
  auVar302._4_4_ = auVar240._4_4_ + local_950._4_4_ * auVar130._4_4_;
  auVar302._8_4_ = auVar240._8_4_ + local_950._8_4_ * auVar130._8_4_;
  auVar302._12_4_ = auVar240._12_4_ + local_950._12_4_ * auVar130._12_4_;
  auVar157 = vblendps_avx(auVar302,_DAT_01feba10,8);
  _local_a40 = vsubps_avx(auVar239,auVar157);
  auVar361 = ZEXT1664(_local_a40);
  _local_a50 = vsubps_avx(auVar155,auVar157);
  pfVar1 = (float *)(lVar31 + lVar122 * (uVar124 + 3));
  auVar156._0_4_ = fVar233 * *pfVar4 + fVar255 * *pfVar1;
  auVar156._4_4_ = fVar192 * pfVar4[1] + fVar256 * pfVar1[1];
  auVar156._8_4_ = fVar254 * pfVar4[2] + fVar257 * pfVar1[2];
  auVar156._12_4_ = fVar220 * pfVar4[3] + fVar258 * pfVar1[3];
  _local_a60 = vsubps_avx(auVar194,auVar157);
  _local_a70 = vsubps_avx(auVar156,auVar157);
  auVar157 = vshufps_avx(_local_a40,_local_a40,0);
  register0x00001250 = auVar157;
  _local_3a0 = auVar157;
  auVar157 = vshufps_avx(_local_a40,_local_a40,0x55);
  register0x00001250 = auVar157;
  _local_1a0 = auVar157;
  auVar157 = vshufps_avx(_local_a40,_local_a40,0xaa);
  register0x00001250 = auVar157;
  _local_1c0 = auVar157;
  auVar157 = vshufps_avx(_local_a40,_local_a40,0xff);
  register0x00001290 = auVar157;
  _local_1e0 = auVar157;
  auVar157 = vshufps_avx(_local_a60,_local_a60,0);
  register0x00001290 = auVar157;
  _local_3c0 = auVar157;
  auVar157 = vshufps_avx(_local_a60,_local_a60,0x55);
  register0x00001290 = auVar157;
  _local_3e0 = auVar157;
  auVar157 = vshufps_avx(_local_a60,_local_a60,0xaa);
  register0x00001290 = auVar157;
  _local_400 = auVar157;
  auVar157 = vshufps_avx(_local_a60,_local_a60,0xff);
  register0x00001290 = auVar157;
  _local_200 = auVar157;
  auVar157 = vshufps_avx(_local_a50,_local_a50,0);
  register0x00001290 = auVar157;
  _local_420 = auVar157;
  auVar157 = vshufps_avx(_local_a50,_local_a50,0x55);
  register0x00001290 = auVar157;
  _local_440 = auVar157;
  auVar157 = vshufps_avx(_local_a50,_local_a50,0xaa);
  register0x00001290 = auVar157;
  _local_460 = auVar157;
  auVar157 = vshufps_avx(_local_a50,_local_a50,0xff);
  register0x00001290 = auVar157;
  _local_480 = auVar157;
  auVar157 = vshufps_avx(_local_a70,_local_a70,0);
  register0x00001290 = auVar157;
  _local_4a0 = auVar157;
  auVar157 = vshufps_avx(_local_a70,_local_a70,0x55);
  register0x00001290 = auVar157;
  _local_4c0 = auVar157;
  auVar157 = vshufps_avx(_local_a70,_local_a70,0xaa);
  register0x00001290 = auVar157;
  _local_4e0 = auVar157;
  auVar157 = vshufps_avx(_local_a70,_local_a70,0xff);
  register0x00001290 = auVar157;
  _local_220 = auVar157;
  auVar157 = ZEXT416((uint)(fVar237 * fVar237 + fVar152 * fVar152 + fVar253 * fVar253));
  auVar157 = vshufps_avx(auVar157,auVar157,0);
  local_240._16_16_ = auVar157;
  local_240._0_16_ = auVar157;
  fVar237 = *(float *)(ray + k * 4 + 0x30);
  local_900 = ZEXT416((uint)fVar188);
  auVar157 = vshufps_avx(ZEXT416((uint)(fVar237 - fVar188)),ZEXT416((uint)(fVar237 - fVar188)),0);
  local_280._16_16_ = auVar157;
  local_280._0_16_ = auVar157;
  local_770 = vpshufd_avx(ZEXT416(uVar118),0);
  local_780 = vpshufd_avx(ZEXT416(*(uint *)(local_8f0 + lVar123 * 4 + 6)),0);
  register0x00001390 = auVar130;
  _local_860 = auVar130;
  uVar119 = 0;
  uVar124 = 1;
  auVar142._8_4_ = 0x7fffffff;
  auVar142._0_8_ = 0x7fffffff7fffffff;
  auVar142._12_4_ = 0x7fffffff;
  auVar142._16_4_ = 0x7fffffff;
  auVar142._20_4_ = 0x7fffffff;
  auVar142._24_4_ = 0x7fffffff;
  auVar142._28_4_ = 0x7fffffff;
  local_500 = vandps_avx(local_240,auVar142);
  auVar157 = vsqrtss_avx(local_960,local_960);
  local_b04 = auVar157._0_4_;
  auVar157 = vsqrtss_avx(local_960,local_960);
  local_b08 = auVar157._0_4_;
  local_910 = 0x3f80000000000000;
  uStack_908 = 0;
  auVar273 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  do {
    auVar114._8_8_ = uStack_908;
    auVar114._0_8_ = local_910;
    auVar157 = vmovshdup_avx(auVar114);
    fVar256 = auVar157._0_4_ - (float)local_910;
    auVar157 = vshufps_avx(auVar114,auVar114,0);
    local_9c0._16_16_ = auVar157;
    local_9c0._0_16_ = auVar157;
    auVar240 = vshufps_avx(ZEXT416((uint)fVar256),ZEXT416((uint)fVar256),0);
    local_7c0._16_16_ = auVar240;
    local_7c0._0_16_ = auVar240;
    fVar459 = auVar240._0_4_;
    fVar461 = auVar240._4_4_;
    fVar463 = auVar240._8_4_;
    fVar465 = auVar240._12_4_;
    fVar446 = auVar157._0_4_;
    auVar249._0_4_ = fVar446 + fVar459 * 0.0;
    fVar455 = auVar157._4_4_;
    auVar249._4_4_ = fVar455 + fVar461 * 0.14285715;
    fVar457 = auVar157._8_4_;
    auVar249._8_4_ = fVar457 + fVar463 * 0.2857143;
    fStack_b64 = auVar157._12_4_;
    auVar249._12_4_ = fStack_b64 + fVar465 * 0.42857146;
    auVar249._16_4_ = fVar446 + fVar459 * 0.5714286;
    auVar249._20_4_ = fVar455 + fVar461 * 0.71428573;
    auVar249._24_4_ = fVar457 + fVar463 * 0.8571429;
    auVar249._28_4_ = fStack_b64 + fVar465;
    auVar138 = vsubps_avx(auVar273._0_32_,auVar249);
    local_b80._4_4_ = auVar249._4_4_ * auVar249._4_4_;
    local_b80._0_4_ = auVar249._0_4_ * auVar249._0_4_;
    fStack_b78 = auVar249._8_4_ * auVar249._8_4_;
    fStack_b74 = auVar249._12_4_ * auVar249._12_4_;
    fStack_b70 = auVar249._16_4_ * auVar249._16_4_;
    fStack_b6c = auVar249._20_4_ * auVar249._20_4_;
    fStack_b68 = auVar249._24_4_ * auVar249._24_4_;
    fVar258 = auVar249._0_4_ * 3.0;
    fVar274 = auVar249._4_4_ * 3.0;
    fVar275 = auVar249._8_4_ * 3.0;
    fVar276 = auVar249._12_4_ * 3.0;
    fVar277 = auVar249._16_4_ * 3.0;
    fVar278 = auVar249._20_4_ * 3.0;
    fVar279 = auVar249._24_4_ * 3.0;
    fVar348 = auVar273._28_4_ + -5.0;
    fVar253 = auVar138._0_4_;
    auVar330._0_4_ = fVar253 * fVar253;
    fVar188 = auVar138._4_4_;
    auVar330._4_4_ = fVar188 * fVar188;
    fVar233 = auVar138._8_4_;
    auVar330._8_4_ = fVar233 * fVar233;
    fVar192 = auVar138._12_4_;
    auVar330._12_4_ = fVar192 * fVar192;
    fVar254 = auVar138._16_4_;
    auVar330._16_4_ = fVar254 * fVar254;
    fVar220 = auVar138._20_4_;
    auVar330._20_4_ = fVar220 * fVar220;
    fVar255 = auVar138._24_4_;
    auVar330._28_36_ = auVar361._28_36_;
    auVar330._24_4_ = fVar255 * fVar255;
    fVar257 = auVar138._28_4_;
    fVar280 = (auVar330._0_4_ * (fVar253 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar294 = (auVar330._4_4_ * (fVar188 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar295 = (auVar330._8_4_ * (fVar233 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar296 = (auVar330._12_4_ * (fVar192 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar297 = (auVar330._16_4_ * (fVar254 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar298 = (auVar330._20_4_ * (fVar220 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar299 = (auVar330._24_4_ * (fVar255 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar381 = -fVar253 * auVar249._0_4_ * auVar249._0_4_ * 0.5;
    fVar390 = -fVar188 * auVar249._4_4_ * auVar249._4_4_ * 0.5;
    fVar393 = -fVar233 * auVar249._8_4_ * auVar249._8_4_ * 0.5;
    fVar396 = -fVar192 * auVar249._12_4_ * auVar249._12_4_ * 0.5;
    fVar399 = -fVar254 * auVar249._16_4_ * auVar249._16_4_ * 0.5;
    fVar402 = -fVar220 * auVar249._20_4_ * auVar249._20_4_ * 0.5;
    fVar405 = -fVar255 * auVar249._24_4_ * auVar249._24_4_ * 0.5;
    fVar152 = auVar453._28_4_;
    fVar420 = auVar416._28_4_ + fVar152;
    fVar428 = auVar427._28_4_ + fVar152;
    fVar445 = (auVar249._0_4_ * auVar249._0_4_ * (fVar258 + -5.0) + 2.0) * 0.5;
    fVar454 = (auVar249._4_4_ * auVar249._4_4_ * (fVar274 + -5.0) + 2.0) * 0.5;
    fVar456 = (auVar249._8_4_ * auVar249._8_4_ * (fVar275 + -5.0) + 2.0) * 0.5;
    fVar458 = (auVar249._12_4_ * auVar249._12_4_ * (fVar276 + -5.0) + 2.0) * 0.5;
    fVar460 = (auVar249._16_4_ * auVar249._16_4_ * (fVar277 + -5.0) + 2.0) * 0.5;
    fVar462 = (auVar249._20_4_ * auVar249._20_4_ * (fVar278 + -5.0) + 2.0) * 0.5;
    fVar464 = (auVar249._24_4_ * auVar249._24_4_ * (fVar279 + -5.0) + 2.0) * 0.5;
    fVar408 = -fVar257 + fVar420;
    fVar429 = -auVar249._0_4_ * fVar253 * fVar253 * 0.5;
    fVar439 = -auVar249._4_4_ * fVar188 * fVar188 * 0.5;
    fVar440 = -auVar249._8_4_ * fVar233 * fVar233 * 0.5;
    fVar441 = -auVar249._12_4_ * fVar192 * fVar192 * 0.5;
    fVar442 = -auVar249._16_4_ * fVar254 * fVar254 * 0.5;
    fVar443 = -auVar249._20_4_ * fVar220 * fVar220 * 0.5;
    fVar444 = -auVar249._24_4_ * fVar255 * fVar255 * 0.5;
    fVar189 = fVar429 * (float)local_3a0._0_4_ +
              fVar445 * (float)local_3c0._0_4_ +
              fVar381 * (float)local_4a0._0_4_ + fVar280 * (float)local_420._0_4_;
    fVar214 = fVar439 * (float)local_3a0._4_4_ +
              fVar454 * (float)local_3c0._4_4_ +
              fVar390 * (float)local_4a0._4_4_ + fVar294 * (float)local_420._4_4_;
    fVar217 = fVar440 * fStack_398 +
              fVar456 * fStack_3b8 + fVar393 * fStack_498 + fVar295 * fStack_418;
    fVar221 = fVar441 * fStack_394 +
              fVar458 * fStack_3b4 + fVar396 * fStack_494 + fVar296 * fStack_414;
    fVar224 = fVar442 * fStack_390 +
              fVar460 * fStack_3b0 + fVar399 * fStack_490 + fVar297 * fStack_410;
    fVar227 = fVar443 * fStack_38c +
              fVar462 * fStack_3ac + fVar402 * fStack_48c + fVar298 * fStack_40c;
    fVar230 = fVar444 * fStack_388 +
              fVar464 * fStack_3a8 + fVar405 * fStack_488 + fVar299 * fStack_408;
    fVar234 = fVar152 + 2.0 + fVar408;
    fVar190 = (float)local_1a0._0_4_ * fVar429 +
              fVar445 * (float)local_3e0._0_4_ +
              fVar381 * (float)local_4c0._0_4_ + fVar280 * (float)local_440._0_4_;
    fVar215 = (float)local_1a0._4_4_ * fVar439 +
              fVar454 * (float)local_3e0._4_4_ +
              fVar390 * (float)local_4c0._4_4_ + fVar294 * (float)local_440._4_4_;
    fVar218 = fStack_198 * fVar440 +
              fVar456 * fStack_3d8 + fVar393 * fStack_4b8 + fVar295 * fStack_438;
    fVar222 = fStack_194 * fVar441 +
              fVar458 * fStack_3d4 + fVar396 * fStack_4b4 + fVar296 * fStack_434;
    fVar225 = fStack_190 * fVar442 +
              fVar460 * fStack_3d0 + fVar399 * fStack_4b0 + fVar297 * fStack_430;
    fVar228 = fStack_18c * fVar443 +
              fVar462 * fStack_3cc + fVar402 * fStack_4ac + fVar298 * fStack_42c;
    fVar231 = fStack_188 * fVar444 +
              fVar464 * fStack_3c8 + fVar405 * fStack_4a8 + fVar299 * fStack_428;
    fVar235 = fVar408 + fVar420 + fVar428;
    fVar191 = (float)local_1c0._0_4_ * fVar429 +
              fVar445 * (float)local_400._0_4_ +
              fVar381 * (float)local_4e0._0_4_ + fVar280 * (float)local_460._0_4_;
    fVar216 = (float)local_1c0._4_4_ * fVar439 +
              fVar454 * (float)local_400._4_4_ +
              fVar390 * (float)local_4e0._4_4_ + fVar294 * (float)local_460._4_4_;
    fVar219 = fStack_1b8 * fVar440 +
              fVar456 * fStack_3f8 + fVar393 * fStack_4d8 + fVar295 * fStack_458;
    fVar223 = fStack_1b4 * fVar441 +
              fVar458 * fStack_3f4 + fVar396 * fStack_4d4 + fVar296 * fStack_454;
    fVar226 = fStack_1b0 * fVar442 +
              fVar460 * fStack_3f0 + fVar399 * fStack_4d0 + fVar297 * fStack_450;
    fVar229 = fStack_1ac * fVar443 +
              fVar462 * fStack_3ec + fVar402 * fStack_4cc + fVar298 * fStack_44c;
    fVar232 = fStack_1a8 * fVar444 +
              fVar464 * fStack_3e8 + fVar405 * fStack_4c8 + fVar299 * fStack_448;
    fVar236 = fVar408 + fVar428 + auVar438._28_4_ + fVar152;
    local_6a0._0_4_ =
         (float)local_1e0._0_4_ * fVar429 +
         (float)local_200._0_4_ * fVar445 +
         fVar381 * (float)local_220._0_4_ + fVar280 * (float)local_480._0_4_;
    local_6a0._4_4_ =
         (float)local_1e0._4_4_ * fVar439 +
         (float)local_200._4_4_ * fVar454 +
         fVar390 * (float)local_220._4_4_ + fVar294 * (float)local_480._4_4_;
    local_6a0._8_4_ =
         fStack_1d8 * fVar440 + fStack_1f8 * fVar456 + fVar393 * fStack_218 + fVar295 * fStack_478;
    local_6a0._12_4_ =
         fStack_1d4 * fVar441 + fStack_1f4 * fVar458 + fVar396 * fStack_214 + fVar296 * fStack_474;
    local_6a0._16_4_ =
         fStack_1d0 * fVar442 + fStack_1f0 * fVar460 + fVar399 * fStack_210 + fVar297 * fStack_470;
    local_6a0._20_4_ =
         fStack_1cc * fVar443 + fStack_1ec * fVar462 + fVar402 * fStack_20c + fVar298 * fStack_46c;
    local_6a0._24_4_ =
         fStack_1c8 * fVar444 + fStack_1e8 * fVar464 + fVar405 * fStack_208 + fVar299 * fStack_468;
    local_6a0._28_4_ = fVar408 + fVar152 + 2.0 + -fVar257 + 0.0;
    fVar429 = fVar257 + fVar257;
    auVar43._4_4_ = (fVar188 + fVar188) * auVar249._4_4_;
    auVar43._0_4_ = (fVar253 + fVar253) * auVar249._0_4_;
    auVar43._8_4_ = (fVar233 + fVar233) * auVar249._8_4_;
    auVar43._12_4_ = (fVar192 + fVar192) * auVar249._12_4_;
    auVar43._16_4_ = (fVar254 + fVar254) * auVar249._16_4_;
    auVar43._20_4_ = (fVar220 + fVar220) * auVar249._20_4_;
    auVar43._24_4_ = (fVar255 + fVar255) * auVar249._24_4_;
    auVar43._28_4_ = auVar249._28_4_ + auVar249._28_4_;
    auVar138 = vsubps_avx(auVar43,auVar330._0_32_);
    fVar280 = auVar273._28_4_ + 2.0;
    auVar44._4_4_ = (fVar188 + fVar188) * (fVar274 + 2.0);
    auVar44._0_4_ = (fVar253 + fVar253) * (fVar258 + 2.0);
    auVar44._8_4_ = (fVar233 + fVar233) * (fVar275 + 2.0);
    auVar44._12_4_ = (fVar192 + fVar192) * (fVar276 + 2.0);
    auVar44._16_4_ = (fVar254 + fVar254) * (fVar277 + 2.0);
    auVar44._20_4_ = (fVar220 + fVar220) * (fVar278 + 2.0);
    auVar44._24_4_ = (fVar255 + fVar255) * (fVar279 + 2.0);
    auVar44._28_4_ = fVar280;
    auVar45._4_4_ = fVar188 * fVar188 * 3.0;
    auVar45._0_4_ = fVar253 * fVar253 * 3.0;
    auVar45._8_4_ = fVar233 * fVar233 * 3.0;
    auVar45._12_4_ = fVar192 * fVar192 * 3.0;
    auVar45._16_4_ = fVar254 * fVar254 * 3.0;
    auVar45._20_4_ = fVar220 * fVar220 * 3.0;
    auVar45._24_4_ = fVar255 * fVar255 * 3.0;
    auVar45._28_4_ = fVar257;
    auVar146 = vsubps_avx(auVar44,auVar45);
    auVar34 = vsubps_avx(_local_b80,auVar43);
    fVar396 = auVar138._0_4_ * 0.5;
    fVar399 = auVar138._4_4_ * 0.5;
    fVar402 = auVar138._8_4_ * 0.5;
    fVar405 = auVar138._12_4_ * 0.5;
    fVar408 = auVar138._16_4_ * 0.5;
    fVar420 = auVar138._20_4_ * 0.5;
    fVar428 = auVar138._24_4_ * 0.5;
    fVar296 = (auVar249._0_4_ * fVar258 + (auVar249._0_4_ + auVar249._0_4_) * (fVar258 + -5.0)) *
              0.5;
    fVar297 = (auVar249._4_4_ * fVar274 + (auVar249._4_4_ + auVar249._4_4_) * (fVar274 + -5.0)) *
              0.5;
    fVar298 = (auVar249._8_4_ * fVar275 + (auVar249._8_4_ + auVar249._8_4_) * (fVar275 + -5.0)) *
              0.5;
    fVar299 = (auVar249._12_4_ * fVar276 + (auVar249._12_4_ + auVar249._12_4_) * (fVar276 + -5.0)) *
              0.5;
    fVar381 = (auVar249._16_4_ * fVar277 + (auVar249._16_4_ + auVar249._16_4_) * (fVar277 + -5.0)) *
              0.5;
    fVar390 = (auVar249._20_4_ * fVar278 + (auVar249._20_4_ + auVar249._20_4_) * (fVar278 + -5.0)) *
              0.5;
    fVar393 = (auVar249._24_4_ * fVar279 + (auVar249._24_4_ + auVar249._24_4_) * (fVar279 + -5.0)) *
              0.5;
    fVar152 = auVar146._0_4_ * 0.5;
    fVar253 = auVar146._4_4_ * 0.5;
    fVar188 = auVar146._8_4_ * 0.5;
    fVar233 = auVar146._12_4_ * 0.5;
    fVar255 = auVar146._16_4_ * 0.5;
    fVar257 = auVar146._20_4_ * 0.5;
    fVar276 = auVar146._24_4_ * 0.5;
    fVar192 = auVar34._0_4_ * 0.5;
    fVar254 = auVar34._4_4_ * 0.5;
    fVar220 = auVar34._8_4_ * 0.5;
    fVar277 = auVar34._12_4_ * 0.5;
    fVar278 = auVar34._16_4_ * 0.5;
    fVar294 = auVar34._20_4_ * 0.5;
    fVar295 = auVar34._24_4_ * 0.5;
    fVar380 = fVar429 + auVar138._28_4_;
    fVar349 = fVar380 + fVar429 + fVar348;
    fVar280 = fVar280 + auVar249._28_4_ + fVar348 + auVar146._28_4_ + auVar34._28_4_;
    auVar157 = vpermilps_avx(ZEXT416((uint)(fVar256 * 0.04761905)),0);
    fVar274 = auVar157._0_4_;
    fVar317 = fVar274 * (fVar396 * (float)local_3a0._0_4_ +
                        fVar296 * (float)local_3c0._0_4_ +
                        fVar152 * (float)local_420._0_4_ + fVar192 * (float)local_4a0._0_4_);
    fVar275 = auVar157._4_4_;
    fVar331 = fVar275 * (fVar399 * (float)local_3a0._4_4_ +
                        fVar297 * (float)local_3c0._4_4_ +
                        fVar253 * (float)local_420._4_4_ + fVar254 * (float)local_4a0._4_4_);
    local_940._4_4_ = fVar331;
    local_940._0_4_ = fVar317;
    fVar279 = auVar157._8_4_;
    fVar333 = fVar279 * (fVar402 * fStack_398 +
                        fVar298 * fStack_3b8 + fVar188 * fStack_418 + fVar220 * fStack_498);
    local_940._8_4_ = fVar333;
    fVar258 = auVar157._12_4_;
    fVar336 = fVar258 * (fVar405 * fStack_394 +
                        fVar299 * fStack_3b4 + fVar233 * fStack_414 + fVar277 * fStack_494);
    local_940._12_4_ = fVar336;
    fVar339 = fVar274 * (fVar408 * fStack_390 +
                        fVar381 * fStack_3b0 + fVar255 * fStack_410 + fVar278 * fStack_490);
    local_940._16_4_ = fVar339;
    fVar342 = fVar275 * (fVar420 * fStack_38c +
                        fVar390 * fStack_3ac + fVar257 * fStack_40c + fVar294 * fStack_48c);
    local_940._20_4_ = fVar342;
    fVar345 = fVar279 * (fVar428 * fStack_388 +
                        fVar393 * fStack_3a8 + fVar276 * fStack_408 + fVar295 * fStack_488);
    local_940._24_4_ = fVar345;
    local_940._28_4_ = fVar349;
    fVar350 = fVar274 * ((float)local_1a0._0_4_ * fVar396 +
                        fVar296 * (float)local_3e0._0_4_ +
                        fVar152 * (float)local_440._0_4_ + fVar192 * (float)local_4c0._0_4_);
    fVar362 = fVar275 * ((float)local_1a0._4_4_ * fVar399 +
                        fVar297 * (float)local_3e0._4_4_ +
                        fVar253 * (float)local_440._4_4_ + fVar254 * (float)local_4c0._4_4_);
    auVar46._4_4_ = fVar362;
    auVar46._0_4_ = fVar350;
    fVar365 = fVar279 * (fStack_198 * fVar402 +
                        fVar298 * fStack_3d8 + fVar188 * fStack_438 + fVar220 * fStack_4b8);
    auVar46._8_4_ = fVar365;
    fVar368 = fVar258 * (fStack_194 * fVar405 +
                        fVar299 * fStack_3d4 + fVar233 * fStack_434 + fVar277 * fStack_4b4);
    auVar46._12_4_ = fVar368;
    fVar371 = fVar274 * (fStack_190 * fVar408 +
                        fVar381 * fStack_3d0 + fVar255 * fStack_430 + fVar278 * fStack_4b0);
    auVar46._16_4_ = fVar371;
    fVar374 = fVar275 * (fStack_18c * fVar420 +
                        fVar390 * fStack_3cc + fVar257 * fStack_42c + fVar294 * fStack_4ac);
    auVar46._20_4_ = fVar374;
    fVar377 = fVar279 * (fStack_188 * fVar428 +
                        fVar393 * fStack_3c8 + fVar276 * fStack_428 + fVar295 * fStack_4a8);
    auVar46._24_4_ = fVar377;
    auVar46._28_4_ = fVar380;
    fVar382 = fVar274 * ((float)local_1c0._0_4_ * fVar396 +
                        fVar152 * (float)local_460._0_4_ + fVar192 * (float)local_4e0._0_4_ +
                        fVar296 * (float)local_400._0_4_);
    fVar391 = fVar275 * ((float)local_1c0._4_4_ * fVar399 +
                        fVar253 * (float)local_460._4_4_ + fVar254 * (float)local_4e0._4_4_ +
                        fVar297 * (float)local_400._4_4_);
    auVar47._4_4_ = fVar391;
    auVar47._0_4_ = fVar382;
    fVar394 = fVar279 * (fStack_1b8 * fVar402 +
                        fVar188 * fStack_458 + fVar220 * fStack_4d8 + fVar298 * fStack_3f8);
    auVar47._8_4_ = fVar394;
    fVar397 = fVar258 * (fStack_1b4 * fVar405 +
                        fVar233 * fStack_454 + fVar277 * fStack_4d4 + fVar299 * fStack_3f4);
    auVar47._12_4_ = fVar397;
    fVar400 = fVar274 * (fStack_1b0 * fVar408 +
                        fVar255 * fStack_450 + fVar278 * fStack_4d0 + fVar381 * fStack_3f0);
    auVar47._16_4_ = fVar400;
    fVar403 = fVar275 * (fStack_1ac * fVar420 +
                        fVar257 * fStack_44c + fVar294 * fStack_4cc + fVar390 * fStack_3ec);
    auVar47._20_4_ = fVar403;
    fVar406 = fVar279 * (fStack_1a8 * fVar428 +
                        fVar276 * fStack_448 + fVar295 * fStack_4c8 + fVar393 * fStack_3e8);
    auVar47._24_4_ = fVar406;
    auVar47._28_4_ = fVar429;
    fVar192 = fVar274 * ((float)local_1e0._0_4_ * fVar396 +
                        (float)local_200._0_4_ * fVar296 +
                        fVar152 * (float)local_480._0_4_ + (float)local_220._0_4_ * fVar192);
    fVar254 = fVar275 * ((float)local_1e0._4_4_ * fVar399 +
                        (float)local_200._4_4_ * fVar297 +
                        fVar253 * (float)local_480._4_4_ + (float)local_220._4_4_ * fVar254);
    auVar48._4_4_ = fVar254;
    auVar48._0_4_ = fVar192;
    fVar220 = fVar279 * (fStack_1d8 * fVar402 +
                        fStack_1f8 * fVar298 + fVar188 * fStack_478 + fStack_218 * fVar220);
    auVar48._8_4_ = fVar220;
    fVar258 = fVar258 * (fStack_1d4 * fVar405 +
                        fStack_1f4 * fVar299 + fVar233 * fStack_474 + fStack_214 * fVar277);
    auVar48._12_4_ = fVar258;
    fVar274 = fVar274 * (fStack_1d0 * fVar408 +
                        fStack_1f0 * fVar381 + fVar255 * fStack_470 + fStack_210 * fVar278);
    auVar48._16_4_ = fVar274;
    fVar275 = fVar275 * (fStack_1cc * fVar420 +
                        fStack_1ec * fVar390 + fVar257 * fStack_46c + fStack_20c * fVar294);
    auVar48._20_4_ = fVar275;
    fVar279 = fVar279 * (fStack_1c8 * fVar428 +
                        fStack_1e8 * fVar393 + fVar276 * fStack_468 + fStack_208 * fVar295);
    auVar48._24_4_ = fVar279;
    auVar48._28_4_ = fVar280;
    auVar104._4_4_ = fVar215;
    auVar104._0_4_ = fVar190;
    auVar104._8_4_ = fVar218;
    auVar104._12_4_ = fVar222;
    auVar104._16_4_ = fVar225;
    auVar104._20_4_ = fVar228;
    auVar104._24_4_ = fVar231;
    auVar104._28_4_ = fVar235;
    auVar138 = vperm2f128_avx(auVar104,auVar104,1);
    auVar138 = vshufps_avx(auVar138,auVar104,0x30);
    _local_a00 = vshufps_avx(auVar104,auVar138,0x29);
    auVar106._4_4_ = fVar216;
    auVar106._0_4_ = fVar191;
    auVar106._8_4_ = fVar219;
    auVar106._12_4_ = fVar223;
    auVar106._16_4_ = fVar226;
    auVar106._20_4_ = fVar229;
    auVar106._24_4_ = fVar232;
    auVar106._28_4_ = fVar236;
    auVar138 = vperm2f128_avx(auVar106,auVar106,1);
    auVar138 = vshufps_avx(auVar138,auVar106,0x30);
    auVar35 = vshufps_avx(auVar106,auVar138,0x29);
    auVar146 = vsubps_avx(local_6a0,auVar48);
    auVar138 = vperm2f128_avx(auVar146,auVar146,1);
    auVar138 = vshufps_avx(auVar138,auVar146,0x30);
    auVar36 = vshufps_avx(auVar146,auVar138,0x29);
    local_620 = vsubps_avx(_local_a00,auVar104);
    local_600 = vsubps_avx(auVar35,auVar106);
    fVar253 = local_620._0_4_;
    fVar255 = local_620._4_4_;
    auVar49._4_4_ = fVar391 * fVar255;
    auVar49._0_4_ = fVar382 * fVar253;
    fVar276 = local_620._8_4_;
    auVar49._8_4_ = fVar394 * fVar276;
    fVar295 = local_620._12_4_;
    auVar49._12_4_ = fVar397 * fVar295;
    fVar390 = local_620._16_4_;
    auVar49._16_4_ = fVar400 * fVar390;
    fVar408 = local_620._20_4_;
    auVar49._20_4_ = fVar403 * fVar408;
    fVar440 = local_620._24_4_;
    auVar49._24_4_ = fVar406 * fVar440;
    auVar49._28_4_ = auVar146._28_4_;
    fVar188 = local_600._0_4_;
    fVar256 = local_600._4_4_;
    auVar50._4_4_ = fVar362 * fVar256;
    auVar50._0_4_ = fVar350 * fVar188;
    fVar277 = local_600._8_4_;
    auVar50._8_4_ = fVar365 * fVar277;
    fVar296 = local_600._12_4_;
    auVar50._12_4_ = fVar368 * fVar296;
    fVar393 = local_600._16_4_;
    auVar50._16_4_ = fVar371 * fVar393;
    fVar420 = local_600._20_4_;
    auVar50._20_4_ = fVar374 * fVar420;
    fVar441 = local_600._24_4_;
    auVar50._24_4_ = fVar377 * fVar441;
    auVar50._28_4_ = auVar138._28_4_;
    auVar34 = vsubps_avx(auVar50,auVar49);
    auVar108._4_4_ = fVar214;
    auVar108._0_4_ = fVar189;
    auVar108._8_4_ = fVar217;
    auVar108._12_4_ = fVar221;
    auVar108._16_4_ = fVar224;
    auVar108._20_4_ = fVar227;
    auVar108._24_4_ = fVar230;
    auVar108._28_4_ = fVar234;
    auVar138 = vperm2f128_avx(auVar108,auVar108,1);
    auVar138 = vshufps_avx(auVar138,auVar108,0x30);
    local_ac0 = vshufps_avx(auVar108,auVar138,0x29);
    local_640 = vsubps_avx(local_ac0,auVar108);
    auVar51._4_4_ = fVar331 * fVar256;
    auVar51._0_4_ = fVar317 * fVar188;
    auVar51._8_4_ = fVar333 * fVar277;
    auVar51._12_4_ = fVar336 * fVar296;
    auVar51._16_4_ = fVar339 * fVar393;
    auVar51._20_4_ = fVar342 * fVar420;
    auVar51._24_4_ = fVar345 * fVar441;
    auVar51._28_4_ = local_ac0._28_4_;
    fVar233 = local_640._0_4_;
    fVar257 = local_640._4_4_;
    auVar52._4_4_ = fVar391 * fVar257;
    auVar52._0_4_ = fVar382 * fVar233;
    fVar278 = local_640._8_4_;
    auVar52._8_4_ = fVar394 * fVar278;
    fVar297 = local_640._12_4_;
    auVar52._12_4_ = fVar397 * fVar297;
    fVar396 = local_640._16_4_;
    auVar52._16_4_ = fVar400 * fVar396;
    fVar428 = local_640._20_4_;
    auVar52._20_4_ = fVar403 * fVar428;
    fVar442 = local_640._24_4_;
    auVar52._24_4_ = fVar406 * fVar442;
    auVar52._28_4_ = fVar234;
    auVar37 = vsubps_avx(auVar52,auVar51);
    auVar53._4_4_ = fVar362 * fVar257;
    auVar53._0_4_ = fVar350 * fVar233;
    auVar53._8_4_ = fVar365 * fVar278;
    auVar53._12_4_ = fVar368 * fVar297;
    auVar53._16_4_ = fVar371 * fVar396;
    auVar53._20_4_ = fVar374 * fVar428;
    auVar53._24_4_ = fVar377 * fVar442;
    auVar53._28_4_ = fVar234;
    auVar54._4_4_ = fVar255 * fVar331;
    auVar54._0_4_ = fVar253 * fVar317;
    auVar54._8_4_ = fVar276 * fVar333;
    auVar54._12_4_ = fVar295 * fVar336;
    auVar54._16_4_ = fVar390 * fVar339;
    auVar54._20_4_ = fVar408 * fVar342;
    auVar54._24_4_ = fVar440 * fVar345;
    auVar54._28_4_ = fVar235;
    auVar38 = vsubps_avx(auVar54,auVar53);
    fVar152 = auVar38._28_4_;
    fVar294 = auVar37._28_4_ + fVar152;
    auVar250._0_4_ = fVar233 * fVar233 + fVar253 * fVar253 + fVar188 * fVar188;
    auVar250._4_4_ = fVar257 * fVar257 + fVar255 * fVar255 + fVar256 * fVar256;
    auVar250._8_4_ = fVar278 * fVar278 + fVar276 * fVar276 + fVar277 * fVar277;
    auVar250._12_4_ = fVar297 * fVar297 + fVar295 * fVar295 + fVar296 * fVar296;
    auVar250._16_4_ = fVar396 * fVar396 + fVar390 * fVar390 + fVar393 * fVar393;
    auVar250._20_4_ = fVar428 * fVar428 + fVar408 * fVar408 + fVar420 * fVar420;
    auVar250._24_4_ = fVar442 * fVar442 + fVar440 * fVar440 + fVar441 * fVar441;
    auVar250._28_4_ = fVar152 + fVar152 + fVar294;
    auVar138 = vrcpps_avx(auVar250);
    fVar298 = auVar138._0_4_;
    fVar299 = auVar138._4_4_;
    auVar55._4_4_ = fVar299 * auVar250._4_4_;
    auVar55._0_4_ = fVar298 * auVar250._0_4_;
    fVar381 = auVar138._8_4_;
    auVar55._8_4_ = fVar381 * auVar250._8_4_;
    fVar399 = auVar138._12_4_;
    auVar55._12_4_ = fVar399 * auVar250._12_4_;
    fVar402 = auVar138._16_4_;
    auVar55._16_4_ = fVar402 * auVar250._16_4_;
    fVar405 = auVar138._20_4_;
    auVar55._20_4_ = fVar405 * auVar250._20_4_;
    fVar348 = auVar138._24_4_;
    auVar55._24_4_ = fVar348 * auVar250._24_4_;
    auVar55._28_4_ = fVar235;
    auVar435._8_4_ = 0x3f800000;
    auVar435._0_8_ = &DAT_3f8000003f800000;
    auVar435._12_4_ = 0x3f800000;
    auVar435._16_4_ = 0x3f800000;
    auVar435._20_4_ = 0x3f800000;
    auVar435._24_4_ = 0x3f800000;
    auVar435._28_4_ = 0x3f800000;
    auVar39 = vsubps_avx(auVar435,auVar55);
    fVar298 = auVar39._0_4_ * fVar298 + fVar298;
    fVar299 = auVar39._4_4_ * fVar299 + fVar299;
    fVar381 = auVar39._8_4_ * fVar381 + fVar381;
    fVar399 = auVar39._12_4_ * fVar399 + fVar399;
    fVar402 = auVar39._16_4_ * fVar402 + fVar402;
    fVar405 = auVar39._20_4_ * fVar405 + fVar405;
    fVar348 = auVar39._24_4_ * fVar348 + fVar348;
    auVar146 = vperm2f128_avx(auVar46,auVar46,1);
    auVar146 = vshufps_avx(auVar146,auVar46,0x30);
    local_7a0 = vshufps_avx(auVar46,auVar146,0x29);
    auVar146 = vperm2f128_avx(auVar47,auVar47,1);
    auVar146 = vshufps_avx(auVar146,auVar47,0x30);
    local_b00 = vshufps_avx(auVar47,auVar146,0x29);
    fVar383 = local_b00._0_4_;
    fVar392 = local_b00._4_4_;
    auVar56._4_4_ = fVar392 * fVar255;
    auVar56._0_4_ = fVar383 * fVar253;
    fVar395 = local_b00._8_4_;
    auVar56._8_4_ = fVar395 * fVar276;
    fVar398 = local_b00._12_4_;
    auVar56._12_4_ = fVar398 * fVar295;
    fVar401 = local_b00._16_4_;
    auVar56._16_4_ = fVar401 * fVar390;
    fVar404 = local_b00._20_4_;
    auVar56._20_4_ = fVar404 * fVar408;
    fVar407 = local_b00._24_4_;
    auVar56._24_4_ = fVar407 * fVar440;
    auVar56._28_4_ = auVar146._28_4_;
    fVar351 = local_7a0._0_4_;
    fVar363 = local_7a0._4_4_;
    auVar57._4_4_ = fVar363 * fVar256;
    auVar57._0_4_ = fVar351 * fVar188;
    fVar366 = local_7a0._8_4_;
    auVar57._8_4_ = fVar366 * fVar277;
    fVar369 = local_7a0._12_4_;
    auVar57._12_4_ = fVar369 * fVar296;
    fVar372 = local_7a0._16_4_;
    auVar57._16_4_ = fVar372 * fVar393;
    fVar375 = local_7a0._20_4_;
    auVar57._20_4_ = fVar375 * fVar420;
    fVar378 = local_7a0._24_4_;
    auVar57._24_4_ = fVar378 * fVar441;
    auVar57._28_4_ = 0x3f800000;
    auVar40 = vsubps_avx(auVar57,auVar56);
    auVar146 = vperm2f128_avx(local_940,local_940,1);
    auVar146 = vshufps_avx(auVar146,local_940,0x30);
    local_ae0 = vshufps_avx(local_940,auVar146,0x29);
    fVar318 = local_ae0._0_4_;
    fVar332 = local_ae0._4_4_;
    auVar58._4_4_ = fVar332 * fVar256;
    auVar58._0_4_ = fVar318 * fVar188;
    fVar334 = local_ae0._8_4_;
    auVar58._8_4_ = fVar334 * fVar277;
    fVar337 = local_ae0._12_4_;
    auVar58._12_4_ = fVar337 * fVar296;
    fVar340 = local_ae0._16_4_;
    auVar58._16_4_ = fVar340 * fVar393;
    fVar343 = local_ae0._20_4_;
    auVar58._20_4_ = fVar343 * fVar420;
    fVar346 = local_ae0._24_4_;
    auVar58._24_4_ = fVar346 * fVar441;
    auVar58._28_4_ = auVar146._28_4_;
    auVar59._4_4_ = fVar392 * fVar257;
    auVar59._0_4_ = fVar383 * fVar233;
    auVar59._8_4_ = fVar395 * fVar278;
    auVar59._12_4_ = fVar398 * fVar297;
    auVar59._16_4_ = fVar401 * fVar396;
    auVar59._20_4_ = fVar404 * fVar428;
    auVar59._24_4_ = fVar407 * fVar442;
    auVar59._28_4_ = uStack_184;
    auVar42 = vsubps_avx(auVar59,auVar58);
    auVar60._4_4_ = fVar363 * fVar257;
    auVar60._0_4_ = fVar351 * fVar233;
    auVar60._8_4_ = fVar366 * fVar278;
    auVar60._12_4_ = fVar369 * fVar297;
    auVar60._16_4_ = fVar372 * fVar396;
    auVar60._20_4_ = fVar375 * fVar428;
    auVar60._24_4_ = fVar378 * fVar442;
    auVar60._28_4_ = uStack_184;
    auVar61._4_4_ = fVar255 * fVar332;
    auVar61._0_4_ = fVar253 * fVar318;
    auVar61._8_4_ = fVar276 * fVar334;
    auVar61._12_4_ = fVar295 * fVar337;
    auVar61._16_4_ = fVar390 * fVar340;
    auVar61._20_4_ = fVar408 * fVar343;
    auVar61._24_4_ = fVar440 * fVar346;
    auVar61._28_4_ = fStack_1a4;
    auVar146 = vsubps_avx(auVar61,auVar60);
    fVar152 = auVar146._28_4_;
    auVar62._4_4_ =
         (auVar34._4_4_ * auVar34._4_4_ +
         auVar37._4_4_ * auVar37._4_4_ + auVar38._4_4_ * auVar38._4_4_) * fVar299;
    auVar62._0_4_ =
         (auVar34._0_4_ * auVar34._0_4_ +
         auVar37._0_4_ * auVar37._0_4_ + auVar38._0_4_ * auVar38._0_4_) * fVar298;
    auVar62._8_4_ =
         (auVar34._8_4_ * auVar34._8_4_ +
         auVar37._8_4_ * auVar37._8_4_ + auVar38._8_4_ * auVar38._8_4_) * fVar381;
    auVar62._12_4_ =
         (auVar34._12_4_ * auVar34._12_4_ +
         auVar37._12_4_ * auVar37._12_4_ + auVar38._12_4_ * auVar38._12_4_) * fVar399;
    auVar62._16_4_ =
         (auVar34._16_4_ * auVar34._16_4_ +
         auVar37._16_4_ * auVar37._16_4_ + auVar38._16_4_ * auVar38._16_4_) * fVar402;
    auVar62._20_4_ =
         (auVar34._20_4_ * auVar34._20_4_ +
         auVar37._20_4_ * auVar37._20_4_ + auVar38._20_4_ * auVar38._20_4_) * fVar405;
    auVar62._24_4_ =
         (auVar34._24_4_ * auVar34._24_4_ +
         auVar37._24_4_ * auVar37._24_4_ + auVar38._24_4_ * auVar38._24_4_) * fVar348;
    auVar62._28_4_ = auVar34._28_4_ + fVar294;
    auVar63._4_4_ =
         (auVar40._4_4_ * auVar40._4_4_ +
         auVar42._4_4_ * auVar42._4_4_ + auVar146._4_4_ * auVar146._4_4_) * fVar299;
    auVar63._0_4_ =
         (auVar40._0_4_ * auVar40._0_4_ +
         auVar42._0_4_ * auVar42._0_4_ + auVar146._0_4_ * auVar146._0_4_) * fVar298;
    auVar63._8_4_ =
         (auVar40._8_4_ * auVar40._8_4_ +
         auVar42._8_4_ * auVar42._8_4_ + auVar146._8_4_ * auVar146._8_4_) * fVar381;
    auVar63._12_4_ =
         (auVar40._12_4_ * auVar40._12_4_ +
         auVar42._12_4_ * auVar42._12_4_ + auVar146._12_4_ * auVar146._12_4_) * fVar399;
    auVar63._16_4_ =
         (auVar40._16_4_ * auVar40._16_4_ +
         auVar42._16_4_ * auVar42._16_4_ + auVar146._16_4_ * auVar146._16_4_) * fVar402;
    auVar63._20_4_ =
         (auVar40._20_4_ * auVar40._20_4_ +
         auVar42._20_4_ * auVar42._20_4_ + auVar146._20_4_ * auVar146._20_4_) * fVar405;
    auVar63._24_4_ =
         (auVar40._24_4_ * auVar40._24_4_ +
         auVar42._24_4_ * auVar42._24_4_ + auVar146._24_4_ * auVar146._24_4_) * fVar348;
    auVar63._28_4_ = auVar39._28_4_ + auVar138._28_4_;
    auVar138 = vmaxps_avx(auVar62,auVar63);
    auVar146 = vperm2f128_avx(local_6a0,local_6a0,1);
    auVar146 = vshufps_avx(auVar146,local_6a0,0x30);
    auVar37 = vshufps_avx(local_6a0,auVar146,0x29);
    auVar174._0_4_ = local_6a0._0_4_ + fVar192;
    auVar174._4_4_ = local_6a0._4_4_ + fVar254;
    auVar174._8_4_ = local_6a0._8_4_ + fVar220;
    auVar174._12_4_ = local_6a0._12_4_ + fVar258;
    auVar174._16_4_ = local_6a0._16_4_ + fVar274;
    auVar174._20_4_ = local_6a0._20_4_ + fVar275;
    auVar174._24_4_ = local_6a0._24_4_ + fVar279;
    auVar174._28_4_ = local_6a0._28_4_ + fVar280;
    auVar146 = vmaxps_avx(local_6a0,auVar174);
    auVar34 = vmaxps_avx(auVar36,auVar37);
    auVar34 = vmaxps_avx(auVar146,auVar34);
    auVar146 = vrsqrtps_avx(auVar250);
    fVar192 = auVar146._0_4_;
    fVar254 = auVar146._4_4_;
    fVar220 = auVar146._8_4_;
    fVar258 = auVar146._12_4_;
    fVar274 = auVar146._16_4_;
    fVar275 = auVar146._20_4_;
    fVar279 = auVar146._24_4_;
    auVar64._4_4_ = fVar254 * fVar254 * fVar254 * auVar250._4_4_ * 0.5;
    auVar64._0_4_ = fVar192 * fVar192 * fVar192 * auVar250._0_4_ * 0.5;
    auVar64._8_4_ = fVar220 * fVar220 * fVar220 * auVar250._8_4_ * 0.5;
    auVar64._12_4_ = fVar258 * fVar258 * fVar258 * auVar250._12_4_ * 0.5;
    auVar64._16_4_ = fVar274 * fVar274 * fVar274 * auVar250._16_4_ * 0.5;
    auVar64._20_4_ = fVar275 * fVar275 * fVar275 * auVar250._20_4_ * 0.5;
    auVar64._24_4_ = fVar279 * fVar279 * fVar279 * auVar250._24_4_ * 0.5;
    auVar64._28_4_ = auVar250._28_4_;
    auVar65._4_4_ = fVar254 * 1.5;
    auVar65._0_4_ = fVar192 * 1.5;
    auVar65._8_4_ = fVar220 * 1.5;
    auVar65._12_4_ = fVar258 * 1.5;
    auVar65._16_4_ = fVar274 * 1.5;
    auVar65._20_4_ = fVar275 * 1.5;
    auVar65._24_4_ = fVar279 * 1.5;
    auVar65._28_4_ = auVar146._28_4_;
    auVar146 = vsubps_avx(auVar65,auVar64);
    auVar105._4_4_ = fVar215;
    auVar105._0_4_ = fVar190;
    auVar105._8_4_ = fVar218;
    auVar105._12_4_ = fVar222;
    auVar105._16_4_ = fVar225;
    auVar105._20_4_ = fVar228;
    auVar105._24_4_ = fVar231;
    auVar105._28_4_ = fVar235;
    local_980 = vsubps_avx(ZEXT832(0) << 0x20,auVar105);
    auVar107._4_4_ = fVar216;
    auVar107._0_4_ = fVar191;
    auVar107._8_4_ = fVar219;
    auVar107._12_4_ = fVar223;
    auVar107._16_4_ = fVar226;
    auVar107._20_4_ = fVar229;
    auVar107._24_4_ = fVar232;
    auVar107._28_4_ = fVar236;
    local_9a0 = vsubps_avx(ZEXT832(0) << 0x20,auVar107);
    fVar192 = local_9a0._0_4_;
    fVar258 = local_9a0._4_4_;
    fVar279 = local_9a0._8_4_;
    fVar298 = local_9a0._12_4_;
    fVar399 = local_9a0._16_4_;
    fVar348 = local_9a0._20_4_;
    fVar443 = local_9a0._24_4_;
    fVar254 = local_980._0_4_;
    fVar274 = local_980._4_4_;
    fVar280 = local_980._8_4_;
    fVar299 = local_980._12_4_;
    fVar402 = local_980._16_4_;
    fVar429 = local_980._20_4_;
    fVar444 = local_980._24_4_;
    auVar109._4_4_ = fVar214;
    auVar109._0_4_ = fVar189;
    auVar109._8_4_ = fVar217;
    auVar109._12_4_ = fVar221;
    auVar109._16_4_ = fVar224;
    auVar109._20_4_ = fVar227;
    auVar109._24_4_ = fVar230;
    auVar109._28_4_ = fVar234;
    auVar38 = vsubps_avx(ZEXT832(0) << 0x20,auVar109);
    fVar352 = auVar38._0_4_;
    fVar364 = auVar38._4_4_;
    fVar367 = auVar38._8_4_;
    fVar370 = auVar38._12_4_;
    fVar373 = auVar38._16_4_;
    fVar376 = auVar38._20_4_;
    fVar379 = auVar38._24_4_;
    auVar436._0_4_ =
         fVar352 * (float)local_7e0._0_4_ +
         (float)local_800._0_4_ * fVar254 + (float)local_880._0_4_ * fVar192;
    auVar436._4_4_ =
         fVar364 * (float)local_7e0._4_4_ +
         (float)local_800._4_4_ * fVar274 + (float)local_880._4_4_ * fVar258;
    auVar436._8_4_ = fVar367 * fStack_7d8 + fStack_7f8 * fVar280 + fStack_878 * fVar279;
    auVar436._12_4_ = fVar370 * fStack_7d4 + fStack_7f4 * fVar299 + fStack_874 * fVar298;
    auVar436._16_4_ = fVar373 * fStack_7d0 + fStack_7f0 * fVar402 + fStack_870 * fVar399;
    auVar436._20_4_ = fVar376 * fStack_7cc + fStack_7ec * fVar429 + fStack_86c * fVar348;
    auVar436._24_4_ = fVar379 * fStack_7c8 + fStack_7e8 * fVar444 + fStack_868 * fVar443;
    auVar436._28_4_ = fVar152 + fVar152 + auVar42._28_4_ + fVar152;
    auVar451._0_4_ = fVar352 * fVar352 + fVar254 * fVar254 + fVar192 * fVar192;
    auVar451._4_4_ = fVar364 * fVar364 + fVar274 * fVar274 + fVar258 * fVar258;
    auVar451._8_4_ = fVar367 * fVar367 + fVar280 * fVar280 + fVar279 * fVar279;
    auVar451._12_4_ = fVar370 * fVar370 + fVar299 * fVar299 + fVar298 * fVar298;
    auVar451._16_4_ = fVar373 * fVar373 + fVar402 * fVar402 + fVar399 * fVar399;
    auVar451._20_4_ = fVar376 * fVar376 + fVar429 * fVar429 + fVar348 * fVar348;
    auVar451._24_4_ = fVar379 * fVar379 + fVar444 * fVar444 + fVar443 * fVar443;
    auVar451._28_4_ = fStack_1a4 + fStack_1a4 + fVar152;
    fVar220 = auVar146._0_4_;
    fVar275 = auVar146._4_4_;
    fVar294 = auVar146._8_4_;
    fVar381 = auVar146._12_4_;
    fVar405 = auVar146._16_4_;
    fVar439 = auVar146._20_4_;
    fVar445 = auVar146._24_4_;
    local_540 = (float)local_7e0._0_4_ * fVar233 * fVar220 +
                fVar253 * fVar220 * (float)local_800._0_4_ +
                fVar220 * fVar188 * (float)local_880._0_4_;
    fStack_53c = (float)local_7e0._4_4_ * fVar257 * fVar275 +
                 fVar255 * fVar275 * (float)local_800._4_4_ +
                 fVar275 * fVar256 * (float)local_880._4_4_;
    fStack_538 = fStack_7d8 * fVar278 * fVar294 +
                 fVar276 * fVar294 * fStack_7f8 + fVar294 * fVar277 * fStack_878;
    fStack_534 = fStack_7d4 * fVar297 * fVar381 +
                 fVar295 * fVar381 * fStack_7f4 + fVar381 * fVar296 * fStack_874;
    fStack_530 = fStack_7d0 * fVar396 * fVar405 +
                 fVar390 * fVar405 * fStack_7f0 + fVar405 * fVar393 * fStack_870;
    fStack_52c = fStack_7cc * fVar428 * fVar439 +
                 fVar408 * fVar439 * fStack_7ec + fVar439 * fVar420 * fStack_86c;
    fStack_528 = fStack_7c8 * fVar442 * fVar445 +
                 fVar440 * fVar445 * fStack_7e8 + fVar445 * fVar441 * fStack_868;
    fVar335 = 0.0;
    fVar152 = fStack_7c4 + fStack_7e4 + fStack_864;
    local_6c0._0_4_ =
         fVar352 * fVar233 * fVar220 + fVar253 * fVar220 * fVar254 + fVar220 * fVar188 * fVar192;
    local_6c0._4_4_ =
         fVar364 * fVar257 * fVar275 + fVar255 * fVar275 * fVar274 + fVar275 * fVar256 * fVar258;
    fStack_6b8 = fVar367 * fVar278 * fVar294 +
                 fVar276 * fVar294 * fVar280 + fVar294 * fVar277 * fVar279;
    fStack_6b4 = fVar370 * fVar297 * fVar381 +
                 fVar295 * fVar381 * fVar299 + fVar381 * fVar296 * fVar298;
    fStack_6b0 = fVar373 * fVar396 * fVar405 +
                 fVar390 * fVar405 * fVar402 + fVar405 * fVar393 * fVar399;
    fStack_6ac = fVar376 * fVar428 * fVar439 +
                 fVar408 * fVar439 * fVar429 + fVar439 * fVar420 * fVar348;
    fStack_6a8 = fVar379 * fVar442 * fVar445 +
                 fVar440 * fVar445 * fVar444 + fVar445 * fVar441 * fVar443;
    fStack_6a4 = fStack_7e4 + fVar152;
    auVar66._4_4_ = fStack_53c * (float)local_6c0._4_4_;
    auVar66._0_4_ = local_540 * (float)local_6c0._0_4_;
    auVar66._8_4_ = fStack_538 * fStack_6b8;
    auVar66._12_4_ = fStack_534 * fStack_6b4;
    auVar66._16_4_ = fStack_530 * fStack_6b0;
    auVar66._20_4_ = fStack_52c * fStack_6ac;
    auVar66._24_4_ = fStack_528 * fStack_6a8;
    auVar66._28_4_ = fVar152;
    auVar39 = vsubps_avx(auVar436,auVar66);
    auVar67._4_4_ = (float)local_6c0._4_4_ * (float)local_6c0._4_4_;
    auVar67._0_4_ = (float)local_6c0._0_4_ * (float)local_6c0._0_4_;
    auVar67._8_4_ = fStack_6b8 * fStack_6b8;
    auVar67._12_4_ = fStack_6b4 * fStack_6b4;
    auVar67._16_4_ = fStack_6b0 * fStack_6b0;
    auVar67._20_4_ = fStack_6ac * fStack_6ac;
    auVar67._24_4_ = fStack_6a8 * fStack_6a8;
    auVar67._28_4_ = fStack_7e4;
    auVar40 = vsubps_avx(auVar451,auVar67);
    _local_5e0 = vsqrtps_avx(auVar138);
    fVar152 = (local_5e0._0_4_ + auVar34._0_4_) * 1.0000002;
    fVar454 = (local_5e0._4_4_ + auVar34._4_4_) * 1.0000002;
    fVar456 = (local_5e0._8_4_ + auVar34._8_4_) * 1.0000002;
    fVar458 = (local_5e0._12_4_ + auVar34._12_4_) * 1.0000002;
    fVar460 = (local_5e0._16_4_ + auVar34._16_4_) * 1.0000002;
    fVar462 = (local_5e0._20_4_ + auVar34._20_4_) * 1.0000002;
    fVar464 = (local_5e0._24_4_ + auVar34._24_4_) * 1.0000002;
    auVar68._4_4_ = fVar454 * fVar454;
    auVar68._0_4_ = fVar152 * fVar152;
    auVar68._8_4_ = fVar456 * fVar456;
    auVar68._12_4_ = fVar458 * fVar458;
    auVar68._16_4_ = fVar460 * fVar460;
    auVar68._20_4_ = fVar462 * fVar462;
    auVar68._24_4_ = fVar464 * fVar464;
    auVar68._28_4_ = local_5e0._28_4_ + auVar34._28_4_;
    fVar454 = auVar39._0_4_ + auVar39._0_4_;
    fVar456 = auVar39._4_4_ + auVar39._4_4_;
    local_300._0_8_ = CONCAT44(fVar456,fVar454);
    local_300._8_4_ = auVar39._8_4_ + auVar39._8_4_;
    local_300._12_4_ = auVar39._12_4_ + auVar39._12_4_;
    local_300._16_4_ = auVar39._16_4_ + auVar39._16_4_;
    local_300._20_4_ = auVar39._20_4_ + auVar39._20_4_;
    local_300._24_4_ = auVar39._24_4_ + auVar39._24_4_;
    fVar152 = auVar39._28_4_;
    local_300._28_4_ = fVar152 + fVar152;
    auVar39 = vsubps_avx(auVar40,auVar68);
    local_2e0._4_4_ = fStack_53c * fStack_53c;
    local_2e0._0_4_ = local_540 * local_540;
    local_2e0._8_4_ = fStack_538 * fStack_538;
    local_2e0._12_4_ = fStack_534 * fStack_534;
    local_2e0._16_4_ = fStack_530 * fStack_530;
    local_2e0._20_4_ = fStack_52c * fStack_52c;
    local_2e0._24_4_ = fStack_528 * fStack_528;
    local_2e0._28_4_ = local_640._28_4_;
    auVar427 = ZEXT3264(local_2e0);
    auVar42 = vsubps_avx(local_240,local_2e0);
    local_5a0._4_4_ = fVar456 * fVar456;
    local_5a0._0_4_ = fVar454 * fVar454;
    local_5a0._8_4_ = local_300._8_4_ * local_300._8_4_;
    local_5a0._12_4_ = local_300._12_4_ * local_300._12_4_;
    local_5a0._16_4_ = local_300._16_4_ * local_300._16_4_;
    local_5a0._20_4_ = local_300._20_4_ * local_300._20_4_;
    local_5a0._24_4_ = local_300._24_4_ * local_300._24_4_;
    local_5a0._28_4_ = fVar152;
    fVar458 = auVar42._0_4_;
    local_5c0._0_4_ = fVar458 * 4.0;
    fVar460 = auVar42._4_4_;
    local_5c0._4_4_ = fVar460 * 4.0;
    fVar462 = auVar42._8_4_;
    fStack_5b8 = fVar462 * 4.0;
    fVar464 = auVar42._12_4_;
    fStack_5b4 = fVar464 * 4.0;
    fVar417 = auVar42._16_4_;
    fStack_5b0 = fVar417 * 4.0;
    fVar418 = auVar42._20_4_;
    fStack_5ac = fVar418 * 4.0;
    fVar419 = auVar42._24_4_;
    fStack_5a8 = fVar419 * 4.0;
    uStack_5a4 = 0x40800000;
    auVar69._4_4_ = (float)local_5c0._4_4_ * auVar39._4_4_;
    auVar69._0_4_ = (float)local_5c0._0_4_ * auVar39._0_4_;
    auVar69._8_4_ = fStack_5b8 * auVar39._8_4_;
    auVar69._12_4_ = fStack_5b4 * auVar39._12_4_;
    auVar69._16_4_ = fStack_5b0 * auVar39._16_4_;
    auVar69._20_4_ = fStack_5ac * auVar39._20_4_;
    auVar69._24_4_ = fStack_5a8 * auVar39._24_4_;
    auVar69._28_4_ = 0x40800000;
    auVar34 = vsubps_avx(local_5a0,auVar69);
    auVar138 = vcmpps_avx(auVar34,ZEXT832(0) << 0x20,5);
    fVar152 = auVar42._28_4_;
    if ((((((((auVar138 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar138 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar138 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar138 >> 0x7f,0) == '\0') &&
          (auVar138 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar138 >> 0xbf,0) == '\0') &&
        (auVar138 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar138[0x1f])
    {
      local_b40._8_4_ = 0x7f800000;
      local_b40._0_8_ = 0x7f8000007f800000;
      local_b40._12_4_ = 0x7f800000;
      local_b40._16_4_ = 0x7f800000;
      local_b40._20_4_ = 0x7f800000;
      local_b40._24_4_ = 0x7f800000;
      local_b40._28_4_ = 0x7f800000;
      auVar467._8_4_ = 0xff800000;
      auVar467._0_8_ = 0xff800000ff800000;
      auVar467._12_4_ = 0xff800000;
      auVar467._16_4_ = 0xff800000;
      auVar467._20_4_ = 0xff800000;
      auVar467._24_4_ = 0xff800000;
      auVar467._28_4_ = 0xff800000;
    }
    else {
      auVar139 = vsqrtps_avx(auVar34);
      auVar306._0_4_ = fVar458 + fVar458;
      auVar306._4_4_ = fVar460 + fVar460;
      auVar306._8_4_ = fVar462 + fVar462;
      auVar306._12_4_ = fVar464 + fVar464;
      auVar306._16_4_ = fVar417 + fVar417;
      auVar306._20_4_ = fVar418 + fVar418;
      auVar306._24_4_ = fVar419 + fVar419;
      auVar306._28_4_ = fVar152 + fVar152;
      auVar309 = vrcpps_avx(auVar306);
      auVar34 = vcmpps_avx(auVar34,ZEXT832(0) << 0x20,5);
      fVar300 = auVar309._0_4_;
      fVar311 = auVar309._4_4_;
      auVar70._4_4_ = auVar306._4_4_ * fVar311;
      auVar70._0_4_ = auVar306._0_4_ * fVar300;
      fVar312 = auVar309._8_4_;
      auVar70._8_4_ = auVar306._8_4_ * fVar312;
      fVar313 = auVar309._12_4_;
      auVar70._12_4_ = auVar306._12_4_ * fVar313;
      fVar314 = auVar309._16_4_;
      auVar70._16_4_ = auVar306._16_4_ * fVar314;
      fVar315 = auVar309._20_4_;
      auVar70._20_4_ = auVar306._20_4_ * fVar315;
      fVar316 = auVar309._24_4_;
      auVar70._24_4_ = auVar306._24_4_ * fVar316;
      auVar70._28_4_ = auVar306._28_4_;
      auVar143._8_4_ = 0x3f800000;
      auVar143._0_8_ = &DAT_3f8000003f800000;
      auVar143._12_4_ = 0x3f800000;
      auVar143._16_4_ = 0x3f800000;
      auVar143._20_4_ = 0x3f800000;
      auVar143._24_4_ = 0x3f800000;
      auVar143._28_4_ = 0x3f800000;
      auVar140 = vsubps_avx(auVar143,auVar70);
      fVar300 = fVar300 + fVar300 * auVar140._0_4_;
      fVar311 = fVar311 + fVar311 * auVar140._4_4_;
      fVar312 = fVar312 + fVar312 * auVar140._8_4_;
      fVar313 = fVar313 + fVar313 * auVar140._12_4_;
      fVar314 = fVar314 + fVar314 * auVar140._16_4_;
      fVar315 = fVar315 + fVar315 * auVar140._20_4_;
      fVar316 = fVar316 + fVar316 * auVar140._24_4_;
      auVar324._0_8_ = CONCAT44(fVar456,fVar454) ^ 0x8000000080000000;
      auVar324._8_4_ = -local_300._8_4_;
      auVar324._12_4_ = -local_300._12_4_;
      auVar324._16_4_ = -local_300._16_4_;
      auVar324._20_4_ = -local_300._20_4_;
      auVar324._24_4_ = -local_300._24_4_;
      auVar324._28_4_ = -local_300._28_4_;
      auVar171 = vsubps_avx(auVar324,auVar139);
      fVar454 = auVar171._0_4_ * fVar300;
      fVar456 = auVar171._4_4_ * fVar311;
      auVar71._4_4_ = fVar456;
      auVar71._0_4_ = fVar454;
      fVar335 = auVar171._8_4_ * fVar312;
      auVar71._8_4_ = fVar335;
      fVar338 = auVar171._12_4_ * fVar313;
      auVar71._12_4_ = fVar338;
      fVar341 = auVar171._16_4_ * fVar314;
      auVar71._16_4_ = fVar341;
      fVar344 = auVar171._20_4_ * fVar315;
      auVar71._20_4_ = fVar344;
      fVar347 = auVar171._24_4_ * fVar316;
      auVar71._24_4_ = fVar347;
      auVar71._28_4_ = auVar171._28_4_;
      auVar139 = vsubps_avx(auVar139,local_300);
      fVar300 = auVar139._0_4_ * fVar300;
      fVar311 = auVar139._4_4_ * fVar311;
      auVar72._4_4_ = fVar311;
      auVar72._0_4_ = fVar300;
      fVar312 = auVar139._8_4_ * fVar312;
      auVar72._8_4_ = fVar312;
      fVar313 = auVar139._12_4_ * fVar313;
      auVar72._12_4_ = fVar313;
      fVar314 = auVar139._16_4_ * fVar314;
      auVar72._16_4_ = fVar314;
      fVar315 = auVar139._20_4_ * fVar315;
      auVar72._20_4_ = fVar315;
      fVar316 = auVar139._24_4_ * fVar316;
      auVar72._24_4_ = fVar316;
      auVar72._28_4_ = auVar139._28_4_;
      fStack_544 = fStack_6a4 + auVar309._28_4_ + auVar140._28_4_;
      local_560[0] = fVar220 * ((float)local_6c0._0_4_ + local_540 * fVar454);
      local_560[1] = fVar275 * ((float)local_6c0._4_4_ + fStack_53c * fVar456);
      local_560[2] = fVar294 * (fStack_6b8 + fStack_538 * fVar335);
      local_560[3] = fVar381 * (fStack_6b4 + fStack_534 * fVar338);
      fStack_550 = fVar405 * (fStack_6b0 + fStack_530 * fVar341);
      fStack_54c = fVar439 * (fStack_6ac + fStack_52c * fVar344);
      fStack_548 = fVar445 * (fStack_6a8 + fStack_528 * fVar347);
      fVar335 = auVar146._28_4_;
      local_580[0] = fVar220 * ((float)local_6c0._0_4_ + local_540 * fVar300);
      local_580[1] = fVar275 * ((float)local_6c0._4_4_ + fStack_53c * fVar311);
      local_580[2] = fVar294 * (fStack_6b8 + fStack_538 * fVar312);
      local_580[3] = fVar381 * (fStack_6b4 + fStack_534 * fVar313);
      fStack_570 = fVar405 * (fStack_6b0 + fStack_530 * fVar314);
      fStack_56c = fVar439 * (fStack_6ac + fStack_52c * fVar315);
      fStack_568 = fVar445 * (fStack_6a8 + fStack_528 * fVar316);
      fStack_564 = fStack_6a4 + fStack_544;
      auVar307._8_4_ = 0x7f800000;
      auVar307._0_8_ = 0x7f8000007f800000;
      auVar307._12_4_ = 0x7f800000;
      auVar307._16_4_ = 0x7f800000;
      auVar307._20_4_ = 0x7f800000;
      auVar307._24_4_ = 0x7f800000;
      auVar307._28_4_ = 0x7f800000;
      local_b40 = vblendvps_avx(auVar307,auVar71,auVar34);
      auVar325._8_4_ = 0x7fffffff;
      auVar325._0_8_ = 0x7fffffff7fffffff;
      auVar325._12_4_ = 0x7fffffff;
      auVar325._16_4_ = 0x7fffffff;
      auVar325._20_4_ = 0x7fffffff;
      auVar325._24_4_ = 0x7fffffff;
      auVar325._28_4_ = 0x7fffffff;
      auVar309 = vandps_avx(local_2e0,auVar325);
      auVar309 = vmaxps_avx(local_500,auVar309);
      auVar73._4_4_ = auVar309._4_4_ * 1.9073486e-06;
      auVar73._0_4_ = auVar309._0_4_ * 1.9073486e-06;
      auVar73._8_4_ = auVar309._8_4_ * 1.9073486e-06;
      auVar73._12_4_ = auVar309._12_4_ * 1.9073486e-06;
      auVar73._16_4_ = auVar309._16_4_ * 1.9073486e-06;
      auVar73._20_4_ = auVar309._20_4_ * 1.9073486e-06;
      auVar73._24_4_ = auVar309._24_4_ * 1.9073486e-06;
      auVar73._28_4_ = auVar309._28_4_;
      auVar309 = vandps_avx(auVar42,auVar325);
      auVar451 = vcmpps_avx(auVar309,auVar73,1);
      auVar308._8_4_ = 0xff800000;
      auVar308._0_8_ = 0xff800000ff800000;
      auVar308._12_4_ = 0xff800000;
      auVar308._16_4_ = 0xff800000;
      auVar308._20_4_ = 0xff800000;
      auVar308._24_4_ = 0xff800000;
      auVar308._28_4_ = 0xff800000;
      auVar467 = vblendvps_avx(auVar308,auVar72,auVar34);
      auVar309 = auVar34 & auVar451;
      if ((((((((auVar309 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar309 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar309 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar309 >> 0x7f,0) != '\0') ||
            (auVar309 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar309 >> 0xbf,0) != '\0') ||
          (auVar309 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar309[0x1f] < '\0') {
        auVar138 = vandps_avx(auVar451,auVar34);
        auVar157 = vpackssdw_avx(auVar138._0_16_,auVar138._16_16_);
        auVar139 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar309 = vcmpps_avx(auVar39,auVar139,2);
        auVar310._8_4_ = 0xff800000;
        auVar310._0_8_ = 0xff800000ff800000;
        auVar310._12_4_ = 0xff800000;
        auVar310._16_4_ = 0xff800000;
        auVar310._20_4_ = 0xff800000;
        auVar310._24_4_ = 0xff800000;
        auVar310._28_4_ = 0xff800000;
        auVar451._8_4_ = INFINITY;
        auVar451._0_8_ = 0x7f8000007f800000;
        auVar451._12_4_ = INFINITY;
        auVar451._16_4_ = INFINITY;
        auVar451._20_4_ = INFINITY;
        auVar451._24_4_ = INFINITY;
        auVar451._28_4_ = INFINITY;
        auVar39 = vblendvps_avx(auVar451,auVar310,auVar309);
        auVar240 = vpmovsxwd_avx(auVar157);
        auVar157 = vpunpckhwd_avx(auVar157,auVar157);
        auVar293._16_16_ = auVar157;
        auVar293._0_16_ = auVar240;
        local_b40 = vblendvps_avx(local_b40,auVar39,auVar293);
        auVar39 = vblendvps_avx(auVar310,auVar451,auVar309);
        auVar467 = vblendvps_avx(auVar467,auVar39,auVar293);
        auVar39 = vcmpps_avx(auVar139,ZEXT1232(ZEXT812(0)) << 0x20,0xf);
        auVar186._0_4_ = auVar138._0_4_ ^ auVar39._0_4_;
        auVar186._4_4_ = auVar138._4_4_ ^ auVar39._4_4_;
        auVar186._8_4_ = auVar138._8_4_ ^ auVar39._8_4_;
        auVar186._12_4_ = auVar138._12_4_ ^ auVar39._12_4_;
        auVar186._16_4_ = auVar138._16_4_ ^ auVar39._16_4_;
        auVar186._20_4_ = auVar138._20_4_ ^ auVar39._20_4_;
        auVar186._24_4_ = auVar138._24_4_ ^ auVar39._24_4_;
        auVar186._28_4_ = auVar138._28_4_ ^ auVar39._28_4_;
        auVar138 = vorps_avx(auVar309,auVar186);
        auVar138 = vandps_avx(auVar34,auVar138);
      }
    }
    auVar416 = ZEXT3264(auVar42);
    auVar453 = ZEXT3264(auVar451);
    auVar438 = ZEXT3264(auVar34);
    auVar361 = ZEXT3264(local_260);
    auVar34 = local_260 & auVar138;
    fVar454 = (float)local_860._0_4_;
    fVar456 = (float)local_860._4_4_;
    fVar300 = fStack_858;
    fVar311 = fStack_854;
    fVar312 = fStack_850;
    fVar313 = fStack_84c;
    fVar314 = fStack_848;
    fVar315 = fStack_844;
    if ((((((((auVar34 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar34 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar34 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar34 >> 0x7f,0) == '\0') &&
          (auVar34 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar34 >> 0xbf,0) == '\0') &&
        (auVar34 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar34[0x1f]) {
      auVar273 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                     &
                                                  DAT_3f8000003f800000)))))));
      auVar330 = ZEXT1264(ZEXT812(0)) << 0x20;
    }
    else {
      fStack_524 = fStack_7c4 + fStack_7e4 + fStack_864;
      local_2c0 = auVar146;
      auVar157 = vshufps_avx(ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_900._0_4_)
                                    ),ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) -
                                                    (float)local_900._0_4_)),0);
      auVar206._16_16_ = auVar157;
      auVar206._0_16_ = auVar157;
      auVar309 = vminps_avx(auVar206,auVar467);
      auVar144._0_4_ =
           (float)local_7e0._0_4_ * fVar317 +
           (float)local_800._0_4_ * fVar350 + fVar382 * (float)local_880._0_4_;
      auVar144._4_4_ =
           (float)local_7e0._4_4_ * fVar331 +
           (float)local_800._4_4_ * fVar362 + fVar391 * (float)local_880._4_4_;
      auVar144._8_4_ = fStack_7d8 * fVar333 + fStack_7f8 * fVar365 + fVar394 * fStack_878;
      auVar144._12_4_ = fStack_7d4 * fVar336 + fStack_7f4 * fVar368 + fVar397 * fStack_874;
      auVar144._16_4_ = fStack_7d0 * fVar339 + fStack_7f0 * fVar371 + fVar400 * fStack_870;
      auVar144._20_4_ = fStack_7cc * fVar342 + fStack_7ec * fVar374 + fVar403 * fStack_86c;
      auVar144._24_4_ = fStack_7c8 * fVar345 + fStack_7e8 * fVar377 + fVar406 * fStack_868;
      auVar144._28_4_ = fVar349 + fVar380 + auVar38._28_4_;
      auVar34 = vrcpps_avx(auVar144);
      fVar349 = auVar34._0_4_;
      fVar316 = auVar34._4_4_;
      auVar74._4_4_ = auVar144._4_4_ * fVar316;
      auVar74._0_4_ = auVar144._0_4_ * fVar349;
      fVar338 = auVar34._8_4_;
      auVar74._8_4_ = auVar144._8_4_ * fVar338;
      fVar341 = auVar34._12_4_;
      auVar74._12_4_ = auVar144._12_4_ * fVar341;
      fVar344 = auVar34._16_4_;
      auVar74._16_4_ = auVar144._16_4_ * fVar344;
      fVar347 = auVar34._20_4_;
      auVar74._20_4_ = auVar144._20_4_ * fVar347;
      fVar41 = auVar34._24_4_;
      auVar74._24_4_ = auVar144._24_4_ * fVar41;
      auVar74._28_4_ = fVar380;
      auVar414._8_4_ = 0x3f800000;
      auVar414._0_8_ = &DAT_3f8000003f800000;
      auVar414._12_4_ = 0x3f800000;
      auVar414._16_4_ = 0x3f800000;
      auVar414._20_4_ = 0x3f800000;
      auVar414._24_4_ = 0x3f800000;
      auVar414._28_4_ = 0x3f800000;
      auVar139 = vsubps_avx(auVar414,auVar74);
      auVar326._8_4_ = 0x7fffffff;
      auVar326._0_8_ = 0x7fffffff7fffffff;
      auVar326._12_4_ = 0x7fffffff;
      auVar326._16_4_ = 0x7fffffff;
      auVar326._20_4_ = 0x7fffffff;
      auVar326._24_4_ = 0x7fffffff;
      auVar326._28_4_ = 0x7fffffff;
      auVar34 = vandps_avx(auVar144,auVar326);
      auVar389._8_4_ = 0x219392ef;
      auVar389._0_8_ = 0x219392ef219392ef;
      auVar389._12_4_ = 0x219392ef;
      auVar389._16_4_ = 0x219392ef;
      auVar389._20_4_ = 0x219392ef;
      auVar389._24_4_ = 0x219392ef;
      auVar389._28_4_ = 0x219392ef;
      auVar39 = vcmpps_avx(auVar34,auVar389,1);
      auVar427 = ZEXT3264(CONCAT428(0x80000000,
                                    CONCAT424(0x80000000,
                                              CONCAT420(0x80000000,
                                                        CONCAT416(0x80000000,
                                                                  CONCAT412(0x80000000,
                                                                            CONCAT48(0x80000000,
                                                                                                                                                                          
                                                  0x8000000080000000)))))));
      auVar75._4_4_ =
           (fVar316 + fVar316 * auVar139._4_4_) *
           -(fVar331 * fVar364 + fVar362 * fVar274 + fVar391 * fVar258);
      auVar75._0_4_ =
           (fVar349 + fVar349 * auVar139._0_4_) *
           -(fVar317 * fVar352 + fVar350 * fVar254 + fVar382 * fVar192);
      auVar75._8_4_ =
           (fVar338 + fVar338 * auVar139._8_4_) *
           -(fVar333 * fVar367 + fVar365 * fVar280 + fVar394 * fVar279);
      auVar75._12_4_ =
           (fVar341 + fVar341 * auVar139._12_4_) *
           -(fVar336 * fVar370 + fVar368 * fVar299 + fVar397 * fVar298);
      auVar75._16_4_ =
           (fVar344 + fVar344 * auVar139._16_4_) *
           -(fVar339 * fVar373 + fVar371 * fVar402 + fVar400 * fVar399);
      auVar75._20_4_ =
           (fVar347 + fVar347 * auVar139._20_4_) *
           -(fVar342 * fVar376 + fVar374 * fVar429 + fVar403 * fVar348);
      auVar75._24_4_ =
           (fVar41 + fVar41 * auVar139._24_4_) *
           -(fVar345 * fVar379 + fVar377 * fVar444 + fVar406 * fVar443);
      auVar75._28_4_ = -(auVar38._28_4_ + fVar335 + local_300._28_4_);
      auVar34 = vcmpps_avx(auVar144,ZEXT832(0) << 0x20,1);
      auVar34 = vorps_avx(auVar39,auVar34);
      auVar437._8_4_ = 0xff800000;
      auVar437._0_8_ = 0xff800000ff800000;
      auVar437._12_4_ = 0xff800000;
      auVar437._16_4_ = 0xff800000;
      auVar437._20_4_ = 0xff800000;
      auVar437._24_4_ = 0xff800000;
      auVar437._28_4_ = 0xff800000;
      auVar438 = ZEXT3264(auVar437);
      auVar34 = vblendvps_avx(auVar75,auVar437,auVar34);
      auVar38 = vcmpps_avx(auVar144,ZEXT832(0) << 0x20,6);
      auVar38 = vorps_avx(auVar39,auVar38);
      auVar452._8_4_ = 0x7f800000;
      auVar452._0_8_ = 0x7f8000007f800000;
      auVar452._12_4_ = 0x7f800000;
      auVar452._16_4_ = 0x7f800000;
      auVar452._20_4_ = 0x7f800000;
      auVar452._24_4_ = 0x7f800000;
      auVar452._28_4_ = 0x7f800000;
      auVar453 = ZEXT3264(auVar452);
      auVar38 = vblendvps_avx(auVar75,auVar452,auVar38);
      auVar39 = vmaxps_avx(local_280,local_b40);
      auVar39 = vmaxps_avx(auVar39,auVar34);
      auVar38 = vminps_avx(auVar309,auVar38);
      auVar309 = ZEXT832(0) << 0x20;
      auVar34 = vsubps_avx(auVar309,_local_a00);
      auVar35 = vsubps_avx(auVar309,auVar35);
      auVar76._4_4_ = auVar35._4_4_ * -fVar392;
      auVar76._0_4_ = auVar35._0_4_ * -fVar383;
      auVar76._8_4_ = auVar35._8_4_ * -fVar395;
      auVar76._12_4_ = auVar35._12_4_ * -fVar398;
      auVar76._16_4_ = auVar35._16_4_ * -fVar401;
      auVar76._20_4_ = auVar35._20_4_ * -fVar404;
      auVar76._24_4_ = auVar35._24_4_ * -fVar407;
      auVar76._28_4_ = auVar35._28_4_;
      auVar77._4_4_ = fVar363 * auVar34._4_4_;
      auVar77._0_4_ = fVar351 * auVar34._0_4_;
      auVar77._8_4_ = fVar366 * auVar34._8_4_;
      auVar77._12_4_ = fVar369 * auVar34._12_4_;
      auVar77._16_4_ = fVar372 * auVar34._16_4_;
      auVar77._20_4_ = fVar375 * auVar34._20_4_;
      auVar77._24_4_ = fVar378 * auVar34._24_4_;
      auVar77._28_4_ = auVar34._28_4_;
      auVar34 = vsubps_avx(auVar76,auVar77);
      auVar35 = vsubps_avx(auVar309,local_ac0);
      auVar78._4_4_ = fVar332 * auVar35._4_4_;
      auVar78._0_4_ = fVar318 * auVar35._0_4_;
      auVar78._8_4_ = fVar334 * auVar35._8_4_;
      auVar78._12_4_ = fVar337 * auVar35._12_4_;
      auVar78._16_4_ = fVar340 * auVar35._16_4_;
      auVar78._20_4_ = fVar343 * auVar35._20_4_;
      uVar8 = auVar35._28_4_;
      auVar78._24_4_ = fVar346 * auVar35._24_4_;
      auVar78._28_4_ = uVar8;
      auVar309 = vsubps_avx(auVar34,auVar78);
      auVar79._4_4_ = -fVar392 * (float)local_880._4_4_;
      auVar79._0_4_ = -fVar383 * (float)local_880._0_4_;
      auVar79._8_4_ = -fVar395 * fStack_878;
      auVar79._12_4_ = -fVar398 * fStack_874;
      auVar79._16_4_ = -fVar401 * fStack_870;
      auVar79._20_4_ = -fVar404 * fStack_86c;
      auVar79._24_4_ = -fVar407 * fStack_868;
      auVar79._28_4_ = local_b00._28_4_ ^ 0x80000000;
      auVar80._4_4_ = (float)local_800._4_4_ * fVar363;
      auVar80._0_4_ = (float)local_800._0_4_ * fVar351;
      auVar80._8_4_ = fStack_7f8 * fVar366;
      auVar80._12_4_ = fStack_7f4 * fVar369;
      auVar80._16_4_ = fStack_7f0 * fVar372;
      auVar80._20_4_ = fStack_7ec * fVar375;
      auVar80._24_4_ = fStack_7e8 * fVar378;
      auVar80._28_4_ = uVar8;
      auVar271._8_4_ = 0x3f800000;
      auVar271._0_8_ = &DAT_3f8000003f800000;
      auVar271._12_4_ = 0x3f800000;
      auVar271._16_4_ = 0x3f800000;
      auVar271._20_4_ = 0x3f800000;
      auVar271._24_4_ = 0x3f800000;
      auVar271._28_4_ = 0x3f800000;
      auVar416 = ZEXT3264(auVar271);
      auVar34 = vsubps_avx(auVar79,auVar80);
      auVar81._4_4_ = (float)local_7e0._4_4_ * fVar332;
      auVar81._0_4_ = (float)local_7e0._0_4_ * fVar318;
      auVar81._8_4_ = fStack_7d8 * fVar334;
      auVar81._12_4_ = fStack_7d4 * fVar337;
      auVar81._16_4_ = fStack_7d0 * fVar340;
      auVar81._20_4_ = fStack_7cc * fVar343;
      auVar81._24_4_ = fStack_7c8 * fVar346;
      auVar81._28_4_ = uVar8;
      auVar139 = vsubps_avx(auVar34,auVar81);
      auVar34 = vrcpps_avx(auVar139);
      fVar192 = auVar34._0_4_;
      fVar254 = auVar34._4_4_;
      auVar82._4_4_ = auVar139._4_4_ * fVar254;
      auVar82._0_4_ = auVar139._0_4_ * fVar192;
      fVar258 = auVar34._8_4_;
      auVar82._8_4_ = auVar139._8_4_ * fVar258;
      fVar274 = auVar34._12_4_;
      auVar82._12_4_ = auVar139._12_4_ * fVar274;
      fVar279 = auVar34._16_4_;
      auVar82._16_4_ = auVar139._16_4_ * fVar279;
      fVar280 = auVar34._20_4_;
      auVar82._20_4_ = auVar139._20_4_ * fVar280;
      fVar298 = auVar34._24_4_;
      auVar82._24_4_ = auVar139._24_4_ * fVar298;
      auVar82._28_4_ = local_ae0._28_4_;
      auVar140 = vsubps_avx(auVar271,auVar82);
      auVar34 = vandps_avx(auVar139,auVar326);
      auVar35 = vcmpps_avx(auVar34,auVar389,1);
      auVar83._4_4_ = (fVar254 + fVar254 * auVar140._4_4_) * -auVar309._4_4_;
      auVar83._0_4_ = (fVar192 + fVar192 * auVar140._0_4_) * -auVar309._0_4_;
      auVar83._8_4_ = (fVar258 + fVar258 * auVar140._8_4_) * -auVar309._8_4_;
      auVar83._12_4_ = (fVar274 + fVar274 * auVar140._12_4_) * -auVar309._12_4_;
      auVar83._16_4_ = (fVar279 + fVar279 * auVar140._16_4_) * -auVar309._16_4_;
      auVar83._20_4_ = (fVar280 + fVar280 * auVar140._20_4_) * -auVar309._20_4_;
      auVar83._24_4_ = (fVar298 + fVar298 * auVar140._24_4_) * -auVar309._24_4_;
      auVar83._28_4_ = auVar309._28_4_ ^ 0x80000000;
      auVar309 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar34 = vcmpps_avx(auVar139,auVar309,1);
      auVar34 = vorps_avx(auVar35,auVar34);
      auVar34 = vblendvps_avx(auVar83,auVar437,auVar34);
      local_520 = vmaxps_avx(auVar39,auVar34);
      auVar34 = vcmpps_avx(auVar139,auVar309,6);
      auVar34 = vorps_avx(auVar35,auVar34);
      auVar34 = vblendvps_avx(auVar83,auVar452,auVar34);
      auVar138 = vandps_avx(local_260,auVar138);
      local_320 = vminps_avx(auVar38,auVar34);
      auVar34 = vcmpps_avx(local_520,local_320,2);
      auVar35 = auVar138 & auVar34;
      if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar35 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar35 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar35 >> 0x7f,0) != '\0') ||
            (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar35 >> 0xbf,0) != '\0') ||
          (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar35[0x1f] < '\0') {
        auVar35 = vminps_avx(local_6a0,auVar174);
        auVar36 = vminps_avx(auVar36,auVar37);
        auVar35 = vminps_avx(auVar35,auVar36);
        auVar35 = vsubps_avx(auVar35,_local_5e0);
        auVar138 = vandps_avx(auVar34,auVar138);
        auVar117._4_4_ = local_560[1];
        auVar117._0_4_ = local_560[0];
        auVar117._8_4_ = local_560[2];
        auVar117._12_4_ = local_560[3];
        auVar117._16_4_ = fStack_550;
        auVar117._20_4_ = fStack_54c;
        auVar117._24_4_ = fStack_548;
        auVar117._28_4_ = fStack_544;
        auVar34 = vminps_avx(auVar117,auVar271);
        auVar34 = vmaxps_avx(auVar34,ZEXT832(0) << 0x20);
        local_560[0] = fVar446 + fVar459 * (auVar34._0_4_ + 0.0) * 0.125;
        local_560[1] = fVar455 + fVar461 * (auVar34._4_4_ + 1.0) * 0.125;
        local_560[2] = fVar457 + fVar463 * (auVar34._8_4_ + 2.0) * 0.125;
        local_560[3] = fStack_b64 + fVar465 * (auVar34._12_4_ + 3.0) * 0.125;
        fStack_550 = fVar446 + fVar459 * (auVar34._16_4_ + 4.0) * 0.125;
        fStack_54c = fVar455 + fVar461 * (auVar34._20_4_ + 5.0) * 0.125;
        fStack_548 = fVar457 + fVar463 * (auVar34._24_4_ + 6.0) * 0.125;
        fStack_544 = fStack_b64 + auVar34._28_4_ + 7.0;
        auVar116._4_4_ = local_580[1];
        auVar116._0_4_ = local_580[0];
        auVar116._8_4_ = local_580[2];
        auVar116._12_4_ = local_580[3];
        auVar116._16_4_ = fStack_570;
        auVar116._20_4_ = fStack_56c;
        auVar116._24_4_ = fStack_568;
        auVar116._28_4_ = fStack_564;
        auVar34 = vminps_avx(auVar116,auVar271);
        auVar34 = vmaxps_avx(auVar34,ZEXT832(0) << 0x20);
        local_580[0] = fVar446 + fVar459 * (auVar34._0_4_ + 0.0) * 0.125;
        local_580[1] = fVar455 + fVar461 * (auVar34._4_4_ + 1.0) * 0.125;
        local_580[2] = fVar457 + fVar463 * (auVar34._8_4_ + 2.0) * 0.125;
        local_580[3] = fStack_b64 + fVar465 * (auVar34._12_4_ + 3.0) * 0.125;
        fStack_570 = fVar446 + fVar459 * (auVar34._16_4_ + 4.0) * 0.125;
        fStack_56c = fVar455 + fVar461 * (auVar34._20_4_ + 5.0) * 0.125;
        fStack_568 = fVar457 + fVar463 * (auVar34._24_4_ + 6.0) * 0.125;
        fStack_564 = fStack_b64 + auVar34._28_4_ + 7.0;
        auVar84._4_4_ = auVar35._4_4_ * 0.99999976;
        auVar84._0_4_ = auVar35._0_4_ * 0.99999976;
        auVar84._8_4_ = auVar35._8_4_ * 0.99999976;
        auVar84._12_4_ = auVar35._12_4_ * 0.99999976;
        auVar84._16_4_ = auVar35._16_4_ * 0.99999976;
        auVar84._20_4_ = auVar35._20_4_ * 0.99999976;
        auVar84._24_4_ = auVar35._24_4_ * 0.99999976;
        auVar84._28_4_ = 0x3f7ffffc;
        auVar34 = vmaxps_avx(ZEXT1232(ZEXT812(0)) << 0x20,auVar84);
        auVar85._4_4_ = auVar34._4_4_ * auVar34._4_4_;
        auVar85._0_4_ = auVar34._0_4_ * auVar34._0_4_;
        auVar85._8_4_ = auVar34._8_4_ * auVar34._8_4_;
        auVar85._12_4_ = auVar34._12_4_ * auVar34._12_4_;
        auVar85._16_4_ = auVar34._16_4_ * auVar34._16_4_;
        auVar85._20_4_ = auVar34._20_4_ * auVar34._20_4_;
        auVar85._24_4_ = auVar34._24_4_ * auVar34._24_4_;
        auVar85._28_4_ = auVar34._28_4_;
        auVar35 = vsubps_avx(auVar40,auVar85);
        auVar86._4_4_ = auVar35._4_4_ * (float)local_5c0._4_4_;
        auVar86._0_4_ = auVar35._0_4_ * (float)local_5c0._0_4_;
        auVar86._8_4_ = auVar35._8_4_ * fStack_5b8;
        auVar86._12_4_ = auVar35._12_4_ * fStack_5b4;
        auVar86._16_4_ = auVar35._16_4_ * fStack_5b0;
        auVar86._20_4_ = auVar35._20_4_ * fStack_5ac;
        auVar86._24_4_ = auVar35._24_4_ * fStack_5a8;
        auVar86._28_4_ = auVar34._28_4_;
        auVar36 = vsubps_avx(local_5a0,auVar86);
        local_aa0 = vcmpps_avx(auVar36,ZEXT832(0) << 0x20,5);
        auVar34 = local_aa0;
        if ((((((((local_aa0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_aa0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_aa0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_aa0 >> 0x7f,0) == '\0') &&
              (local_aa0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_aa0 >> 0xbf,0) == '\0') &&
            (local_aa0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_aa0[0x1f]) {
          _local_8c0 = ZEXT832(0) << 0x20;
          _local_8e0 = ZEXT832(0) << 0x20;
          auVar245 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar268 = ZEXT828(0) << 0x20;
          auVar384 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar207._8_4_ = 0x7f800000;
          auVar207._0_8_ = 0x7f8000007f800000;
          auVar207._12_4_ = 0x7f800000;
          auVar207._16_4_ = 0x7f800000;
          auVar207._20_4_ = 0x7f800000;
          auVar207._24_4_ = 0x7f800000;
          auVar207._28_4_ = 0x7f800000;
          auVar287._8_4_ = 0xff800000;
          auVar287._0_8_ = 0xff800000ff800000;
          auVar287._12_4_ = 0xff800000;
          auVar287._16_4_ = 0xff800000;
          auVar287._20_4_ = 0xff800000;
          auVar287._24_4_ = 0xff800000;
          auVar287._28_4_ = 0xff800000;
          local_aa0 = auVar46;
          _local_8a0 = _local_8c0;
        }
        else {
          auVar38 = vsqrtps_avx(auVar36);
          auVar269._0_4_ = fVar458 + fVar458;
          auVar269._4_4_ = fVar460 + fVar460;
          auVar269._8_4_ = fVar462 + fVar462;
          auVar269._12_4_ = fVar464 + fVar464;
          auVar269._16_4_ = fVar417 + fVar417;
          auVar269._20_4_ = fVar418 + fVar418;
          auVar269._24_4_ = fVar419 + fVar419;
          auVar269._28_4_ = fVar152 + fVar152;
          auVar37 = vrcpps_avx(auVar269);
          fVar152 = auVar37._0_4_;
          fVar192 = auVar37._4_4_;
          auVar87._4_4_ = auVar269._4_4_ * fVar192;
          auVar87._0_4_ = auVar269._0_4_ * fVar152;
          fVar254 = auVar37._8_4_;
          auVar87._8_4_ = auVar269._8_4_ * fVar254;
          fVar258 = auVar37._12_4_;
          auVar87._12_4_ = auVar269._12_4_ * fVar258;
          fVar274 = auVar37._16_4_;
          auVar87._16_4_ = auVar269._16_4_ * fVar274;
          fVar279 = auVar37._20_4_;
          auVar87._20_4_ = auVar269._20_4_ * fVar279;
          fVar280 = auVar37._24_4_;
          auVar87._24_4_ = auVar269._24_4_ * fVar280;
          auVar87._28_4_ = auVar269._28_4_;
          auVar39 = vsubps_avx(auVar271,auVar87);
          fVar152 = fVar152 + fVar152 * auVar39._0_4_;
          fVar192 = fVar192 + fVar192 * auVar39._4_4_;
          fVar254 = fVar254 + fVar254 * auVar39._8_4_;
          fVar258 = fVar258 + fVar258 * auVar39._12_4_;
          fVar274 = fVar274 + fVar274 * auVar39._16_4_;
          fVar279 = fVar279 + fVar279 * auVar39._20_4_;
          fVar280 = fVar280 + fVar280 * auVar39._24_4_;
          fVar298 = auVar37._28_4_ + auVar39._28_4_;
          auVar288._0_8_ = local_300._0_8_ ^ 0x8000000080000000;
          auVar288._8_4_ = -local_300._8_4_;
          auVar288._12_4_ = -local_300._12_4_;
          auVar288._16_4_ = -local_300._16_4_;
          auVar288._20_4_ = -local_300._20_4_;
          auVar288._24_4_ = -local_300._24_4_;
          auVar288._28_4_ = -local_300._28_4_;
          auVar37 = vsubps_avx(auVar288,auVar38);
          fVar446 = auVar37._0_4_ * fVar152;
          fVar455 = auVar37._4_4_ * fVar192;
          auVar88._4_4_ = fVar455;
          auVar88._0_4_ = fVar446;
          fVar457 = auVar37._8_4_ * fVar254;
          auVar88._8_4_ = fVar457;
          fVar459 = auVar37._12_4_ * fVar258;
          auVar88._12_4_ = fVar459;
          fVar461 = auVar37._16_4_ * fVar274;
          auVar88._16_4_ = fVar461;
          fVar463 = auVar37._20_4_ * fVar279;
          auVar88._20_4_ = fVar463;
          fVar465 = auVar37._24_4_ * fVar280;
          auVar88._24_4_ = fVar465;
          auVar88._28_4_ = 0x7f800000;
          auVar453 = ZEXT3264(auVar88);
          auVar38 = vsubps_avx(auVar38,local_300);
          fVar152 = auVar38._0_4_ * fVar152;
          fVar192 = auVar38._4_4_ * fVar192;
          auVar89._4_4_ = fVar192;
          auVar89._0_4_ = fVar152;
          fVar254 = auVar38._8_4_ * fVar254;
          auVar89._8_4_ = fVar254;
          fVar258 = auVar38._12_4_ * fVar258;
          auVar89._12_4_ = fVar258;
          fVar274 = auVar38._16_4_ * fVar274;
          auVar89._16_4_ = fVar274;
          fVar279 = auVar38._20_4_ * fVar279;
          auVar89._20_4_ = fVar279;
          fVar280 = auVar38._24_4_ * fVar280;
          auVar89._24_4_ = fVar280;
          auVar89._28_4_ = 0xff800000;
          auVar438 = ZEXT3264(auVar89);
          fVar299 = fVar220 * (fVar446 * local_540 + (float)local_6c0._0_4_);
          fVar399 = fVar275 * (fVar455 * fStack_53c + (float)local_6c0._4_4_);
          fVar402 = fVar294 * (fVar457 * fStack_538 + fStack_6b8);
          fVar348 = fVar381 * (fVar459 * fStack_534 + fStack_6b4);
          fVar429 = fVar405 * (fVar461 * fStack_530 + fStack_6b0);
          fVar443 = fVar439 * (fVar463 * fStack_52c + fStack_6ac);
          fVar444 = fVar445 * (fVar465 * fStack_528 + fStack_6a8);
          auVar251._0_4_ = fVar189 + fVar233 * fVar299;
          auVar251._4_4_ = fVar214 + fVar257 * fVar399;
          auVar251._8_4_ = fVar217 + fVar278 * fVar402;
          auVar251._12_4_ = fVar221 + fVar297 * fVar348;
          auVar251._16_4_ = fVar224 + fVar396 * fVar429;
          auVar251._20_4_ = fVar227 + fVar428 * fVar443;
          auVar251._24_4_ = fVar230 + fVar442 * fVar444;
          auVar251._28_4_ = fVar234 + auVar38._28_4_ + fStack_6a4;
          auVar90._4_4_ = (float)local_7e0._4_4_ * fVar455;
          auVar90._0_4_ = (float)local_7e0._0_4_ * fVar446;
          auVar90._8_4_ = fStack_7d8 * fVar457;
          auVar90._12_4_ = fStack_7d4 * fVar459;
          auVar90._16_4_ = fStack_7d0 * fVar461;
          auVar90._20_4_ = fStack_7cc * fVar463;
          auVar90._24_4_ = fStack_7c8 * fVar465;
          auVar90._28_4_ = fVar298;
          _local_a00 = vsubps_avx(auVar90,auVar251);
          auVar270._0_4_ = fVar190 + fVar253 * fVar299;
          auVar270._4_4_ = fVar215 + fVar255 * fVar399;
          auVar270._8_4_ = fVar218 + fVar276 * fVar402;
          auVar270._12_4_ = fVar222 + fVar295 * fVar348;
          auVar270._16_4_ = fVar225 + fVar390 * fVar429;
          auVar270._20_4_ = fVar228 + fVar408 * fVar443;
          auVar270._24_4_ = fVar231 + fVar440 * fVar444;
          auVar270._28_4_ = fVar235 + fVar298;
          auVar327._0_4_ = (float)local_800._0_4_ * fVar446;
          auVar327._4_4_ = (float)local_800._4_4_ * fVar455;
          auVar327._8_4_ = fStack_7f8 * fVar457;
          auVar327._12_4_ = fStack_7f4 * fVar459;
          auVar327._16_4_ = fStack_7f0 * fVar461;
          auVar327._20_4_ = fStack_7ec * fVar463;
          auVar327._24_4_ = fStack_7e8 * fVar465;
          auVar327._28_4_ = 0;
          auVar38 = vsubps_avx(auVar327,auVar270);
          auVar289._0_4_ = fVar191 + fVar188 * fVar299;
          auVar289._4_4_ = fVar216 + fVar256 * fVar399;
          auVar289._8_4_ = fVar219 + fVar277 * fVar402;
          auVar289._12_4_ = fVar223 + fVar296 * fVar348;
          auVar289._16_4_ = fVar226 + fVar393 * fVar429;
          auVar289._20_4_ = fVar229 + fVar420 * fVar443;
          auVar289._24_4_ = fVar232 + fVar441 * fVar444;
          auVar289._28_4_ = fVar236 + auVar37._28_4_;
          auVar91._4_4_ = (float)local_880._4_4_ * fVar455;
          auVar91._0_4_ = (float)local_880._0_4_ * fVar446;
          auVar91._8_4_ = fStack_878 * fVar457;
          auVar91._12_4_ = fStack_874 * fVar459;
          auVar91._16_4_ = fStack_870 * fVar461;
          auVar91._20_4_ = fStack_86c * fVar463;
          auVar91._24_4_ = fStack_868 * fVar465;
          auVar91._28_4_ = 0;
          local_940 = vsubps_avx(auVar91,auVar289);
          fVar220 = fVar220 * (fVar152 * local_540 + (float)local_6c0._0_4_);
          fVar275 = fVar275 * (fVar192 * fStack_53c + (float)local_6c0._4_4_);
          fVar294 = fVar294 * (fVar254 * fStack_538 + fStack_6b8);
          fVar381 = fVar381 * (fVar258 * fStack_534 + fStack_6b4);
          fVar405 = fVar405 * (fVar274 * fStack_530 + fStack_6b0);
          fVar439 = fVar439 * (fVar279 * fStack_52c + fStack_6ac);
          fVar445 = fVar445 * (fVar280 * fStack_528 + fStack_6a8);
          auVar328._0_4_ = fVar189 + fVar233 * fVar220;
          auVar328._4_4_ = fVar214 + fVar257 * fVar275;
          auVar328._8_4_ = fVar217 + fVar278 * fVar294;
          auVar328._12_4_ = fVar221 + fVar297 * fVar381;
          auVar328._16_4_ = fVar224 + fVar396 * fVar405;
          auVar328._20_4_ = fVar227 + fVar428 * fVar439;
          auVar328._24_4_ = fVar230 + fVar442 * fVar445;
          auVar328._28_4_ = fVar234 + 0.0;
          auVar92._4_4_ = (float)local_7e0._4_4_ * fVar192;
          auVar92._0_4_ = (float)local_7e0._0_4_ * fVar152;
          auVar92._8_4_ = fStack_7d8 * fVar254;
          auVar92._12_4_ = fStack_7d4 * fVar258;
          auVar92._16_4_ = fStack_7d0 * fVar274;
          auVar92._20_4_ = fStack_7cc * fVar279;
          auVar92._24_4_ = fStack_7c8 * fVar280;
          auVar92._28_4_ = fStack_7c4;
          _local_8a0 = vsubps_avx(auVar92,auVar328);
          auVar329._0_4_ = fVar190 + fVar253 * fVar220;
          auVar329._4_4_ = fVar215 + fVar255 * fVar275;
          auVar329._8_4_ = fVar218 + fVar276 * fVar294;
          auVar329._12_4_ = fVar222 + fVar295 * fVar381;
          auVar329._16_4_ = fVar225 + fVar390 * fVar405;
          auVar329._20_4_ = fVar228 + fVar408 * fVar439;
          auVar329._24_4_ = fVar231 + fVar440 * fVar445;
          auVar329._28_4_ = fVar235 + local_8a0._28_4_;
          auVar93._4_4_ = (float)local_800._4_4_ * fVar192;
          auVar93._0_4_ = (float)local_800._0_4_ * fVar152;
          auVar93._8_4_ = fStack_7f8 * fVar254;
          auVar93._12_4_ = fStack_7f4 * fVar258;
          auVar93._16_4_ = fStack_7f0 * fVar274;
          auVar93._20_4_ = fStack_7ec * fVar279;
          auVar93._24_4_ = fStack_7e8 * fVar280;
          auVar93._28_4_ = fStack_7c4;
          _local_8c0 = vsubps_avx(auVar93,auVar329);
          auVar290._0_4_ = fVar191 + fVar188 * fVar220;
          auVar290._4_4_ = fVar216 + fVar256 * fVar275;
          auVar290._8_4_ = fVar219 + fVar277 * fVar294;
          auVar290._12_4_ = fVar223 + fVar296 * fVar381;
          auVar290._16_4_ = fVar226 + fVar393 * fVar405;
          auVar290._20_4_ = fVar229 + fVar420 * fVar439;
          auVar290._24_4_ = fVar232 + fVar441 * fVar445;
          auVar290._28_4_ = fVar236 + local_940._28_4_ + fStack_6a4;
          auVar94._4_4_ = (float)local_880._4_4_ * fVar192;
          auVar94._0_4_ = (float)local_880._0_4_ * fVar152;
          auVar94._8_4_ = fStack_878 * fVar254;
          auVar94._12_4_ = fStack_874 * fVar258;
          auVar94._16_4_ = fStack_870 * fVar274;
          auVar94._20_4_ = fStack_86c * fVar279;
          auVar94._24_4_ = fStack_868 * fVar280;
          auVar94._28_4_ = local_8c0._28_4_;
          _local_8e0 = vsubps_avx(auVar94,auVar290);
          auVar37 = vcmpps_avx(auVar36,_DAT_02020f00,5);
          auVar208._8_4_ = 0x7f800000;
          auVar208._0_8_ = 0x7f8000007f800000;
          auVar208._12_4_ = 0x7f800000;
          auVar208._16_4_ = 0x7f800000;
          auVar208._20_4_ = 0x7f800000;
          auVar208._24_4_ = 0x7f800000;
          auVar208._28_4_ = 0x7f800000;
          auVar207 = vblendvps_avx(auVar208,auVar88,auVar37);
          auVar359._8_4_ = 0x7fffffff;
          auVar359._0_8_ = 0x7fffffff7fffffff;
          auVar359._12_4_ = 0x7fffffff;
          auVar359._16_4_ = 0x7fffffff;
          auVar359._20_4_ = 0x7fffffff;
          auVar359._24_4_ = 0x7fffffff;
          auVar359._28_4_ = 0x7fffffff;
          auVar36 = vandps_avx(auVar359,local_2e0);
          auVar36 = vmaxps_avx(local_500,auVar36);
          auVar415._8_4_ = 0x36000000;
          auVar415._0_8_ = 0x3600000036000000;
          auVar415._12_4_ = 0x36000000;
          auVar415._16_4_ = 0x36000000;
          auVar415._20_4_ = 0x36000000;
          auVar415._24_4_ = 0x36000000;
          auVar415._28_4_ = 0x36000000;
          auVar95._4_4_ = auVar36._4_4_ * 1.9073486e-06;
          auVar95._0_4_ = auVar36._0_4_ * 1.9073486e-06;
          auVar95._8_4_ = auVar36._8_4_ * 1.9073486e-06;
          auVar95._12_4_ = auVar36._12_4_ * 1.9073486e-06;
          auVar95._16_4_ = auVar36._16_4_ * 1.9073486e-06;
          auVar95._20_4_ = auVar36._20_4_ * 1.9073486e-06;
          auVar95._24_4_ = auVar36._24_4_ * 1.9073486e-06;
          auVar95._28_4_ = auVar36._28_4_;
          auVar36 = vandps_avx(auVar359,auVar42);
          auVar36 = vcmpps_avx(auVar36,auVar95,1);
          auVar291._8_4_ = 0xff800000;
          auVar291._0_8_ = 0xff800000ff800000;
          auVar291._12_4_ = 0xff800000;
          auVar291._16_4_ = 0xff800000;
          auVar291._20_4_ = 0xff800000;
          auVar291._24_4_ = 0xff800000;
          auVar291._28_4_ = 0xff800000;
          auVar287 = vblendvps_avx(auVar291,auVar89,auVar37);
          auVar39 = auVar37 & auVar36;
          if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar39 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar39 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar39 >> 0x7f,0) != '\0') ||
                (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar39 >> 0xbf,0) != '\0') ||
              (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar39[0x1f] < '\0') {
            auVar34 = vandps_avx(auVar36,auVar37);
            auVar157 = vpackssdw_avx(auVar34._0_16_,auVar34._16_16_);
            auVar97 = ZEXT412(0);
            auVar453 = ZEXT1264(auVar97) << 0x20;
            auVar415 = vcmpps_avx(auVar35,ZEXT1232(auVar97) << 0x20,2);
            auVar468._8_4_ = 0xff800000;
            auVar468._0_8_ = 0xff800000ff800000;
            auVar468._12_4_ = 0xff800000;
            auVar468._16_4_ = 0xff800000;
            auVar468._20_4_ = 0xff800000;
            auVar468._24_4_ = 0xff800000;
            auVar468._28_4_ = 0xff800000;
            auVar469._8_4_ = 0x7f800000;
            auVar469._0_8_ = 0x7f8000007f800000;
            auVar469._12_4_ = 0x7f800000;
            auVar469._16_4_ = 0x7f800000;
            auVar469._20_4_ = 0x7f800000;
            auVar469._24_4_ = 0x7f800000;
            auVar469._28_4_ = 0x7f800000;
            auVar146 = vblendvps_avx(auVar469,auVar468,auVar415);
            auVar240 = vpmovsxwd_avx(auVar157);
            auVar438 = ZEXT1664(auVar240);
            auVar157 = vpunpckhwd_avx(auVar157,auVar157);
            auVar360._16_16_ = auVar157;
            auVar360._0_16_ = auVar240;
            auVar207 = vblendvps_avx(auVar207,auVar146,auVar360);
            auVar146 = vblendvps_avx(auVar468,auVar469,auVar415);
            auVar287 = vblendvps_avx(auVar287,auVar146,auVar360);
            auVar35 = vcmpps_avx(ZEXT1232(auVar97) << 0x20,ZEXT1232(auVar97) << 0x20,0xf);
            auVar187._0_4_ = auVar35._0_4_ ^ auVar34._0_4_;
            auVar187._4_4_ = auVar35._4_4_ ^ auVar34._4_4_;
            auVar187._8_4_ = auVar35._8_4_ ^ auVar34._8_4_;
            auVar187._12_4_ = auVar35._12_4_ ^ auVar34._12_4_;
            auVar187._16_4_ = auVar35._16_4_ ^ auVar34._16_4_;
            auVar187._20_4_ = auVar35._20_4_ ^ auVar34._20_4_;
            auVar187._24_4_ = auVar35._24_4_ ^ auVar34._24_4_;
            auVar187._28_4_ = auVar35._28_4_ ^ auVar34._28_4_;
            auVar34 = vorps_avx(auVar415,auVar187);
            auVar34 = vandps_avx(auVar37,auVar34);
          }
          auVar427 = ZEXT3264(auVar146);
          auVar416 = ZEXT3264(auVar415);
          auVar245 = local_a00._0_28_;
          auVar268 = auVar38._0_28_;
          auVar384 = local_940._0_28_;
        }
        auVar361 = ZEXT3264(local_520);
        _local_380 = local_520;
        local_360 = vminps_avx(local_320,auVar207);
        _local_340 = vmaxps_avx(local_520,auVar287);
        auVar146 = vcmpps_avx(local_520,local_360,2);
        local_5a0 = vandps_avx(auVar146,auVar138);
        local_660 = local_5a0;
        auVar146 = vcmpps_avx(_local_340,local_320,2);
        local_680 = vandps_avx(auVar146,auVar138);
        auVar138 = vorps_avx(local_680,local_5a0);
        if ((((((((auVar138 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar138 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar138 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar138 >> 0x7f,0) != '\0') ||
              (auVar138 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar138 >> 0xbf,0) != '\0') ||
            (auVar138 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar138[0x1f] < '\0') {
          _local_6c0 = local_680;
          _local_5e0 = _local_340;
          local_840 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x20),ZEXT1632(ZEXT816(0) << 0x20),0xf);
          local_620._0_4_ = auVar34._0_4_ ^ local_840._0_4_;
          local_620._4_4_ = auVar34._4_4_ ^ local_840._4_4_;
          local_620._8_4_ = auVar34._8_4_ ^ local_840._8_4_;
          local_620._12_4_ = auVar34._12_4_ ^ local_840._12_4_;
          local_620._16_4_ = auVar34._16_4_ ^ local_840._16_4_;
          local_620._20_4_ = auVar34._20_4_ ^ local_840._20_4_;
          local_620._24_4_ = auVar34._24_4_ ^ local_840._24_4_;
          local_620._28_4_ = (uint)auVar34._28_4_ ^ (uint)local_840._28_4_;
          auVar147._0_4_ =
               auVar245._0_4_ * (float)local_7e0._0_4_ +
               auVar268._0_4_ * (float)local_800._0_4_ + auVar384._0_4_ * (float)local_880._0_4_;
          auVar147._4_4_ =
               auVar245._4_4_ * (float)local_7e0._4_4_ +
               auVar268._4_4_ * (float)local_800._4_4_ + auVar384._4_4_ * (float)local_880._4_4_;
          auVar147._8_4_ =
               auVar245._8_4_ * fStack_7d8 +
               auVar268._8_4_ * fStack_7f8 + auVar384._8_4_ * fStack_878;
          auVar147._12_4_ =
               auVar245._12_4_ * fStack_7d4 +
               auVar268._12_4_ * fStack_7f4 + auVar384._12_4_ * fStack_874;
          auVar147._16_4_ =
               auVar245._16_4_ * fStack_7d0 +
               auVar268._16_4_ * fStack_7f0 + auVar384._16_4_ * fStack_870;
          auVar147._20_4_ =
               auVar245._20_4_ * fStack_7cc +
               auVar268._20_4_ * fStack_7ec + auVar384._20_4_ * fStack_86c;
          auVar147._24_4_ =
               auVar245._24_4_ * fStack_7c8 +
               auVar268._24_4_ * fStack_7e8 + auVar384._24_4_ * fStack_868;
          auVar147._28_4_ = local_840._28_4_ + auVar34._28_4_ + local_680._28_4_;
          auVar175._8_4_ = 0x7fffffff;
          auVar175._0_8_ = 0x7fffffff7fffffff;
          auVar175._12_4_ = 0x7fffffff;
          auVar175._16_4_ = 0x7fffffff;
          auVar175._20_4_ = 0x7fffffff;
          auVar175._24_4_ = 0x7fffffff;
          auVar175._28_4_ = 0x7fffffff;
          auVar138 = vandps_avx(auVar147,auVar175);
          auVar176._8_4_ = 0x3e99999a;
          auVar176._0_8_ = 0x3e99999a3e99999a;
          auVar176._12_4_ = 0x3e99999a;
          auVar176._16_4_ = 0x3e99999a;
          auVar176._20_4_ = 0x3e99999a;
          auVar176._24_4_ = 0x3e99999a;
          auVar176._28_4_ = 0x3e99999a;
          auVar138 = vcmpps_avx(auVar138,auVar176,1);
          auVar138 = vorps_avx(auVar138,local_620);
          auVar177._8_4_ = 3;
          auVar177._0_8_ = 0x300000003;
          auVar177._12_4_ = 3;
          auVar177._16_4_ = 3;
          auVar177._20_4_ = 3;
          auVar177._24_4_ = 3;
          auVar177._28_4_ = 3;
          auVar210._8_4_ = 2;
          auVar210._0_8_ = 0x200000002;
          auVar210._12_4_ = 2;
          auVar210._16_4_ = 2;
          auVar210._20_4_ = 2;
          auVar210._24_4_ = 2;
          auVar210._28_4_ = 2;
          auVar138 = vblendvps_avx(auVar210,auVar177,auVar138);
          local_600 = ZEXT432((uint)uVar124);
          auVar240 = vpshufd_avx(ZEXT416((uint)uVar124),0);
          auVar157 = vpcmpgtd_avx(auVar138._16_16_,auVar240);
          local_640._0_16_ = auVar240;
          auVar240 = vpcmpgtd_avx(auVar138._0_16_,auVar240);
          auVar178._16_16_ = auVar157;
          auVar178._0_16_ = auVar240;
          _local_5c0 = vblendps_avx(ZEXT1632(auVar240),auVar178,0xf0);
          local_660 = vandnps_avx(_local_5c0,local_5a0);
          auVar138 = local_5a0 & ~_local_5c0;
          auVar330 = ZEXT864(0) << 0x20;
          auVar273 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
          local_6a0._0_8_ = uVar124;
          if ((((((((auVar138 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar138 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar138 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar138 >> 0x7f,0) != '\0') ||
                (auVar138 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar138 >> 0xbf,0) != '\0') ||
              (auVar138 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar138[0x1f] < '\0') {
            local_820._4_4_ = local_520._4_4_ + (float)local_860._4_4_;
            local_820._0_4_ = local_520._0_4_ + (float)local_860._0_4_;
            fStack_818 = local_520._8_4_ + fStack_858;
            fStack_814 = local_520._12_4_ + fStack_854;
            fStack_810 = local_520._16_4_ + fStack_850;
            fStack_80c = local_520._20_4_ + fStack_84c;
            fStack_808 = local_520._24_4_ + fStack_848;
            fStack_804 = local_520._28_4_ + fStack_844;
            do {
              auVar260 = auVar273._0_16_;
              auVar179._8_4_ = 0x7f800000;
              auVar179._0_8_ = 0x7f8000007f800000;
              auVar179._12_4_ = 0x7f800000;
              auVar179._16_4_ = 0x7f800000;
              auVar179._20_4_ = 0x7f800000;
              auVar179._24_4_ = 0x7f800000;
              auVar179._28_4_ = 0x7f800000;
              auVar138 = vblendvps_avx(auVar179,auVar361._0_32_,local_660);
              auVar146 = vshufps_avx(auVar138,auVar138,0xb1);
              auVar146 = vminps_avx(auVar138,auVar146);
              auVar34 = vshufpd_avx(auVar146,auVar146,5);
              auVar146 = vminps_avx(auVar146,auVar34);
              auVar34 = vperm2f128_avx(auVar146,auVar146,1);
              auVar146 = vminps_avx(auVar146,auVar34);
              auVar146 = vcmpps_avx(auVar138,auVar146,0);
              auVar34 = local_660 & auVar146;
              auVar138 = local_660;
              if ((((((((auVar34 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar34 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar34 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar34 >> 0x7f,0) != '\0') ||
                    (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar34 >> 0xbf,0) != '\0') ||
                  (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar34[0x1f] < '\0') {
                auVar138 = vandps_avx(auVar146,local_660);
              }
              uVar121 = vmovmskps_avx(auVar138);
              uVar33 = 0;
              if (uVar121 != 0) {
                for (; (uVar121 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                }
              }
              uVar124 = (ulong)uVar33;
              *(undefined4 *)(local_660 + uVar124 * 4) = 0;
              fVar152 = local_560[uVar124];
              uVar33 = *(uint *)(local_380 + uVar124 * 4);
              fVar253 = local_b04;
              if ((float)local_960._0_4_ < 0.0) {
                fVar253 = sqrtf((float)local_960._0_4_);
                auVar260._8_4_ = 0x7fffffff;
                auVar260._0_8_ = 0x7fffffff7fffffff;
                auVar260._12_4_ = 0x7fffffff;
                auVar330 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              auVar438 = ZEXT464(uVar33);
              auVar427 = ZEXT464((uint)fVar152);
              auVar240 = vminps_avx(_local_a40,_local_a60);
              auVar157 = vmaxps_avx(_local_a40,_local_a60);
              auVar130 = vminps_avx(_local_a50,_local_a70);
              auVar158 = vminps_avx(auVar240,auVar130);
              auVar240 = vmaxps_avx(_local_a50,_local_a70);
              auVar130 = vmaxps_avx(auVar157,auVar240);
              auVar157 = vandps_avx(auVar158,auVar260);
              auVar240 = vandps_avx(auVar130,auVar260);
              auVar157 = vmaxps_avx(auVar157,auVar240);
              auVar240 = vmovshdup_avx(auVar157);
              auVar240 = vmaxss_avx(auVar240,auVar157);
              auVar157 = vshufpd_avx(auVar157,auVar157,1);
              auVar157 = vmaxss_avx(auVar157,auVar240);
              fVar152 = auVar157._0_4_ * 1.9073486e-06;
              local_7a0._0_4_ = fVar253 * 1.9073486e-06;
              local_7c0._0_16_ = vshufps_avx(auVar130,auVar130,0xff);
              lVar123 = 4;
              do {
                auVar157 = vshufps_avx(auVar438._0_16_,auVar438._0_16_,0);
                auVar129._0_4_ = auVar157._0_4_ * (float)local_950._0_4_ + 0.0;
                auVar129._4_4_ = auVar157._4_4_ * (float)local_950._4_4_ + 0.0;
                auVar129._8_4_ = auVar157._8_4_ * fStack_948 + 0.0;
                auVar129._12_4_ = auVar157._12_4_ * fStack_944 + 0.0;
                fVar192 = auVar427._0_4_;
                fVar233 = 1.0 - fVar192;
                fVar253 = fVar192 * fVar192;
                fVar188 = fVar192 * 3.0;
                local_ac0._0_4_ = fVar233 * fVar233;
                auVar157 = ZEXT416((uint)(fVar192 * fVar192 * -fVar233 * 0.5));
                auVar157 = vshufps_avx(auVar157,auVar157,0);
                auVar240 = ZEXT416((uint)((fVar233 * fVar233 * (fVar233 * 3.0 + -5.0) + 2.0) * 0.5))
                ;
                auVar240 = vshufps_avx(auVar240,auVar240,0);
                auVar130 = ZEXT416((uint)((fVar253 * (fVar188 + -5.0) + 2.0) * 0.5));
                auVar130 = vshufps_avx(auVar130,auVar130,0);
                auVar158 = ZEXT416((uint)(fVar233 * fVar233 * -fVar192 * 0.5));
                auVar158 = vshufps_avx(auVar158,auVar158,0);
                auVar195._0_4_ =
                     auVar158._0_4_ * (float)local_a40._0_4_ +
                     auVar130._0_4_ * (float)local_a60._0_4_ +
                     auVar240._0_4_ * (float)local_a50._0_4_ +
                     auVar157._0_4_ * (float)local_a70._0_4_;
                auVar195._4_4_ =
                     auVar158._4_4_ * (float)local_a40._4_4_ +
                     auVar130._4_4_ * (float)local_a60._4_4_ +
                     auVar240._4_4_ * (float)local_a50._4_4_ +
                     auVar157._4_4_ * (float)local_a70._4_4_;
                auVar195._8_4_ =
                     auVar158._8_4_ * fStack_a38 +
                     auVar130._8_4_ * fStack_a58 +
                     auVar240._8_4_ * fStack_a48 + auVar157._8_4_ * fStack_a68;
                auVar195._12_4_ =
                     auVar158._12_4_ * fStack_a34 +
                     auVar130._12_4_ * fStack_a54 +
                     auVar240._12_4_ * fStack_a44 + auVar157._12_4_ * fStack_a64;
                local_940._0_16_ = auVar195;
                auVar157 = vsubps_avx(auVar129,auVar195);
                _local_a00 = auVar157;
                auVar157 = vdpps_avx(auVar157,auVar157,0x7f);
                local_aa0._0_16_ = ZEXT416((uint)(fVar192 * -9.0 + 4.0));
                fVar254 = auVar157._0_4_;
                local_c00 = auVar438._0_4_;
                if (fVar254 < 0.0) {
                  local_ae0._0_4_ = fVar253;
                  local_b00._0_16_ = ZEXT416((uint)fVar233);
                  local_980._0_4_ = fVar188;
                  local_9a0._0_4_ = fVar192 * 9.0;
                  local_9c0._0_4_ = fVar233 * -2.0;
                  fVar220 = sqrtf(fVar254);
                  auVar330 = ZEXT1664(ZEXT816(0) << 0x40);
                  fVar257 = (float)local_9a0._0_4_;
                  fVar255 = (float)local_9c0._0_4_;
                  fVar253 = (float)local_ae0._0_4_;
                  fVar256 = (float)local_980._0_4_;
                  fVar233 = (float)local_b00._0_4_;
                }
                else {
                  auVar240 = vsqrtss_avx(auVar157,auVar157);
                  fVar220 = auVar240._0_4_;
                  fVar257 = fVar192 * 9.0;
                  fVar255 = fVar233 * -2.0;
                  fVar256 = fVar188;
                }
                auVar240 = ZEXT416((uint)((fVar253 + fVar255 * fVar192) * 0.5));
                auVar240 = vshufps_avx(auVar240,auVar240,0);
                auVar130 = ZEXT416((uint)(((fVar233 + fVar233) * (fVar256 + 2.0) +
                                          fVar233 * fVar233 * -3.0) * 0.5));
                auVar130 = vshufps_avx(auVar130,auVar130,0);
                auVar158 = ZEXT416((uint)(((fVar192 + fVar192) * (fVar188 + -5.0) +
                                          fVar192 * fVar256) * 0.5));
                auVar158 = vshufps_avx(auVar158,auVar158,0);
                auVar159 = ZEXT416((uint)((fVar192 * (fVar233 + fVar233) - (float)local_ac0._0_4_) *
                                         0.5));
                auVar159 = vshufps_avx(auVar159,auVar159,0);
                auVar447._0_4_ =
                     (float)local_a40._0_4_ * auVar159._0_4_ +
                     (float)local_a60._0_4_ * auVar158._0_4_ +
                     (float)local_a70._0_4_ * auVar240._0_4_ +
                     (float)local_a50._0_4_ * auVar130._0_4_;
                auVar447._4_4_ =
                     (float)local_a40._4_4_ * auVar159._4_4_ +
                     (float)local_a60._4_4_ * auVar158._4_4_ +
                     (float)local_a70._4_4_ * auVar240._4_4_ +
                     (float)local_a50._4_4_ * auVar130._4_4_;
                auVar447._8_4_ =
                     fStack_a38 * auVar159._8_4_ +
                     fStack_a58 * auVar158._8_4_ +
                     fStack_a68 * auVar240._8_4_ + fStack_a48 * auVar130._8_4_;
                auVar447._12_4_ =
                     fStack_a34 * auVar159._12_4_ +
                     fStack_a54 * auVar158._12_4_ +
                     fStack_a64 * auVar240._12_4_ + fStack_a44 * auVar130._12_4_;
                auVar159 = vpermilps_avx(ZEXT416((uint)(fVar188 + -1.0)),0);
                auVar10 = vpermilps_avx(local_aa0._0_16_,0);
                auVar240 = vshufps_avx(ZEXT416((uint)(fVar257 + -5.0)),
                                       ZEXT416((uint)(fVar257 + -5.0)),0);
                auVar130 = ZEXT416((uint)(fVar192 * -3.0 + 2.0));
                auVar158 = vshufps_avx(auVar130,auVar130,0);
                auVar130 = vdpps_avx(auVar447,auVar447,0x7f);
                auVar160._0_4_ =
                     (float)local_a40._0_4_ * auVar158._0_4_ +
                     (float)local_a60._0_4_ * auVar240._0_4_ +
                     (float)local_a50._0_4_ * auVar10._0_4_ +
                     (float)local_a70._0_4_ * auVar159._0_4_;
                auVar160._4_4_ =
                     (float)local_a40._4_4_ * auVar158._4_4_ +
                     (float)local_a60._4_4_ * auVar240._4_4_ +
                     (float)local_a50._4_4_ * auVar10._4_4_ +
                     (float)local_a70._4_4_ * auVar159._4_4_;
                auVar160._8_4_ =
                     fStack_a38 * auVar158._8_4_ +
                     fStack_a58 * auVar240._8_4_ +
                     fStack_a48 * auVar10._8_4_ + fStack_a68 * auVar159._8_4_;
                auVar160._12_4_ =
                     fStack_a34 * auVar158._12_4_ +
                     fStack_a54 * auVar240._12_4_ +
                     fStack_a44 * auVar10._12_4_ + fStack_a64 * auVar159._12_4_;
                auVar240 = vblendps_avx(auVar130,_DAT_01feba10,0xe);
                auVar158 = vrsqrtss_avx(auVar240,auVar240);
                fVar188 = auVar158._0_4_;
                fVar253 = auVar130._0_4_;
                auVar158 = vdpps_avx(auVar447,auVar160,0x7f);
                auVar159 = vshufps_avx(auVar130,auVar130,0);
                auVar161._0_4_ = auVar160._0_4_ * auVar159._0_4_;
                auVar161._4_4_ = auVar160._4_4_ * auVar159._4_4_;
                auVar161._8_4_ = auVar160._8_4_ * auVar159._8_4_;
                auVar161._12_4_ = auVar160._12_4_ * auVar159._12_4_;
                auVar158 = vshufps_avx(auVar158,auVar158,0);
                auVar261._0_4_ = auVar447._0_4_ * auVar158._0_4_;
                auVar261._4_4_ = auVar447._4_4_ * auVar158._4_4_;
                auVar261._8_4_ = auVar447._8_4_ * auVar158._8_4_;
                auVar261._12_4_ = auVar447._12_4_ * auVar158._12_4_;
                auVar10 = vsubps_avx(auVar161,auVar261);
                auVar158 = vrcpss_avx(auVar240,auVar240);
                auVar240 = vmaxss_avx(ZEXT416((uint)fVar152),
                                      ZEXT416((uint)(local_c00 * (float)local_7a0._0_4_)));
                auVar416 = ZEXT1664(auVar240);
                auVar158 = ZEXT416((uint)(auVar158._0_4_ * (2.0 - fVar253 * auVar158._0_4_)));
                auVar158 = vshufps_avx(auVar158,auVar158,0);
                uVar124 = CONCAT44(auVar447._4_4_,auVar447._0_4_);
                auVar282._0_8_ = uVar124 ^ 0x8000000080000000;
                auVar282._8_4_ = -auVar447._8_4_;
                auVar282._12_4_ = -auVar447._12_4_;
                auVar159 = ZEXT416((uint)(fVar188 * 1.5 +
                                         fVar253 * -0.5 * fVar188 * fVar188 * fVar188));
                auVar159 = vshufps_avx(auVar159,auVar159,0);
                auVar241._0_4_ = auVar159._0_4_ * auVar10._0_4_ * auVar158._0_4_;
                auVar241._4_4_ = auVar159._4_4_ * auVar10._4_4_ * auVar158._4_4_;
                auVar241._8_4_ = auVar159._8_4_ * auVar10._8_4_ * auVar158._8_4_;
                auVar241._12_4_ = auVar159._12_4_ * auVar10._12_4_ * auVar158._12_4_;
                auVar303._0_4_ = auVar447._0_4_ * auVar159._0_4_;
                auVar303._4_4_ = auVar447._4_4_ * auVar159._4_4_;
                auVar303._8_4_ = auVar447._8_4_ * auVar159._8_4_;
                auVar303._12_4_ = auVar447._12_4_ * auVar159._12_4_;
                local_aa0._0_4_ = auVar240._0_4_;
                if (fVar253 < 0.0) {
                  local_ac0._0_16_ = auVar282;
                  local_ae0._0_16_ = auVar303;
                  local_b00._0_16_ = auVar241;
                  fVar253 = sqrtf(fVar253);
                  auVar416 = ZEXT464((uint)local_aa0._0_4_);
                  auVar330 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar241 = local_b00._0_16_;
                  auVar282 = local_ac0._0_16_;
                  auVar303 = local_ae0._0_16_;
                }
                else {
                  auVar240 = vsqrtss_avx(auVar130,auVar130);
                  fVar253 = auVar240._0_4_;
                }
                auVar240 = vdpps_avx(_local_a00,auVar303,0x7f);
                fVar253 = (fVar152 / fVar253) * (fVar220 + 1.0) + auVar416._0_4_ + fVar220 * fVar152
                ;
                auVar130 = vdpps_avx(auVar282,auVar303,0x7f);
                auVar158 = vdpps_avx(_local_a00,auVar241,0x7f);
                auVar159 = vdpps_avx(_local_950,auVar303,0x7f);
                auVar10 = vdpps_avx(_local_a00,auVar282,0x7f);
                fVar188 = auVar130._0_4_ + auVar158._0_4_;
                fVar233 = auVar240._0_4_;
                auVar131._0_4_ = fVar233 * fVar233;
                auVar131._4_4_ = auVar240._4_4_ * auVar240._4_4_;
                auVar131._8_4_ = auVar240._8_4_ * auVar240._8_4_;
                auVar131._12_4_ = auVar240._12_4_ * auVar240._12_4_;
                auVar158 = vsubps_avx(auVar157,auVar131);
                auVar130 = vdpps_avx(_local_a00,_local_950,0x7f);
                fVar220 = auVar10._0_4_ - fVar233 * fVar188;
                fVar255 = auVar130._0_4_ - fVar233 * auVar159._0_4_;
                auVar130 = vrsqrtss_avx(auVar158,auVar158);
                fVar256 = auVar158._0_4_;
                fVar233 = auVar130._0_4_;
                fVar233 = fVar233 * 1.5 + fVar256 * -0.5 * fVar233 * fVar233 * fVar233;
                if (fVar256 < 0.0) {
                  local_ac0._0_4_ = fVar253;
                  local_ae0._0_16_ = ZEXT416((uint)fVar188);
                  local_b00._0_16_ = auVar159;
                  local_980._0_4_ = fVar220;
                  local_9a0._0_4_ = fVar255;
                  local_9c0._0_4_ = fVar233;
                  fVar256 = sqrtf(fVar256);
                  auVar416 = ZEXT464((uint)local_aa0._0_4_);
                  auVar330 = ZEXT1664(ZEXT816(0) << 0x40);
                  fVar233 = (float)local_9c0._0_4_;
                  fVar220 = (float)local_980._0_4_;
                  fVar255 = (float)local_9a0._0_4_;
                  auVar159 = local_b00._0_16_;
                  fVar253 = (float)local_ac0._0_4_;
                  auVar130 = local_ae0._0_16_;
                }
                else {
                  auVar130 = vsqrtss_avx(auVar158,auVar158);
                  fVar256 = auVar130._0_4_;
                  auVar130 = ZEXT416((uint)fVar188);
                }
                auVar453 = ZEXT1664(auVar240);
                auVar162 = vpermilps_avx(local_940._0_16_,0xff);
                auVar11 = vshufps_avx(auVar447,auVar447,0xff);
                fVar188 = fVar220 * fVar233 - auVar11._0_4_;
                auVar262._0_8_ = auVar159._0_8_ ^ 0x8000000080000000;
                auVar262._8_4_ = auVar159._8_4_ ^ 0x80000000;
                auVar262._12_4_ = auVar159._12_4_ ^ 0x80000000;
                auVar283._0_4_ = -fVar188;
                auVar283._4_4_ = 0x80000000;
                auVar283._8_4_ = 0x80000000;
                auVar283._12_4_ = 0x80000000;
                auVar158 = vinsertps_avx(ZEXT416((uint)(fVar255 * fVar233)),auVar262,0x10);
                auVar10 = vmovsldup_avx(ZEXT416((uint)(auVar130._0_4_ * fVar255 * fVar233 -
                                                      auVar159._0_4_ * fVar188)));
                auVar158 = vdivps_avx(auVar158,auVar10);
                auVar162 = ZEXT416((uint)(fVar256 - auVar162._0_4_));
                auVar159 = vinsertps_avx(auVar240,auVar162,0x10);
                auVar242._0_4_ = auVar159._0_4_ * auVar158._0_4_;
                auVar242._4_4_ = auVar159._4_4_ * auVar158._4_4_;
                auVar242._8_4_ = auVar159._8_4_ * auVar158._8_4_;
                auVar242._12_4_ = auVar159._12_4_ * auVar158._12_4_;
                auVar130 = vinsertps_avx(auVar283,auVar130,0x1c);
                auVar130 = vdivps_avx(auVar130,auVar10);
                auVar196._0_4_ = auVar159._0_4_ * auVar130._0_4_;
                auVar196._4_4_ = auVar159._4_4_ * auVar130._4_4_;
                auVar196._8_4_ = auVar159._8_4_ * auVar130._8_4_;
                auVar196._12_4_ = auVar159._12_4_ * auVar130._12_4_;
                auVar130 = vhaddps_avx(auVar242,auVar242);
                auVar158 = vhaddps_avx(auVar196,auVar196);
                fVar192 = fVar192 - auVar130._0_4_;
                local_c00 = local_c00 - auVar158._0_4_;
                auVar438 = ZEXT464((uint)local_c00);
                auVar263._8_4_ = 0x7fffffff;
                auVar263._0_8_ = 0x7fffffff7fffffff;
                auVar263._12_4_ = 0x7fffffff;
                auVar273 = ZEXT1664(auVar263);
                auVar130 = vandps_avx(auVar240,auVar263);
                if (fVar253 <= auVar130._0_4_) {
LAB_0127ee3a:
                  bVar96 = false;
                }
                else {
                  auVar130 = vandps_avx(auVar162,auVar263);
                  if ((float)local_7c0._0_4_ * 1.9073486e-06 + auVar416._0_4_ + fVar253 <=
                      auVar130._0_4_) goto LAB_0127ee3a;
                  local_c00 = local_c00 + (float)local_900._0_4_;
                  auVar438 = ZEXT464((uint)local_c00);
                  bVar96 = true;
                  if ((((fVar237 <= local_c00) &&
                       (fVar253 = *(float *)(ray + k * 4 + 0x80), local_c00 <= fVar253)) &&
                      (0.0 <= fVar192)) && (fVar192 <= 1.0)) {
                    auVar157 = vrsqrtss_avx(auVar157,auVar157);
                    fVar188 = auVar157._0_4_;
                    pGVar29 = (context->scene->geometries).items[uVar118].ptr;
                    if ((pGVar29->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      auVar157 = ZEXT416((uint)(fVar188 * 1.5 +
                                               fVar254 * -0.5 * fVar188 * fVar188 * fVar188));
                      auVar157 = vshufps_avx(auVar157,auVar157,0);
                      auVar163._0_4_ = auVar157._0_4_ * (float)local_a00._0_4_;
                      auVar163._4_4_ = auVar157._4_4_ * (float)local_a00._4_4_;
                      auVar163._8_4_ = auVar157._8_4_ * fStack_9f8;
                      auVar163._12_4_ = auVar157._12_4_ * fStack_9f4;
                      auVar132._0_4_ = auVar447._0_4_ + auVar11._0_4_ * auVar163._0_4_;
                      auVar132._4_4_ = auVar447._4_4_ + auVar11._4_4_ * auVar163._4_4_;
                      auVar132._8_4_ = auVar447._8_4_ + auVar11._8_4_ * auVar163._8_4_;
                      auVar132._12_4_ = auVar447._12_4_ + auVar11._12_4_ * auVar163._12_4_;
                      auVar157 = vshufps_avx(auVar163,auVar163,0xc9);
                      auVar130 = vshufps_avx(auVar447,auVar447,0xc9);
                      auVar164._0_4_ = auVar130._0_4_ * auVar163._0_4_;
                      auVar164._4_4_ = auVar130._4_4_ * auVar163._4_4_;
                      auVar164._8_4_ = auVar130._8_4_ * auVar163._8_4_;
                      auVar164._12_4_ = auVar130._12_4_ * auVar163._12_4_;
                      auVar197._0_4_ = auVar447._0_4_ * auVar157._0_4_;
                      auVar197._4_4_ = auVar447._4_4_ * auVar157._4_4_;
                      auVar197._8_4_ = auVar447._8_4_ * auVar157._8_4_;
                      auVar197._12_4_ = auVar447._12_4_ * auVar157._12_4_;
                      auVar158 = vsubps_avx(auVar197,auVar164);
                      auVar157 = vshufps_avx(auVar158,auVar158,0xc9);
                      auVar130 = vshufps_avx(auVar132,auVar132,0xc9);
                      auVar198._0_4_ = auVar130._0_4_ * auVar157._0_4_;
                      auVar198._4_4_ = auVar130._4_4_ * auVar157._4_4_;
                      auVar198._8_4_ = auVar130._8_4_ * auVar157._8_4_;
                      auVar198._12_4_ = auVar130._12_4_ * auVar157._12_4_;
                      auVar157 = vshufps_avx(auVar158,auVar158,0xd2);
                      auVar133._0_4_ = auVar132._0_4_ * auVar157._0_4_;
                      auVar133._4_4_ = auVar132._4_4_ * auVar157._4_4_;
                      auVar133._8_4_ = auVar132._8_4_ * auVar157._8_4_;
                      auVar133._12_4_ = auVar132._12_4_ * auVar157._12_4_;
                      auVar157 = vsubps_avx(auVar198,auVar133);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar29->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = local_c00;
                        uVar8 = vextractps_avx(auVar157,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar8;
                        uVar8 = vextractps_avx(auVar157,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar8;
                        *(int *)(ray + k * 4 + 0xe0) = auVar157._0_4_;
                        *(float *)(ray + k * 4 + 0xf0) = fVar192;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(int *)(ray + k * 4 + 0x110) = (int)local_9c8;
                        *(uint *)(ray + k * 4 + 0x120) = uVar118;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        auVar130 = vshufps_avx(ZEXT416((uint)fVar192),ZEXT416((uint)fVar192),0);
                        local_760 = (RTCHitN  [16])vshufps_avx(auVar157,auVar157,0x55);
                        auVar158 = vshufps_avx(auVar157,auVar157,0xaa);
                        local_740 = vshufps_avx(auVar157,auVar157,0);
                        auStack_750 = auVar158;
                        local_730 = auVar130;
                        local_720 = ZEXT816(0) << 0x20;
                        local_710 = local_780._0_8_;
                        uStack_708 = local_780._8_8_;
                        local_700 = local_770._0_8_;
                        uStack_6f8 = local_770._8_8_;
                        uVar33 = context->user->instID[0];
                        _local_6f0 = CONCAT44(uVar33,uVar33);
                        _uStack_6e8 = CONCAT44(uVar33,uVar33);
                        uVar33 = context->user->instPrimID[0];
                        _uStack_6e0 = CONCAT44(uVar33,uVar33);
                        _uStack_6d8 = CONCAT44(uVar33,uVar33);
                        *(float *)(ray + k * 4 + 0x80) = local_c00;
                        local_b20 = *local_9d0;
                        uStack_b18 = local_9d0[1];
                        local_a30.valid = (int *)&local_b20;
                        local_a30.geometryUserPtr = pGVar29->userPtr;
                        local_a30.context = context->user;
                        local_a30.hit = local_760;
                        local_a30.N = 4;
                        local_a30.ray = (RTCRayN *)ray;
                        if (pGVar29->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar416 = ZEXT1664(auVar416._0_16_);
                          auVar453 = ZEXT1664(auVar240);
                          (*pGVar29->intersectionFilterN)(&local_a30);
                          auVar273._8_56_ = extraout_var;
                          auVar273._0_8_ = extraout_XMM1_Qa;
                          auVar130 = auVar273._0_16_;
                        }
                        auVar110._8_8_ = uStack_b18;
                        auVar110._0_8_ = local_b20;
                        if (auVar110 == (undefined1  [16])0x0) {
                          auVar157 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar240 = vpcmpeqd_avx(auVar130,auVar130);
                          auVar157 = auVar157 ^ auVar240;
                          auVar330 = ZEXT864(0);
                          auVar273 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        else {
                          p_Var32 = context->args->filter;
                          auVar330 = ZEXT1664(ZEXT816(0));
                          auVar273 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          auVar240 = vpcmpeqd_avx(auVar158,auVar158);
                          if ((p_Var32 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar29->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar416 = ZEXT1664(auVar416._0_16_);
                            auVar453 = ZEXT1664(auVar453._0_16_);
                            (*p_Var32)(&local_a30);
                            auVar240 = vpcmpeqd_avx(auVar240,auVar240);
                            auVar273 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                            auVar330 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          auVar111._8_8_ = uStack_b18;
                          auVar111._0_8_ = local_b20;
                          auVar130 = vpcmpeqd_avx(auVar111,_DAT_01feba10);
                          auVar157 = auVar130 ^ auVar240;
                          if (auVar111 != (undefined1  [16])0x0) {
                            auVar130 = auVar130 ^ auVar240;
                            auVar240 = vmaskmovps_avx(auVar130,*(undefined1 (*) [16])local_a30.hit);
                            *(undefined1 (*) [16])(local_a30.ray + 0xc0) = auVar240;
                            auVar240 = vmaskmovps_avx(auVar130,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x10));
                            *(undefined1 (*) [16])(local_a30.ray + 0xd0) = auVar240;
                            auVar240 = vmaskmovps_avx(auVar130,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x20));
                            *(undefined1 (*) [16])(local_a30.ray + 0xe0) = auVar240;
                            auVar240 = vmaskmovps_avx(auVar130,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x30));
                            *(undefined1 (*) [16])(local_a30.ray + 0xf0) = auVar240;
                            auVar240 = vmaskmovps_avx(auVar130,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x40));
                            *(undefined1 (*) [16])(local_a30.ray + 0x100) = auVar240;
                            auVar240 = vmaskmovps_avx(auVar130,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x50));
                            *(undefined1 (*) [16])(local_a30.ray + 0x110) = auVar240;
                            auVar240 = vmaskmovps_avx(auVar130,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x60));
                            *(undefined1 (*) [16])(local_a30.ray + 0x120) = auVar240;
                            auVar240 = vmaskmovps_avx(auVar130,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x70));
                            *(undefined1 (*) [16])(local_a30.ray + 0x130) = auVar240;
                            auVar240 = vmaskmovps_avx(auVar130,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x80));
                            *(undefined1 (*) [16])(local_a30.ray + 0x140) = auVar240;
                          }
                        }
                        auVar438 = ZEXT464((uint)local_c00);
                        auVar165._8_8_ = 0x100000001;
                        auVar165._0_8_ = 0x100000001;
                        if ((auVar165 & auVar157) == (undefined1  [16])0x0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar253;
                        }
                      }
                    }
                  }
                }
                auVar138 = local_660;
                auVar427 = ZEXT464((uint)fVar192);
                bVar126 = lVar123 != 0;
                lVar123 = lVar123 + -1;
              } while ((!bVar96) && (bVar126));
              uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar148._4_4_ = uVar8;
              auVar148._0_4_ = uVar8;
              auVar148._8_4_ = uVar8;
              auVar148._12_4_ = uVar8;
              auVar148._16_4_ = uVar8;
              auVar148._20_4_ = uVar8;
              auVar148._24_4_ = uVar8;
              auVar148._28_4_ = uVar8;
              auVar146 = vcmpps_avx(_local_820,auVar148,2);
              local_660 = vandps_avx(auVar146,local_660);
              auVar138 = auVar138 & auVar146;
              auVar361 = ZEXT3264(local_520);
              uVar124 = local_6a0._0_8_;
            } while ((((((((auVar138 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar138 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar138 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar138 >> 0x7f,0) != '\0') ||
                       (auVar138 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar138 >> 0xbf,0) != '\0') ||
                     (auVar138 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar138[0x1f] < '\0');
          }
          auVar149._0_4_ =
               (float)local_8a0._0_4_ * (float)local_7e0._0_4_ +
               (float)local_8c0._0_4_ * (float)local_800._0_4_ +
               (float)local_8e0._0_4_ * (float)local_880._0_4_;
          auVar149._4_4_ =
               (float)local_8a0._4_4_ * (float)local_7e0._4_4_ +
               (float)local_8c0._4_4_ * (float)local_800._4_4_ +
               (float)local_8e0._4_4_ * (float)local_880._4_4_;
          auVar149._8_4_ =
               fStack_898 * fStack_7d8 + fStack_8b8 * fStack_7f8 + fStack_8d8 * fStack_878;
          auVar149._12_4_ =
               fStack_894 * fStack_7d4 + fStack_8b4 * fStack_7f4 + fStack_8d4 * fStack_874;
          auVar149._16_4_ =
               fStack_890 * fStack_7d0 + fStack_8b0 * fStack_7f0 + fStack_8d0 * fStack_870;
          auVar149._20_4_ =
               fStack_88c * fStack_7cc + fStack_8ac * fStack_7ec + fStack_8cc * fStack_86c;
          auVar149._24_4_ =
               fStack_888 * fStack_7c8 + fStack_8a8 * fStack_7e8 + fStack_8c8 * fStack_868;
          auVar149._28_4_ = fStack_884 + fStack_8a4 + fStack_8c4;
          auVar180._8_4_ = 0x7fffffff;
          auVar180._0_8_ = 0x7fffffff7fffffff;
          auVar180._12_4_ = 0x7fffffff;
          auVar180._16_4_ = 0x7fffffff;
          auVar180._20_4_ = 0x7fffffff;
          auVar180._24_4_ = 0x7fffffff;
          auVar180._28_4_ = 0x7fffffff;
          auVar138 = vandps_avx(auVar149,auVar180);
          auVar181._8_4_ = 0x3e99999a;
          auVar181._0_8_ = 0x3e99999a3e99999a;
          auVar181._12_4_ = 0x3e99999a;
          auVar181._16_4_ = 0x3e99999a;
          auVar181._20_4_ = 0x3e99999a;
          auVar181._24_4_ = 0x3e99999a;
          auVar181._28_4_ = 0x3e99999a;
          auVar138 = vcmpps_avx(auVar138,auVar181,1);
          auVar146 = vorps_avx(auVar138,local_620);
          auVar182._0_4_ = (float)local_860._0_4_ + (float)local_5e0._0_4_;
          auVar182._4_4_ = (float)local_860._4_4_ + (float)local_5e0._4_4_;
          auVar182._8_4_ = fStack_858 + fStack_5d8;
          auVar182._12_4_ = fStack_854 + fStack_5d4;
          auVar182._16_4_ = fStack_850 + fStack_5d0;
          auVar182._20_4_ = fStack_84c + fStack_5cc;
          auVar182._24_4_ = fStack_848 + fStack_5c8;
          auVar182._28_4_ = fStack_844 + fStack_5c4;
          uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar211._4_4_ = uVar8;
          auVar211._0_4_ = uVar8;
          auVar211._8_4_ = uVar8;
          auVar211._12_4_ = uVar8;
          auVar211._16_4_ = uVar8;
          auVar211._20_4_ = uVar8;
          auVar211._24_4_ = uVar8;
          auVar211._28_4_ = uVar8;
          auVar138 = vcmpps_avx(auVar182,auVar211,2);
          _local_8c0 = vandps_avx(auVar138,_local_6c0);
          auVar183._8_4_ = 3;
          auVar183._0_8_ = 0x300000003;
          auVar183._12_4_ = 3;
          auVar183._16_4_ = 3;
          auVar183._20_4_ = 3;
          auVar183._24_4_ = 3;
          auVar183._28_4_ = 3;
          auVar212._8_4_ = 2;
          auVar212._0_8_ = 0x200000002;
          auVar212._12_4_ = 2;
          auVar212._16_4_ = 2;
          auVar212._20_4_ = 2;
          auVar212._24_4_ = 2;
          auVar212._28_4_ = 2;
          auVar138 = vblendvps_avx(auVar212,auVar183,auVar146);
          auVar157 = vpcmpgtd_avx(auVar138._16_16_,local_640._0_16_);
          auVar240 = vpshufd_avx(local_600._0_16_,0);
          auVar240 = vpcmpgtd_avx(auVar138._0_16_,auVar240);
          auVar184._16_16_ = auVar157;
          auVar184._0_16_ = auVar240;
          _local_8e0 = vblendps_avx(ZEXT1632(auVar240),auVar184,0xf0);
          local_680 = vandnps_avx(_local_8e0,_local_8c0);
          auVar138 = _local_8c0 & ~_local_8e0;
          fVar454 = (float)local_860._0_4_;
          fVar456 = (float)local_860._4_4_;
          fVar300 = fStack_858;
          fVar311 = fStack_854;
          fVar312 = fStack_850;
          fVar313 = fStack_84c;
          fVar314 = fStack_848;
          fVar315 = fStack_844;
          if ((((((((auVar138 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar138 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar138 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar138 >> 0x7f,0) != '\0') ||
                (auVar138 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar138 >> 0xbf,0) != '\0') ||
              (auVar138 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar138[0x1f] < '\0') {
            _local_820 = _local_340;
            local_8a0._4_4_ = (float)local_860._4_4_ + (float)local_340._4_4_;
            local_8a0._0_4_ = (float)local_860._0_4_ + (float)local_340._0_4_;
            fStack_898 = fStack_858 + fStack_338;
            fStack_894 = fStack_854 + fStack_334;
            fStack_890 = fStack_850 + fStack_330;
            fStack_88c = fStack_84c + fStack_32c;
            fStack_888 = fStack_848 + fStack_328;
            fStack_884 = fStack_844 + fStack_324;
            do {
              auVar264 = auVar273._0_16_;
              auVar185._8_4_ = 0x7f800000;
              auVar185._0_8_ = 0x7f8000007f800000;
              auVar185._12_4_ = 0x7f800000;
              auVar185._16_4_ = 0x7f800000;
              auVar185._20_4_ = 0x7f800000;
              auVar185._24_4_ = 0x7f800000;
              auVar185._28_4_ = 0x7f800000;
              auVar138 = vblendvps_avx(auVar185,_local_820,local_680);
              auVar146 = vshufps_avx(auVar138,auVar138,0xb1);
              auVar146 = vminps_avx(auVar138,auVar146);
              auVar34 = vshufpd_avx(auVar146,auVar146,5);
              auVar146 = vminps_avx(auVar146,auVar34);
              auVar34 = vperm2f128_avx(auVar146,auVar146,1);
              auVar146 = vminps_avx(auVar146,auVar34);
              auVar146 = vcmpps_avx(auVar138,auVar146,0);
              auVar34 = local_680 & auVar146;
              auVar138 = local_680;
              if ((((((((auVar34 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar34 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar34 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar34 >> 0x7f,0) != '\0') ||
                    (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar34 >> 0xbf,0) != '\0') ||
                  (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar34[0x1f] < '\0') {
                auVar138 = vandps_avx(auVar146,local_680);
              }
              uVar121 = vmovmskps_avx(auVar138);
              uVar33 = 0;
              if (uVar121 != 0) {
                for (; (uVar121 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                }
              }
              uVar124 = (ulong)uVar33;
              *(undefined4 *)(local_680 + uVar124 * 4) = 0;
              fVar152 = local_580[uVar124];
              uVar33 = *(uint *)(local_320 + uVar124 * 4);
              fVar253 = local_b08;
              if ((float)local_960._0_4_ < 0.0) {
                fVar253 = sqrtf((float)local_960._0_4_);
                auVar264._8_4_ = 0x7fffffff;
                auVar264._0_8_ = 0x7fffffff7fffffff;
                auVar264._12_4_ = 0x7fffffff;
                auVar330 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              auVar438 = ZEXT464(uVar33);
              auVar427 = ZEXT464((uint)fVar152);
              auVar240 = vminps_avx(_local_a40,_local_a60);
              auVar157 = vmaxps_avx(_local_a40,_local_a60);
              auVar130 = vminps_avx(_local_a50,_local_a70);
              auVar158 = vminps_avx(auVar240,auVar130);
              auVar240 = vmaxps_avx(_local_a50,_local_a70);
              auVar130 = vmaxps_avx(auVar157,auVar240);
              auVar157 = vandps_avx(auVar158,auVar264);
              auVar240 = vandps_avx(auVar130,auVar264);
              auVar157 = vmaxps_avx(auVar157,auVar240);
              auVar240 = vmovshdup_avx(auVar157);
              auVar240 = vmaxss_avx(auVar240,auVar157);
              auVar157 = vshufpd_avx(auVar157,auVar157,1);
              auVar157 = vmaxss_avx(auVar157,auVar240);
              fVar152 = auVar157._0_4_ * 1.9073486e-06;
              local_7a0._0_4_ = fVar253 * 1.9073486e-06;
              local_7c0._0_16_ = vshufps_avx(auVar130,auVar130,0xff);
              lVar123 = 4;
              do {
                auVar157 = vshufps_avx(auVar438._0_16_,auVar438._0_16_,0);
                auVar134._0_4_ = auVar157._0_4_ * (float)local_950._0_4_ + 0.0;
                auVar134._4_4_ = auVar157._4_4_ * (float)local_950._4_4_ + 0.0;
                auVar134._8_4_ = auVar157._8_4_ * fStack_948 + 0.0;
                auVar134._12_4_ = auVar157._12_4_ * fStack_944 + 0.0;
                fVar192 = auVar427._0_4_;
                fVar233 = 1.0 - fVar192;
                fVar253 = fVar192 * fVar192;
                fVar188 = fVar192 * 3.0;
                local_ac0._0_4_ = fVar233 * fVar233;
                auVar157 = ZEXT416((uint)(fVar192 * fVar192 * -fVar233 * 0.5));
                auVar157 = vshufps_avx(auVar157,auVar157,0);
                auVar240 = ZEXT416((uint)((fVar233 * fVar233 * (fVar233 * 3.0 + -5.0) + 2.0) * 0.5))
                ;
                auVar240 = vshufps_avx(auVar240,auVar240,0);
                auVar130 = ZEXT416((uint)((fVar253 * (fVar188 + -5.0) + 2.0) * 0.5));
                auVar130 = vshufps_avx(auVar130,auVar130,0);
                auVar158 = ZEXT416((uint)(fVar233 * fVar233 * -fVar192 * 0.5));
                auVar158 = vshufps_avx(auVar158,auVar158,0);
                auVar199._0_4_ =
                     auVar158._0_4_ * (float)local_a40._0_4_ +
                     auVar130._0_4_ * (float)local_a60._0_4_ +
                     auVar240._0_4_ * (float)local_a50._0_4_ +
                     auVar157._0_4_ * (float)local_a70._0_4_;
                auVar199._4_4_ =
                     auVar158._4_4_ * (float)local_a40._4_4_ +
                     auVar130._4_4_ * (float)local_a60._4_4_ +
                     auVar240._4_4_ * (float)local_a50._4_4_ +
                     auVar157._4_4_ * (float)local_a70._4_4_;
                auVar199._8_4_ =
                     auVar158._8_4_ * fStack_a38 +
                     auVar130._8_4_ * fStack_a58 +
                     auVar240._8_4_ * fStack_a48 + auVar157._8_4_ * fStack_a68;
                auVar199._12_4_ =
                     auVar158._12_4_ * fStack_a34 +
                     auVar130._12_4_ * fStack_a54 +
                     auVar240._12_4_ * fStack_a44 + auVar157._12_4_ * fStack_a64;
                local_940._0_16_ = auVar199;
                auVar157 = vsubps_avx(auVar134,auVar199);
                _local_a00 = auVar157;
                auVar157 = vdpps_avx(auVar157,auVar157,0x7f);
                local_aa0._0_16_ = ZEXT416((uint)(fVar192 * -9.0 + 4.0));
                fVar254 = auVar157._0_4_;
                local_c00 = auVar438._0_4_;
                if (fVar254 < 0.0) {
                  local_ae0._0_4_ = fVar253;
                  local_b00._0_16_ = ZEXT416((uint)fVar233);
                  local_980._0_4_ = fVar188;
                  local_9a0._0_4_ = fVar192 * 9.0;
                  local_9c0._0_4_ = fVar233 * -2.0;
                  fVar220 = sqrtf(fVar254);
                  auVar330 = ZEXT1664(ZEXT816(0) << 0x40);
                  fVar257 = (float)local_9a0._0_4_;
                  fVar255 = (float)local_9c0._0_4_;
                  fVar253 = (float)local_ae0._0_4_;
                  fVar256 = (float)local_980._0_4_;
                  fVar233 = (float)local_b00._0_4_;
                }
                else {
                  auVar240 = vsqrtss_avx(auVar157,auVar157);
                  fVar220 = auVar240._0_4_;
                  fVar257 = fVar192 * 9.0;
                  fVar255 = fVar233 * -2.0;
                  fVar256 = fVar188;
                }
                auVar240 = ZEXT416((uint)((fVar253 + fVar255 * fVar192) * 0.5));
                auVar240 = vshufps_avx(auVar240,auVar240,0);
                auVar130 = ZEXT416((uint)(((fVar233 + fVar233) * (fVar256 + 2.0) +
                                          fVar233 * fVar233 * -3.0) * 0.5));
                auVar130 = vshufps_avx(auVar130,auVar130,0);
                auVar158 = ZEXT416((uint)(((fVar192 + fVar192) * (fVar188 + -5.0) +
                                          fVar192 * fVar256) * 0.5));
                auVar158 = vshufps_avx(auVar158,auVar158,0);
                auVar159 = ZEXT416((uint)((fVar192 * (fVar233 + fVar233) - (float)local_ac0._0_4_) *
                                         0.5));
                auVar159 = vshufps_avx(auVar159,auVar159,0);
                auVar448._0_4_ =
                     (float)local_a40._0_4_ * auVar159._0_4_ +
                     (float)local_a60._0_4_ * auVar158._0_4_ +
                     (float)local_a70._0_4_ * auVar240._0_4_ +
                     (float)local_a50._0_4_ * auVar130._0_4_;
                auVar448._4_4_ =
                     (float)local_a40._4_4_ * auVar159._4_4_ +
                     (float)local_a60._4_4_ * auVar158._4_4_ +
                     (float)local_a70._4_4_ * auVar240._4_4_ +
                     (float)local_a50._4_4_ * auVar130._4_4_;
                auVar448._8_4_ =
                     fStack_a38 * auVar159._8_4_ +
                     fStack_a58 * auVar158._8_4_ +
                     fStack_a68 * auVar240._8_4_ + fStack_a48 * auVar130._8_4_;
                auVar448._12_4_ =
                     fStack_a34 * auVar159._12_4_ +
                     fStack_a54 * auVar158._12_4_ +
                     fStack_a64 * auVar240._12_4_ + fStack_a44 * auVar130._12_4_;
                auVar159 = vpermilps_avx(ZEXT416((uint)(fVar188 + -1.0)),0);
                auVar10 = vpermilps_avx(local_aa0._0_16_,0);
                auVar240 = vshufps_avx(ZEXT416((uint)(fVar257 + -5.0)),
                                       ZEXT416((uint)(fVar257 + -5.0)),0);
                auVar130 = ZEXT416((uint)(fVar192 * -3.0 + 2.0));
                auVar158 = vshufps_avx(auVar130,auVar130,0);
                auVar130 = vdpps_avx(auVar448,auVar448,0x7f);
                auVar166._0_4_ =
                     (float)local_a40._0_4_ * auVar158._0_4_ +
                     (float)local_a60._0_4_ * auVar240._0_4_ +
                     (float)local_a50._0_4_ * auVar10._0_4_ +
                     (float)local_a70._0_4_ * auVar159._0_4_;
                auVar166._4_4_ =
                     (float)local_a40._4_4_ * auVar158._4_4_ +
                     (float)local_a60._4_4_ * auVar240._4_4_ +
                     (float)local_a50._4_4_ * auVar10._4_4_ +
                     (float)local_a70._4_4_ * auVar159._4_4_;
                auVar166._8_4_ =
                     fStack_a38 * auVar158._8_4_ +
                     fStack_a58 * auVar240._8_4_ +
                     fStack_a48 * auVar10._8_4_ + fStack_a68 * auVar159._8_4_;
                auVar166._12_4_ =
                     fStack_a34 * auVar158._12_4_ +
                     fStack_a54 * auVar240._12_4_ +
                     fStack_a44 * auVar10._12_4_ + fStack_a64 * auVar159._12_4_;
                auVar240 = vblendps_avx(auVar130,_DAT_01feba10,0xe);
                auVar158 = vrsqrtss_avx(auVar240,auVar240);
                fVar188 = auVar158._0_4_;
                fVar253 = auVar130._0_4_;
                auVar158 = vdpps_avx(auVar448,auVar166,0x7f);
                auVar159 = vshufps_avx(auVar130,auVar130,0);
                auVar167._0_4_ = auVar166._0_4_ * auVar159._0_4_;
                auVar167._4_4_ = auVar166._4_4_ * auVar159._4_4_;
                auVar167._8_4_ = auVar166._8_4_ * auVar159._8_4_;
                auVar167._12_4_ = auVar166._12_4_ * auVar159._12_4_;
                auVar158 = vshufps_avx(auVar158,auVar158,0);
                auVar265._0_4_ = auVar448._0_4_ * auVar158._0_4_;
                auVar265._4_4_ = auVar448._4_4_ * auVar158._4_4_;
                auVar265._8_4_ = auVar448._8_4_ * auVar158._8_4_;
                auVar265._12_4_ = auVar448._12_4_ * auVar158._12_4_;
                auVar10 = vsubps_avx(auVar167,auVar265);
                auVar158 = vrcpss_avx(auVar240,auVar240);
                auVar240 = vmaxss_avx(ZEXT416((uint)fVar152),
                                      ZEXT416((uint)(local_c00 * (float)local_7a0._0_4_)));
                auVar416 = ZEXT1664(auVar240);
                auVar158 = ZEXT416((uint)(auVar158._0_4_ * (2.0 - fVar253 * auVar158._0_4_)));
                auVar158 = vshufps_avx(auVar158,auVar158,0);
                uVar124 = CONCAT44(auVar448._4_4_,auVar448._0_4_);
                auVar284._0_8_ = uVar124 ^ 0x8000000080000000;
                auVar284._8_4_ = -auVar448._8_4_;
                auVar284._12_4_ = -auVar448._12_4_;
                auVar159 = ZEXT416((uint)(fVar188 * 1.5 +
                                         fVar253 * -0.5 * fVar188 * fVar188 * fVar188));
                auVar159 = vshufps_avx(auVar159,auVar159,0);
                auVar243._0_4_ = auVar159._0_4_ * auVar10._0_4_ * auVar158._0_4_;
                auVar243._4_4_ = auVar159._4_4_ * auVar10._4_4_ * auVar158._4_4_;
                auVar243._8_4_ = auVar159._8_4_ * auVar10._8_4_ * auVar158._8_4_;
                auVar243._12_4_ = auVar159._12_4_ * auVar10._12_4_ * auVar158._12_4_;
                auVar304._0_4_ = auVar448._0_4_ * auVar159._0_4_;
                auVar304._4_4_ = auVar448._4_4_ * auVar159._4_4_;
                auVar304._8_4_ = auVar448._8_4_ * auVar159._8_4_;
                auVar304._12_4_ = auVar448._12_4_ * auVar159._12_4_;
                local_aa0._0_4_ = auVar240._0_4_;
                if (fVar253 < 0.0) {
                  local_ac0._0_16_ = auVar284;
                  local_ae0._0_16_ = auVar304;
                  local_b00._0_16_ = auVar243;
                  fVar253 = sqrtf(fVar253);
                  auVar416 = ZEXT464((uint)local_aa0._0_4_);
                  auVar330 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar243 = local_b00._0_16_;
                  auVar284 = local_ac0._0_16_;
                  auVar304 = local_ae0._0_16_;
                }
                else {
                  auVar240 = vsqrtss_avx(auVar130,auVar130);
                  fVar253 = auVar240._0_4_;
                }
                auVar240 = vdpps_avx(_local_a00,auVar304,0x7f);
                fVar253 = (fVar152 / fVar253) * (fVar220 + 1.0) + auVar416._0_4_ + fVar220 * fVar152
                ;
                auVar130 = vdpps_avx(auVar284,auVar304,0x7f);
                auVar158 = vdpps_avx(_local_a00,auVar243,0x7f);
                auVar159 = vdpps_avx(_local_950,auVar304,0x7f);
                auVar10 = vdpps_avx(_local_a00,auVar284,0x7f);
                fVar188 = auVar130._0_4_ + auVar158._0_4_;
                fVar233 = auVar240._0_4_;
                auVar135._0_4_ = fVar233 * fVar233;
                auVar135._4_4_ = auVar240._4_4_ * auVar240._4_4_;
                auVar135._8_4_ = auVar240._8_4_ * auVar240._8_4_;
                auVar135._12_4_ = auVar240._12_4_ * auVar240._12_4_;
                auVar158 = vsubps_avx(auVar157,auVar135);
                auVar130 = vdpps_avx(_local_a00,_local_950,0x7f);
                fVar220 = auVar10._0_4_ - fVar233 * fVar188;
                fVar255 = auVar130._0_4_ - fVar233 * auVar159._0_4_;
                auVar130 = vrsqrtss_avx(auVar158,auVar158);
                fVar256 = auVar158._0_4_;
                fVar233 = auVar130._0_4_;
                fVar233 = fVar233 * 1.5 + fVar256 * -0.5 * fVar233 * fVar233 * fVar233;
                if (fVar256 < 0.0) {
                  local_ac0._0_4_ = fVar253;
                  local_ae0._0_16_ = ZEXT416((uint)fVar188);
                  local_b00._0_16_ = auVar159;
                  local_980._0_4_ = fVar220;
                  local_9a0._0_4_ = fVar255;
                  local_9c0._0_4_ = fVar233;
                  fVar256 = sqrtf(fVar256);
                  auVar416 = ZEXT464((uint)local_aa0._0_4_);
                  auVar330 = ZEXT1664(ZEXT816(0) << 0x40);
                  fVar233 = (float)local_9c0._0_4_;
                  fVar220 = (float)local_980._0_4_;
                  fVar255 = (float)local_9a0._0_4_;
                  auVar159 = local_b00._0_16_;
                  fVar253 = (float)local_ac0._0_4_;
                  auVar130 = local_ae0._0_16_;
                }
                else {
                  auVar130 = vsqrtss_avx(auVar158,auVar158);
                  fVar256 = auVar130._0_4_;
                  auVar130 = ZEXT416((uint)fVar188);
                }
                auVar453 = ZEXT1664(auVar240);
                auVar361 = ZEXT1664(auVar157);
                auVar162 = vpermilps_avx(local_940._0_16_,0xff);
                auVar11 = vshufps_avx(auVar448,auVar448,0xff);
                fVar188 = fVar220 * fVar233 - auVar11._0_4_;
                auVar266._0_8_ = auVar159._0_8_ ^ 0x8000000080000000;
                auVar266._8_4_ = auVar159._8_4_ ^ 0x80000000;
                auVar266._12_4_ = auVar159._12_4_ ^ 0x80000000;
                auVar285._0_4_ = -fVar188;
                auVar285._4_4_ = 0x80000000;
                auVar285._8_4_ = 0x80000000;
                auVar285._12_4_ = 0x80000000;
                auVar158 = vinsertps_avx(ZEXT416((uint)(fVar255 * fVar233)),auVar266,0x10);
                auVar10 = vmovsldup_avx(ZEXT416((uint)(auVar130._0_4_ * fVar255 * fVar233 -
                                                      auVar159._0_4_ * fVar188)));
                auVar158 = vdivps_avx(auVar158,auVar10);
                auVar162 = ZEXT416((uint)(fVar256 - auVar162._0_4_));
                auVar159 = vinsertps_avx(auVar240,auVar162,0x10);
                auVar244._0_4_ = auVar159._0_4_ * auVar158._0_4_;
                auVar244._4_4_ = auVar159._4_4_ * auVar158._4_4_;
                auVar244._8_4_ = auVar159._8_4_ * auVar158._8_4_;
                auVar244._12_4_ = auVar159._12_4_ * auVar158._12_4_;
                auVar130 = vinsertps_avx(auVar285,auVar130,0x1c);
                auVar130 = vdivps_avx(auVar130,auVar10);
                auVar200._0_4_ = auVar159._0_4_ * auVar130._0_4_;
                auVar200._4_4_ = auVar159._4_4_ * auVar130._4_4_;
                auVar200._8_4_ = auVar159._8_4_ * auVar130._8_4_;
                auVar200._12_4_ = auVar159._12_4_ * auVar130._12_4_;
                auVar130 = vhaddps_avx(auVar244,auVar244);
                auVar158 = vhaddps_avx(auVar200,auVar200);
                fVar192 = fVar192 - auVar130._0_4_;
                local_c00 = local_c00 - auVar158._0_4_;
                auVar438 = ZEXT464((uint)local_c00);
                auVar267._8_4_ = 0x7fffffff;
                auVar267._0_8_ = 0x7fffffff7fffffff;
                auVar267._12_4_ = 0x7fffffff;
                auVar273 = ZEXT1664(auVar267);
                auVar130 = vandps_avx(auVar240,auVar267);
                if (fVar253 <= auVar130._0_4_) {
LAB_0127fb83:
                  bVar96 = false;
                }
                else {
                  auVar130 = vandps_avx(auVar162,auVar267);
                  if ((float)local_7c0._0_4_ * 1.9073486e-06 + auVar416._0_4_ + fVar253 <=
                      auVar130._0_4_) goto LAB_0127fb83;
                  local_c00 = local_c00 + (float)local_900._0_4_;
                  auVar438 = ZEXT464((uint)local_c00);
                  bVar96 = true;
                  if ((((fVar237 <= local_c00) &&
                       (fVar253 = *(float *)(ray + k * 4 + 0x80), local_c00 <= fVar253)) &&
                      (0.0 <= fVar192)) && (fVar192 <= 1.0)) {
                    auVar130 = vrsqrtss_avx(auVar157,auVar157);
                    fVar188 = auVar130._0_4_;
                    pGVar29 = (context->scene->geometries).items[uVar118].ptr;
                    if ((pGVar29->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      auVar130 = ZEXT416((uint)(fVar188 * 1.5 +
                                               fVar254 * -0.5 * fVar188 * fVar188 * fVar188));
                      auVar130 = vshufps_avx(auVar130,auVar130,0);
                      auVar168._0_4_ = auVar130._0_4_ * (float)local_a00._0_4_;
                      auVar168._4_4_ = auVar130._4_4_ * (float)local_a00._4_4_;
                      auVar168._8_4_ = auVar130._8_4_ * fStack_9f8;
                      auVar168._12_4_ = auVar130._12_4_ * fStack_9f4;
                      auVar136._0_4_ = auVar448._0_4_ + auVar11._0_4_ * auVar168._0_4_;
                      auVar136._4_4_ = auVar448._4_4_ + auVar11._4_4_ * auVar168._4_4_;
                      auVar136._8_4_ = auVar448._8_4_ + auVar11._8_4_ * auVar168._8_4_;
                      auVar136._12_4_ = auVar448._12_4_ + auVar11._12_4_ * auVar168._12_4_;
                      auVar130 = vshufps_avx(auVar168,auVar168,0xc9);
                      auVar158 = vshufps_avx(auVar448,auVar448,0xc9);
                      auVar169._0_4_ = auVar158._0_4_ * auVar168._0_4_;
                      auVar169._4_4_ = auVar158._4_4_ * auVar168._4_4_;
                      auVar169._8_4_ = auVar158._8_4_ * auVar168._8_4_;
                      auVar169._12_4_ = auVar158._12_4_ * auVar168._12_4_;
                      auVar201._0_4_ = auVar448._0_4_ * auVar130._0_4_;
                      auVar201._4_4_ = auVar448._4_4_ * auVar130._4_4_;
                      auVar201._8_4_ = auVar448._8_4_ * auVar130._8_4_;
                      auVar201._12_4_ = auVar448._12_4_ * auVar130._12_4_;
                      auVar159 = vsubps_avx(auVar201,auVar169);
                      auVar130 = vshufps_avx(auVar159,auVar159,0xc9);
                      auVar158 = vshufps_avx(auVar136,auVar136,0xc9);
                      auVar202._0_4_ = auVar158._0_4_ * auVar130._0_4_;
                      auVar202._4_4_ = auVar158._4_4_ * auVar130._4_4_;
                      auVar202._8_4_ = auVar158._8_4_ * auVar130._8_4_;
                      auVar202._12_4_ = auVar158._12_4_ * auVar130._12_4_;
                      auVar130 = vshufps_avx(auVar159,auVar159,0xd2);
                      auVar137._0_4_ = auVar136._0_4_ * auVar130._0_4_;
                      auVar137._4_4_ = auVar136._4_4_ * auVar130._4_4_;
                      auVar137._8_4_ = auVar136._8_4_ * auVar130._8_4_;
                      auVar137._12_4_ = auVar136._12_4_ * auVar130._12_4_;
                      auVar130 = vsubps_avx(auVar202,auVar137);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar29->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = local_c00;
                        uVar8 = vextractps_avx(auVar130,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar8;
                        uVar8 = vextractps_avx(auVar130,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar8;
                        *(int *)(ray + k * 4 + 0xe0) = auVar130._0_4_;
                        *(float *)(ray + k * 4 + 0xf0) = fVar192;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(int *)(ray + k * 4 + 0x110) = (int)local_9c8;
                        *(uint *)(ray + k * 4 + 0x120) = uVar118;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        auVar158 = vshufps_avx(ZEXT416((uint)fVar192),ZEXT416((uint)fVar192),0);
                        local_760 = (RTCHitN  [16])vshufps_avx(auVar130,auVar130,0x55);
                        auVar159 = vshufps_avx(auVar130,auVar130,0xaa);
                        local_740 = vshufps_avx(auVar130,auVar130,0);
                        auStack_750 = auVar159;
                        local_730 = auVar158;
                        local_720 = ZEXT816(0) << 0x20;
                        local_710 = local_780._0_8_;
                        uStack_708 = local_780._8_8_;
                        local_700 = local_770._0_8_;
                        uStack_6f8 = local_770._8_8_;
                        uVar33 = context->user->instID[0];
                        _local_6f0 = CONCAT44(uVar33,uVar33);
                        _uStack_6e8 = CONCAT44(uVar33,uVar33);
                        uVar33 = context->user->instPrimID[0];
                        _uStack_6e0 = CONCAT44(uVar33,uVar33);
                        _uStack_6d8 = CONCAT44(uVar33,uVar33);
                        *(float *)(ray + k * 4 + 0x80) = local_c00;
                        local_b20 = *local_9d0;
                        uStack_b18 = local_9d0[1];
                        local_a30.valid = (int *)&local_b20;
                        local_a30.geometryUserPtr = pGVar29->userPtr;
                        local_a30.context = context->user;
                        local_a30.hit = local_760;
                        local_a30.N = 4;
                        local_a30.ray = (RTCRayN *)ray;
                        if (pGVar29->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar361 = ZEXT1664(auVar157);
                          auVar416 = ZEXT1664(auVar416._0_16_);
                          auVar453 = ZEXT1664(auVar240);
                          (*pGVar29->intersectionFilterN)(&local_a30);
                          auVar427._8_56_ = extraout_var_00;
                          auVar427._0_8_ = extraout_XMM1_Qa_00;
                          auVar158 = auVar427._0_16_;
                        }
                        auVar112._8_8_ = uStack_b18;
                        auVar112._0_8_ = local_b20;
                        if (auVar112 == (undefined1  [16])0x0) {
                          auVar157 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar240 = vpcmpeqd_avx(auVar158,auVar158);
                          auVar157 = auVar157 ^ auVar240;
                          auVar330 = ZEXT864(0);
                          auVar273 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        else {
                          p_Var32 = context->args->filter;
                          auVar330 = ZEXT1664(ZEXT816(0));
                          auVar273 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          auVar240 = vpcmpeqd_avx(auVar159,auVar159);
                          if ((p_Var32 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar29->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar361 = ZEXT1664(auVar361._0_16_);
                            auVar416 = ZEXT1664(auVar416._0_16_);
                            auVar453 = ZEXT1664(auVar453._0_16_);
                            (*p_Var32)(&local_a30);
                            auVar240 = vpcmpeqd_avx(auVar240,auVar240);
                            auVar273 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                            auVar330 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          auVar113._8_8_ = uStack_b18;
                          auVar113._0_8_ = local_b20;
                          auVar130 = vpcmpeqd_avx(auVar113,_DAT_01feba10);
                          auVar157 = auVar130 ^ auVar240;
                          if (auVar113 != (undefined1  [16])0x0) {
                            auVar130 = auVar130 ^ auVar240;
                            auVar240 = vmaskmovps_avx(auVar130,*(undefined1 (*) [16])local_a30.hit);
                            *(undefined1 (*) [16])(local_a30.ray + 0xc0) = auVar240;
                            auVar240 = vmaskmovps_avx(auVar130,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x10));
                            *(undefined1 (*) [16])(local_a30.ray + 0xd0) = auVar240;
                            auVar240 = vmaskmovps_avx(auVar130,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x20));
                            *(undefined1 (*) [16])(local_a30.ray + 0xe0) = auVar240;
                            auVar240 = vmaskmovps_avx(auVar130,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x30));
                            *(undefined1 (*) [16])(local_a30.ray + 0xf0) = auVar240;
                            auVar240 = vmaskmovps_avx(auVar130,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x40));
                            *(undefined1 (*) [16])(local_a30.ray + 0x100) = auVar240;
                            auVar240 = vmaskmovps_avx(auVar130,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x50));
                            *(undefined1 (*) [16])(local_a30.ray + 0x110) = auVar240;
                            auVar240 = vmaskmovps_avx(auVar130,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x60));
                            *(undefined1 (*) [16])(local_a30.ray + 0x120) = auVar240;
                            auVar240 = vmaskmovps_avx(auVar130,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x70));
                            *(undefined1 (*) [16])(local_a30.ray + 0x130) = auVar240;
                            auVar240 = vmaskmovps_avx(auVar130,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x80));
                            *(undefined1 (*) [16])(local_a30.ray + 0x140) = auVar240;
                          }
                        }
                        auVar438 = ZEXT464((uint)local_c00);
                        auVar170._8_8_ = 0x100000001;
                        auVar170._0_8_ = 0x100000001;
                        if ((auVar170 & auVar157) == (undefined1  [16])0x0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar253;
                        }
                      }
                    }
                  }
                }
                auVar138 = local_680;
                auVar427 = ZEXT464((uint)fVar192);
                bVar126 = lVar123 != 0;
                lVar123 = lVar123 + -1;
              } while ((!bVar96) && (bVar126));
              uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar150._4_4_ = uVar8;
              auVar150._0_4_ = uVar8;
              auVar150._8_4_ = uVar8;
              auVar150._12_4_ = uVar8;
              auVar150._16_4_ = uVar8;
              auVar150._20_4_ = uVar8;
              auVar150._24_4_ = uVar8;
              auVar150._28_4_ = uVar8;
              auVar146 = vcmpps_avx(_local_8a0,auVar150,2);
              local_680 = vandps_avx(auVar146,local_680);
              auVar138 = auVar138 & auVar146;
              uVar124 = local_6a0._0_8_;
              fVar454 = (float)local_860._0_4_;
              fVar456 = (float)local_860._4_4_;
              fVar300 = fStack_858;
              fVar311 = fStack_854;
              fVar312 = fStack_850;
              fVar313 = fStack_84c;
              fVar314 = fStack_848;
              fVar315 = fStack_844;
            } while ((((((((auVar138 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar138 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar138 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar138 >> 0x7f,0) != '\0') ||
                       (auVar138 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar138 >> 0xbf,0) != '\0') ||
                     (auVar138 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar138[0x1f] < '\0');
          }
          auVar138 = vandps_avx(_local_5c0,local_5a0);
          auVar146 = vandps_avx(_local_8e0,_local_8c0);
          auVar213._0_4_ = fVar454 + local_380._0_4_;
          auVar213._4_4_ = fVar456 + local_380._4_4_;
          auVar213._8_4_ = fVar300 + local_380._8_4_;
          auVar213._12_4_ = fVar311 + local_380._12_4_;
          auVar213._16_4_ = fVar312 + local_380._16_4_;
          auVar213._20_4_ = fVar313 + local_380._20_4_;
          auVar213._24_4_ = fVar314 + local_380._24_4_;
          auVar213._28_4_ = fVar315 + local_380._28_4_;
          uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar272._4_4_ = uVar8;
          auVar272._0_4_ = uVar8;
          auVar272._8_4_ = uVar8;
          auVar272._12_4_ = uVar8;
          auVar272._16_4_ = uVar8;
          auVar272._20_4_ = uVar8;
          auVar272._24_4_ = uVar8;
          auVar272._28_4_ = uVar8;
          auVar34 = vcmpps_avx(auVar213,auVar272,2);
          auVar138 = vandps_avx(auVar34,auVar138);
          auVar292._0_4_ = fVar454 + local_340._0_4_;
          auVar292._4_4_ = fVar456 + local_340._4_4_;
          auVar292._8_4_ = fVar300 + local_340._8_4_;
          auVar292._12_4_ = fVar311 + local_340._12_4_;
          auVar292._16_4_ = fVar312 + local_340._16_4_;
          auVar292._20_4_ = fVar313 + local_340._20_4_;
          auVar292._24_4_ = fVar314 + local_340._24_4_;
          auVar292._28_4_ = fVar315 + local_340._28_4_;
          auVar34 = vcmpps_avx(auVar292,auVar272,2);
          auVar146 = vandps_avx(auVar34,auVar146);
          auVar146 = vorps_avx(auVar138,auVar146);
          if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar146 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar146 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar146 >> 0x7f,0) != '\0') ||
                (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar146 >> 0xbf,0) != '\0') ||
              (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar146[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar119 * 0x60) = auVar146;
            auVar138 = vblendvps_avx(_local_340,_local_380,auVar138);
            *(undefined1 (*) [32])(auStack_160 + uVar119 * 0x60) = auVar138;
            auVar115._8_8_ = uStack_908;
            auVar115._0_8_ = local_910;
            uVar9 = vmovlps_avx(auVar115);
            *(undefined8 *)(afStack_140 + uVar119 * 0x18) = uVar9;
            auStack_138[uVar119 * 0x18] = (int)uVar124 + 1;
            uVar119 = (ulong)((int)uVar119 + 1);
          }
          auVar273 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                         &
                                                  DAT_3f8000003f800000)))))));
          goto LAB_0127e300;
        }
        auVar271._8_4_ = 0x3f800000;
        auVar271._0_8_ = &DAT_3f8000003f800000;
        auVar271._12_4_ = 0x3f800000;
        auVar271._16_4_ = 0x3f800000;
        auVar271._20_4_ = 0x3f800000;
        auVar271._24_4_ = 0x3f800000;
        auVar271._28_4_ = 0x3f800000;
      }
      auVar273 = ZEXT3264(auVar271);
      auVar330 = ZEXT1664(ZEXT816(0) << 0x40);
    }
LAB_0127e300:
    do {
      if ((int)uVar119 == 0) {
        uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar151._4_4_ = uVar8;
        auVar151._0_4_ = uVar8;
        auVar151._8_4_ = uVar8;
        auVar151._12_4_ = uVar8;
        auVar151._16_4_ = uVar8;
        auVar151._20_4_ = uVar8;
        auVar151._24_4_ = uVar8;
        auVar151._28_4_ = uVar8;
        auVar138 = vcmpps_avx(local_2a0,auVar151,2);
        uVar118 = vmovmskps_avx(auVar138);
        uVar118 = (uint)local_8e8 - 1 & (uint)local_8e8 & uVar118;
        if (uVar118 == 0) {
          return;
        }
        goto LAB_0127d0d0;
      }
      uVar125 = (ulong)((int)uVar119 - 1);
      lVar123 = uVar125 * 0x60;
      auVar138 = *(undefined1 (*) [32])(auStack_160 + lVar123);
      auVar145._0_4_ = fVar454 + auVar138._0_4_;
      auVar145._4_4_ = fVar456 + auVar138._4_4_;
      auVar145._8_4_ = fVar300 + auVar138._8_4_;
      auVar145._12_4_ = fVar311 + auVar138._12_4_;
      auVar145._16_4_ = fVar312 + auVar138._16_4_;
      auVar145._20_4_ = fVar313 + auVar138._20_4_;
      auVar145._24_4_ = fVar314 + auVar138._24_4_;
      auVar145._28_4_ = fVar315 + auVar138._28_4_;
      uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar252._4_4_ = uVar8;
      auVar252._0_4_ = uVar8;
      auVar252._8_4_ = uVar8;
      auVar252._12_4_ = uVar8;
      auVar252._16_4_ = uVar8;
      auVar252._20_4_ = uVar8;
      auVar252._24_4_ = uVar8;
      auVar252._28_4_ = uVar8;
      auVar34 = vcmpps_avx(auVar145,auVar252,2);
      auVar146 = vandps_avx(auVar34,*(undefined1 (*) [32])(auStack_180 + lVar123));
      _local_760 = auVar146;
      auVar34 = *(undefined1 (*) [32])(auStack_180 + lVar123) & auVar34;
      bVar102 = (auVar34 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar103 = (auVar34 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar101 = (auVar34 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar100 = SUB321(auVar34 >> 0x7f,0) == '\0';
      bVar99 = (auVar34 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar98 = SUB321(auVar34 >> 0xbf,0) == '\0';
      bVar126 = (auVar34 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar96 = -1 < auVar34[0x1f];
      if (((((((!bVar102 || !bVar103) || !bVar101) || !bVar100) || !bVar99) || !bVar98) || !bVar126)
          || !bVar96) {
        auVar209._8_4_ = 0x7f800000;
        auVar209._0_8_ = 0x7f8000007f800000;
        auVar209._12_4_ = 0x7f800000;
        auVar209._16_4_ = 0x7f800000;
        auVar209._20_4_ = 0x7f800000;
        auVar209._24_4_ = 0x7f800000;
        auVar209._28_4_ = 0x7f800000;
        auVar138 = vblendvps_avx(auVar209,auVar138,auVar146);
        auVar34 = vshufps_avx(auVar138,auVar138,0xb1);
        auVar34 = vminps_avx(auVar138,auVar34);
        auVar35 = vshufpd_avx(auVar34,auVar34,5);
        auVar34 = vminps_avx(auVar34,auVar35);
        auVar35 = vperm2f128_avx(auVar34,auVar34,1);
        auVar34 = vminps_avx(auVar34,auVar35);
        auVar138 = vcmpps_avx(auVar138,auVar34,0);
        auVar34 = auVar146 & auVar138;
        if ((((((((auVar34 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar34 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar34 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar34 >> 0x7f,0) != '\0') ||
              (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar34 >> 0xbf,0) != '\0') ||
            (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar34[0x1f] < '\0') {
          auVar146 = vandps_avx(auVar138,auVar146);
        }
        fVar152 = afStack_140[uVar125 * 0x18 + 1];
        uVar124 = (ulong)auStack_138[uVar125 * 0x18];
        uVar121 = vmovmskps_avx(auVar146);
        uVar33 = 0;
        if (uVar121 != 0) {
          for (; (uVar121 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
          }
        }
        fVar253 = afStack_140[uVar125 * 0x18];
        *(undefined4 *)(local_760 + (ulong)uVar33 * 4) = 0;
        if ((((((((_local_760 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (_local_760 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (_local_760 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(_local_760 >> 0x7f,0) != '\0') ||
              (_local_760 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(_local_760 >> 0xbf,0) != '\0') ||
            (_local_760 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_760[0x1f] < '\0') {
          uVar125 = uVar119;
        }
        *(undefined1 (*) [32])(auStack_180 + lVar123) = _local_760;
        auVar157 = vshufps_avx(ZEXT416((uint)(fVar152 - fVar253)),ZEXT416((uint)(fVar152 - fVar253))
                               ,0);
        local_380._4_4_ = fVar253 + auVar157._4_4_ * 0.14285715;
        local_380._0_4_ = fVar253 + auVar157._0_4_ * 0.0;
        fStack_378 = fVar253 + auVar157._8_4_ * 0.2857143;
        fStack_374 = fVar253 + auVar157._12_4_ * 0.42857146;
        fStack_370 = fVar253 + auVar157._0_4_ * 0.5714286;
        fStack_36c = fVar253 + auVar157._4_4_ * 0.71428573;
        fStack_368 = fVar253 + auVar157._8_4_ * 0.8571429;
        fStack_364 = fVar253 + auVar157._12_4_;
        local_910 = *(undefined8 *)(local_380 + (ulong)uVar33 * 4);
        uStack_908 = 0;
      }
      uVar119 = uVar125;
    } while (((((((bVar102 && bVar103) && bVar101) && bVar100) && bVar99) && bVar98) && bVar126) &&
             bVar96);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }